

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_tests.cpp
# Opt level: O3

void anon_unknown.dwarf_8e5514::DoCheck
               (string *prv,string *pub,string *norm_pub,int flags,
               vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               *scripts,optional<OutputType> *type,optional<uint256> op_desc_id,
               set<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *paths,bool replace_apostrophe_with_h_in_prv,bool replace_apostrophe_with_h_in_pub,
               uint32_t spender_nlocktime,uint32_t spender_nsequence,
               map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
               *preimages,
               optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *expected_prv,
               optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *expected_pub,int desc_index)

{
  _Alloc_hider *p_Var1;
  _Rb_tree_header *p_Var2;
  _Rb_tree_header *p_Var3;
  _Rb_tree_header *p_Var4;
  _Base_ptr p_Var5;
  _Base_ptr *pp_Var6;
  _Rb_tree_header *p_Var7;
  _Rb_tree_header *p_Var8;
  uint uVar9;
  long lVar10;
  _func_int **pp_Var11;
  pointer pcVar12;
  pointer pvVar13;
  long lVar14;
  element_type *__n;
  uint _nChild;
  uint uVar15;
  pointer puVar16;
  pointer puVar17;
  string *psVar18;
  undefined1 auVar19 [16];
  bool bVar20;
  undefined1 uVar21;
  undefined7 uVar22;
  undefined7 uVar23;
  char cVar24;
  readonly_property65 rVar25;
  undefined1 uVar26;
  bool bVar27;
  readonly_property<bool> rVar28;
  int iVar29;
  ulong uVar30;
  undefined8 uVar31;
  _Alloc_hider *p_Var32;
  undefined8 uVar33;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar34;
  long lVar35;
  _Alloc_hider *p_Var36;
  pointer pCVar37;
  size_type sVar38;
  const_iterator cVar39;
  _Base_ptr p_Var40;
  const_iterator cVar41;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar42;
  _Rb_tree_header *p_Var43;
  pointer pCVar44;
  byte extraout_DL;
  byte extraout_DL_00;
  byte extraout_DL_01;
  ulong extraout_RDX;
  FlatSigningProvider *pFVar45;
  pointer pvVar46;
  byte bVar47;
  long lVar48;
  __node_base _Var49;
  char cVar50;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar51;
  long lVar52;
  _Alloc_hider _Var53;
  string *psVar54;
  _Rb_tree_header *p_Var55;
  FlatSigningProvider *pFVar56;
  PrecomputedTransactionData *this;
  _Rb_tree_header *p_Var57;
  iterator pvVar58;
  iterator pvVar59;
  ulong uVar60;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar61;
  _Hash_node_base *p_Var62;
  __node_base _Var63;
  long in_FS_OFFSET;
  bool bVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string file_27;
  const_string file_28;
  const_string file_29;
  const_string file_30;
  const_string file_31;
  const_string file_32;
  const_string file_33;
  const_string file_34;
  const_string file_35;
  const_string file_36;
  const_string file_37;
  const_string file_38;
  const_string file_39;
  const_string file_40;
  const_string file_41;
  const_string file_42;
  const_string file_43;
  const_string file_44;
  const_string file_45;
  const_string file_46;
  const_string file_47;
  const_string file_48;
  const_string file_49;
  const_string file_50;
  const_string file_51;
  const_string file_52;
  Span<const_unsigned_char> s;
  const_string file_53;
  const_string file_54;
  const_string file_55;
  const_string file_56;
  const_string file_57;
  const_string file_58;
  const_string file_59;
  const_string file_60;
  const_string file_61;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  const_string msg_31;
  const_string msg_32;
  const_string msg_33;
  const_string msg_34;
  const_string msg_35;
  const_string msg_36;
  const_string msg_37;
  const_string msg_38;
  const_string msg_39;
  const_string msg_40;
  const_string msg_41;
  const_string msg_42;
  const_string msg_43;
  const_string msg_44;
  const_string msg_45;
  const_string msg_46;
  const_string msg_47;
  const_string msg_48;
  const_string msg_49;
  const_string msg_50;
  const_string msg_51;
  const_string msg_52;
  const_string msg_53;
  const_string msg_54;
  const_string msg_55;
  const_string msg_56;
  const_string msg_57;
  const_string msg_58;
  const_string msg_59;
  const_string msg_60;
  const_string msg_61;
  pair<std::_Rb_tree_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Rb_tree_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  pVar67;
  check_type cVar69;
  char *pcVar68;
  long local_1cd8;
  char *local_1c18;
  char *local_1c10;
  undefined1 *local_1c08;
  undefined1 *local_1c00;
  char *local_1bf8;
  char *local_1bf0;
  char *local_1be8;
  char *local_1be0;
  undefined1 *local_1bd8;
  undefined1 *local_1bd0;
  char *local_1bc8;
  char *local_1bc0;
  char *local_1bb8;
  char *local_1bb0;
  undefined1 *local_1ba8;
  undefined1 *local_1ba0;
  char *local_1b98;
  char *local_1b90;
  char local_1b81;
  undefined1 *local_1b80;
  undefined1 *local_1b78;
  char *local_1b70;
  char *local_1b68;
  char *local_1b60;
  char *local_1b58;
  undefined1 *local_1b50;
  undefined1 *local_1b48;
  char *local_1b40;
  char *local_1b38;
  int local_1b2c;
  undefined1 local_1b28 [24];
  char *local_1b10;
  char *local_1b08;
  char *local_1b00;
  char *local_1af8;
  undefined1 *local_1af0;
  undefined1 *local_1ae8;
  char *local_1ae0;
  char *local_1ad8;
  undefined1 *local_1ad0;
  undefined1 *local_1ac8;
  char *local_1ac0;
  char *local_1ab8;
  int count_pks;
  undefined4 uStack_1aac;
  char *local_1aa8 [2];
  undefined1 *local_1a98;
  undefined1 *local_1a90;
  char *local_1a88;
  char *local_1a80;
  MutableTransactionSignatureCreator creator;
  vector<CScript,_std::allocator<CScript>_> spks1;
  vector<CTxOut,_std::allocator<CTxOut>_> local_1a10;
  uint32_t local_19f4;
  undefined1 *local_19f0;
  undefined1 *local_19e8;
  char *local_19e0;
  char *local_19d8;
  char *local_19d0;
  char *local_19c8;
  undefined1 *local_19c0;
  undefined1 *local_19b8;
  char *local_19b0;
  char *local_19a8;
  char *local_19a0;
  char *local_1998;
  undefined1 *local_1990;
  undefined1 *local_1988;
  char *local_1980;
  char *local_1978;
  char *local_1970;
  char *local_1968;
  undefined1 local_1960 [16];
  undefined1 local_1950 [24];
  _Base_ptr local_1938;
  BaseSignatureChecker local_1930;
  CMutableTransaction *local_1928;
  char *local_1920;
  char *local_1918;
  PrecomputedTransactionData *local_1910;
  PrecomputedTransactionData *local_1908;
  undefined1 *local_1900;
  char *local_18f8;
  char *local_18f0;
  char *local_18e8;
  char *local_18e0;
  undefined1 *local_18d8;
  undefined1 *local_18d0;
  char *local_18c8;
  char *local_18c0;
  char *local_18b8;
  char *local_18b0;
  undefined1 *local_18a8;
  undefined1 *local_18a0;
  char *local_1898;
  char *local_1890;
  vector<CScript,_std::allocator<CScript>_> spk1_from_cache;
  _Base_ptr local_1870;
  char *local_1868;
  undefined1 *local_1860;
  undefined1 *local_1858;
  char *local_1850;
  char *local_1848;
  char *local_1840;
  char *local_1838;
  undefined1 *local_1830;
  undefined1 *local_1828;
  char *local_1820;
  char *local_1818;
  undefined1 *local_1810;
  undefined1 *local_1808;
  char *local_1800;
  char *local_17f8;
  undefined1 *local_17f0;
  undefined1 *local_17e8;
  char *local_17e0;
  char *local_17d8;
  char *local_17d0;
  char *local_17c8;
  undefined1 *local_17c0;
  undefined1 *local_17b8;
  char *local_17b0;
  char *local_17a8;
  char *local_17a0;
  char *local_1798;
  undefined1 *local_1790;
  undefined1 *local_1788;
  char *local_1780;
  char *local_1778;
  char *local_1770;
  char *local_1768;
  undefined1 *local_1760;
  undefined1 *local_1758;
  char *local_1750;
  char *local_1748;
  undefined1 *local_1740;
  undefined1 *local_1738;
  char *local_1730;
  char *local_1728;
  undefined1 *local_1720;
  undefined1 *local_1718;
  char *local_1710;
  char *local_1708;
  char *local_1700;
  char *local_16f8;
  undefined1 *local_16f0;
  undefined1 *local_16e8;
  char *local_16e0;
  char *local_16d8;
  char *local_16d0;
  char *local_16c8;
  undefined1 *local_16c0;
  undefined1 *local_16b8;
  char *local_16b0;
  char *local_16a8;
  char *local_16a0;
  char *local_1698;
  undefined1 *local_1690;
  undefined1 *local_1688;
  char *local_1680;
  char *local_1678;
  size_t num_xpubs;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_1668;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_1630;
  char *local_15f8;
  char *local_15f0;
  undefined1 *local_15e8;
  undefined1 *local_15e0;
  char *local_15d8;
  char *local_15d0;
  char *local_15c8;
  char *local_15c0;
  undefined1 *local_15b8;
  undefined1 *local_15b0;
  char *local_15a8;
  char *local_15a0;
  char *local_1598;
  char *local_1590;
  undefined1 *local_1588;
  undefined1 *local_1580;
  char *local_1578;
  char *local_1570;
  char *local_1568;
  char *local_1560;
  undefined1 *local_1558;
  undefined1 *local_1550;
  char *local_1548;
  char *local_1540;
  char *local_1538;
  char *local_1530;
  undefined1 *local_1528;
  undefined1 *local_1520;
  char *local_1518;
  char *local_1510;
  undefined1 *local_1508;
  undefined1 *local_1500;
  char *local_14f8;
  char *local_14f0;
  char *local_14e8;
  char *local_14e0;
  undefined1 *local_14d8;
  undefined1 *local_14d0;
  char *local_14c8;
  char *local_14c0;
  vector<CScript,_std::allocator<CScript>_> spks_cached;
  vector<CScript,_std::allocator<CScript>_> spks;
  undefined1 *local_1478;
  undefined1 *local_1470;
  char *local_1468;
  char *local_1460;
  undefined1 *local_1458;
  undefined1 *local_1450;
  char *local_1448;
  char *local_1440;
  char *local_1438;
  char *local_1430;
  undefined1 *local_1428;
  undefined1 *local_1420;
  char *local_1418;
  char *local_1410;
  char *local_1408;
  char *local_1400;
  undefined1 *local_13f8;
  undefined1 *local_13f0;
  char *local_13e8;
  char *local_13e0;
  char *local_13d8;
  char *local_13d0;
  undefined1 *local_13c8;
  undefined1 *local_13c0;
  char *local_13b8;
  char *local_13b0;
  char *local_13a8;
  char *local_13a0;
  undefined1 *local_1398;
  undefined1 *local_1390;
  char *local_1388;
  char *local_1380;
  char *local_1378;
  char *local_1370;
  undefined1 *local_1368;
  undefined1 *local_1360;
  char *local_1358;
  char *local_1350;
  char *local_1348;
  char *local_1340;
  undefined1 *local_1338;
  undefined1 *local_1330;
  char *local_1328;
  char *local_1320;
  char *local_1318;
  char *local_1310;
  undefined1 *local_1308;
  undefined1 *local_1300;
  char *local_12f8;
  char *local_12f0;
  char *local_12e8;
  char *local_12e0;
  undefined1 *local_12d8;
  undefined1 *local_12d0;
  char *local_12c8;
  char *local_12c0;
  char *local_12b8;
  char *local_12b0;
  undefined1 *local_12a8;
  undefined1 *local_12a0;
  char *local_1298;
  char *local_1290;
  char *local_1288;
  char *local_1280;
  undefined1 *local_1278;
  undefined1 *local_1270;
  char *local_1268;
  char *local_1260;
  char *local_1258;
  char *local_1250;
  undefined1 *local_1248;
  undefined1 *local_1240;
  char *local_1238;
  char *local_1230;
  char *local_1228;
  char *local_1220;
  undefined1 *local_1218;
  undefined1 *local_1210;
  char *local_1208;
  char *local_1200;
  char *local_11f8;
  char *local_11f0;
  undefined1 *local_11e8;
  undefined1 *local_11e0;
  char *local_11d8;
  char *local_11d0;
  char *local_11c8;
  char *local_11c0;
  undefined1 *local_11b8;
  undefined1 *local_11b0;
  char *local_11a8;
  char *local_11a0;
  char *local_1198;
  char *local_1190;
  undefined1 *local_1188;
  undefined1 *local_1180;
  char *local_1178;
  char *local_1170;
  char *local_1168;
  char *local_1160;
  undefined1 *local_1158;
  undefined1 *local_1150;
  char *local_1148;
  char *local_1140;
  char *local_1138;
  char *local_1130;
  undefined1 *local_1128;
  undefined1 *local_1120;
  char *local_1118;
  char *local_1110;
  char *local_1108;
  char *local_1100;
  undefined1 *local_10f8;
  undefined1 *local_10f0;
  char *local_10e8;
  char *local_10e0;
  char *local_10d8;
  char *local_10d0;
  undefined1 *local_10c8;
  undefined1 *local_10c0;
  char *local_10b8;
  char *local_10b0;
  char *local_10a8;
  char *local_10a0;
  undefined1 *local_1098;
  undefined1 *local_1090;
  char *local_1088;
  char *local_1080;
  char *local_1078;
  char *local_1070;
  undefined1 *local_1068;
  undefined1 *local_1060;
  char *local_1058;
  char *local_1050;
  char *local_1048;
  char *local_1040;
  undefined1 *local_1038;
  undefined1 *local_1030;
  char *local_1028;
  char *local_1020;
  char *local_1018;
  char *local_1010;
  undefined1 *local_1008;
  undefined1 *local_1000;
  char *local_ff8;
  char *local_ff0;
  char *local_fe8;
  char *local_fe0;
  undefined1 *local_fd8;
  undefined1 *local_fd0;
  char *local_fc8;
  char *local_fc0;
  char *local_fb8;
  char *local_fb0;
  undefined1 *local_fa8;
  undefined1 *local_fa0;
  char *local_f98;
  char *local_f90;
  char *local_f88;
  char *local_f80;
  undefined1 *local_f78;
  undefined1 *local_f70;
  char *local_f68;
  char *local_f60;
  undefined1 local_f58 [16];
  pointer local_f48;
  undefined1 local_f38 [16];
  pointer local_f28;
  undefined1 local_f18 [8];
  undefined1 local_f10 [8];
  undefined1 auStack_f08 [88];
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
  local_eb0;
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
  local_e80;
  _Rb_tree<XOnlyPubKey,_std::pair<const_XOnlyPubKey,_TaprootBuilder>,_std::_Select1st<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>_>
  local_e50;
  undefined1 local_e20 [8];
  undefined1 local_e18 [32];
  _Base_ptr local_df8;
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
  local_de8;
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
  local_db8;
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
  local_d88;
  _Rb_tree<XOnlyPubKey,_std::pair<const_XOnlyPubKey,_TaprootBuilder>,_std::_Select1st<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>_>
  local_d58;
  string prv1;
  undefined1 local_d08 [8];
  undefined1 auStack_d00 [16];
  undefined1 local_cf0 [40];
  size_t local_cc8;
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
  local_cc0;
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
  local_c90;
  undefined1 local_c60 [16];
  _Base_ptr local_c50;
  _Base_ptr local_c48;
  _Base_ptr local_c40;
  _Storage<TaprootBuilder,_false> local_c38;
  bool local_bd0;
  _Rb_tree_node_base local_bc0;
  size_t local_ba0;
  _Rb_tree_node_base local_b90;
  undefined1 local_b70 [16];
  undefined1 local_b60 [16];
  _Rb_tree_node_base local_b48;
  size_t local_b28;
  _Rb_tree_node_base local_b18;
  size_t local_af8;
  _Rb_tree_node_base local_ae8;
  undefined1 local_ac8 [16];
  undefined1 local_ab8 [16];
  undefined1 local_aa8 [16];
  undefined1 local_a98 [16];
  undefined1 local_a88 [16];
  undefined1 local_a78 [12];
  uchar auStack_a6c [4];
  undefined1 auStack_a68 [12];
  _Rb_tree<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  local_a58;
  _Rb_tree<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  local_a28;
  _Rb_tree<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  local_9f8;
  _Rb_tree<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  local_9c8;
  set<CPubKey,_std::less<CPubKey>,_std::allocator<CPubKey>_> pubkeys;
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
  local_960;
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
  local_930;
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
  local_900;
  _Rb_tree<XOnlyPubKey,_std::pair<const_XOnlyPubKey,_TaprootBuilder>,_std::_Select1st<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>_>
  local_8d0;
  _Vector_impl_data local_890;
  DescriptorCache desc_cache;
  FlatSigningProvider script_provider_cached;
  FlatSigningProvider script_provider;
  string local_5d8;
  string local_5b8;
  string local_598;
  string local_578;
  string norm1;
  string local_538;
  undefined1 local_518 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4e8;
  undefined1 local_4d8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4a8;
  string local_498;
  string local_478;
  string local_458;
  string local_438;
  string local_418;
  string local_3f8;
  string local_3d8;
  string local_3b8;
  string local_398;
  string local_378;
  string local_358;
  string local_338;
  string local_318;
  string pub2;
  string pub1;
  string local_2b8;
  string local_298;
  string error;
  set<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  left_paths;
  FlatSigningProvider keys_pub;
  FlatSigningProvider keys_priv;
  
  local_1030 = (undefined1 *)0x0;
  lVar10 = *(long *)(in_FS_OFFSET + 0x28);
  keys_priv.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keys_priv.scripts._M_t._M_impl.super__Rb_tree_header._M_header;
  keys_priv.super_SigningProvider._vptr_SigningProvider =
       (_func_int **)&PTR__FlatSigningProvider_01399da8;
  keys_priv.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keys_priv.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keys_priv.scripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  keys_priv.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keys_priv.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
  keys_priv.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keys_priv.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keys_priv.pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var57 = &keys_priv.origins._M_t._M_impl.super__Rb_tree_header;
  keys_priv.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keys_priv.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keys_priv.origins._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  keys_priv.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keys_priv.keys._M_t._M_impl.super__Rb_tree_header._M_header;
  keys_priv.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keys_priv.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keys_priv.keys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  keys_priv.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keys_priv.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header;
  keys_priv.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keys_priv.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keys_priv.tr_trees._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  keys_pub.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keys_pub.scripts._M_t._M_impl.super__Rb_tree_header._M_header;
  keys_pub.super_SigningProvider._vptr_SigningProvider =
       (_func_int **)&PTR__FlatSigningProvider_01399da8;
  keys_pub.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keys_pub.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keys_pub.scripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  keys_pub.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keys_pub.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
  keys_pub.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keys_pub.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keys_pub.pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  keys_pub.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keys_pub.origins._M_t._M_impl.super__Rb_tree_header._M_header;
  keys_pub.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keys_pub.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keys_pub.origins._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  keys_pub.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keys_pub.keys._M_t._M_impl.super__Rb_tree_header._M_header;
  keys_pub.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keys_pub.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keys_pub.keys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  keys_pub.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keys_pub.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header;
  keys_pub.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keys_pub.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keys_pub.tr_trees._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  keys_pub.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keys_pub.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  keys_pub.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keys_pub.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  keys_pub.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keys_pub.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  keys_pub.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keys_pub.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  keys_pub.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keys_pub.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  keys_priv.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keys_priv.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  keys_priv.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keys_priv.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  keys_priv.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var57->_M_header;
  keys_priv.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var57->_M_header;
  keys_priv.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keys_priv.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  keys_priv.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keys_priv.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  _Rb_tree<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::_Identity<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::_Rb_tree(&left_paths._M_t,&paths->_M_t);
  error._M_dataplus._M_p = (pointer)&error.field_2;
  error._M_string_length = 0;
  error.field_2._M_local_buf[0] = '\0';
  local_f28 = (pointer)0x0;
  local_f38 = (undefined1  [16])0x0;
  local_f48 = (pointer)0x0;
  local_f58 = (undefined1  [16])0x0;
  if (replace_apostrophe_with_h_in_prv) {
    UseHInsteadOfApostrophe(&local_298,prv);
    _GLOBAL__N_1::DoCheck();
  }
  pvVar58 = (iterator)0x0;
  Parse((vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
         *)&pubkeys,prv,&keys_priv,&error,false);
  puVar16 = (pointer)CONCAT71(pubkeys._M_t._M_impl._1_7_,pubkeys._M_t._M_impl._0_1_);
  puVar17 = (pointer)CONCAT44(pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._4_4_,
                              pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color);
  prv1._M_dataplus._M_p = (pointer)local_f38._0_8_;
  prv1._M_string_length = local_f38._8_8_;
  prv1.field_2._M_allocated_capacity = (size_type)local_f28;
  pubkeys._M_t._M_impl._0_1_ = 0;
  pubkeys._M_t._M_impl._1_7_ = 0;
  pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ = 0;
  pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = 0;
  local_f38._0_8_ = puVar16;
  local_f38._8_8_ = puVar17;
  std::
  vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
  ::~vector((vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
             *)&prv1);
  std::
  vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
  ::~vector((vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
             *)&pubkeys);
  local_f68 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
  ;
  local_f60 = "";
  local_f78 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f70 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x97;
  file.m_begin = (iterator)&local_f68;
  msg.m_end = (iterator)p_Var57;
  msg.m_begin = pvVar58;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_f78,msg);
  pubkeys._M_t._M_impl._0_1_ = local_f38._0_8_ != local_f38._8_8_;
  pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ = 0;
  pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = 0;
  prv1._M_string_length = prv1._M_string_length & 0xffffffffffffff00;
  prv1._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01388e08;
  prv1.field_2._8_8_ = &error;
  prv1.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_f88 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
  ;
  local_f80 = "";
  pvVar58 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&pubkeys,(lazy_ostream *)&prv1,1,1,WARN,_cVar69,(size_t)&local_f88,
             0x97);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  if (replace_apostrophe_with_h_in_pub) {
    UseHInsteadOfApostrophe(&local_2b8,pub);
    _GLOBAL__N_1::DoCheck();
  }
  pvVar59 = (iterator)0x0;
  Parse((vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
         *)&pubkeys,pub,&keys_pub,&error,false);
  psVar54 = (string *)CONCAT71(pubkeys._M_t._M_impl._1_7_,pubkeys._M_t._M_impl._0_1_);
  psVar18 = (string *)
            CONCAT44(pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._4_4_,
                     pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color);
  puVar16 = (pointer)CONCAT44(pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_,
                              pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_);
  prv1._M_dataplus._M_p = (pointer)local_f58._0_8_;
  prv1._M_string_length = local_f58._8_8_;
  prv1.field_2._M_allocated_capacity = (size_type)local_f48;
  pubkeys._M_t._M_impl._0_1_ = 0;
  pubkeys._M_t._M_impl._1_7_ = 0;
  pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ = 0;
  pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = 0;
  local_f48 = puVar16;
  local_f58._0_8_ = psVar54;
  local_f58._8_8_ = psVar18;
  std::
  vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
  ::~vector((vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
             *)&prv1);
  std::
  vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
  ::~vector((vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
             *)&pubkeys);
  local_f98 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
  ;
  local_f90 = "";
  local_fa8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_fa0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x9c;
  file_00.m_begin = (iterator)&local_f98;
  msg_00.m_end = pvVar58;
  msg_00.m_begin = pvVar59;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_fa8,
             msg_00);
  pubkeys._M_t._M_impl._0_1_ = local_f58._0_8_ != local_f58._8_8_;
  pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ = 0;
  pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = 0;
  prv1._M_string_length = prv1._M_string_length & 0xffffffffffffff00;
  prv1._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01388e08;
  prv1.field_2._8_8_ = &error;
  prv1.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_fb8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
  ;
  local_fb0 = "";
  pvVar58 = (iterator)0x1;
  pvVar59 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&pubkeys,(lazy_ostream *)&prv1,1,1,WARN,_cVar69,(size_t)&local_fb8,
             0x9c);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  uVar33 = local_f58._0_8_;
  uVar60 = (ulong)desc_index;
  if (uVar60 < (ulong)((long)(local_f38._8_8_ - local_f38._0_8_) >> 3)) {
    psVar54 = (string *)local_f58._0_8_;
    if (uVar60 < (ulong)((long)(local_f58._8_8_ - local_f58._0_8_) >> 3)) {
      p_Var1 = (_Alloc_hider *)(local_f38._0_8_ + uVar60 * 8);
      cVar24 = (**(code **)(*(long *)p_Var1->_M_p + 0x18))();
      bVar64 = true;
      if (cVar24 != '\0') {
        uVar30 = (**(code **)(*(long *)p_Var1->_M_p + 0x58))();
        bVar64 = (uVar30 >> 0x20 & 1) == 0;
      }
      (**(code **)(*(long *)p_Var1->_M_p + 0x68))(p_Var1->_M_p,1);
      (**(code **)(*(long *)p_Var1->_M_p + 0x68))(p_Var1->_M_p,1);
      (**(code **)(*(long *)p_Var1->_M_p + 0x70))();
      if ((extraout_RDX & 1) == 0) {
        bVar47 = 0;
      }
      else {
        bVar47 = extraout_DL & extraout_DL_00;
      }
      local_fc8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
      ;
      local_fc0 = "";
      local_fd8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_fd0 = &boost::unit_test::basic_cstring<char_const>::null;
      file_01.m_end = (iterator)0xa7;
      file_01.m_begin = (iterator)&local_fc8;
      msg_01.m_end = pvVar59;
      msg_01.m_begin = pvVar58;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_fd8,
                 msg_01);
      pubkeys._M_t._M_impl._0_1_ = bVar64 | bVar47 & 1;
      pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ = 0;
      pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = 0;
      prv1._M_string_length = prv1._M_string_length & 0xffffffffffffff00;
      prv1._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01388e08;
      prv1.field_2._8_8_ = prv;
      prv1.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_fe8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
      ;
      local_fe0 = "";
      pvVar58 = (iterator)0x1;
      pvVar59 = (iterator)0x1;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&pubkeys,(lazy_ostream *)&prv1,1,1,WARN,_cVar69,
                 (size_t)&local_fe8,0xa7);
      pp_Var6 = &pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      boost::detail::shared_count::~shared_count((shared_count *)pp_Var6);
      cVar24 = (**(code **)(*(long *)p_Var1->_M_p + 0x28))();
      local_ff8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
      ;
      local_ff0 = "";
      local_1008 = &boost::unit_test::basic_cstring<char_const>::null;
      local_1000 = &boost::unit_test::basic_cstring<char_const>::null;
      file_02.m_end = (iterator)0xab;
      file_02.m_begin = (iterator)&local_ff8;
      msg_02.m_end = pvVar59;
      msg_02.m_begin = pvVar58;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1008,
                 msg_02);
      bVar47 = 1;
      if (cVar24 != '\0') {
        uVar30 = (**(code **)(*(long *)p_Var1->_M_p + 0x60))();
        bVar47 = extraout_DL_01 &
                 uVar30 == *(ulong *)(*(long *)&(((scripts->
                                                  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                )._M_impl.super__Vector_impl_data + 8) >> 1;
      }
      script_provider.super_SigningProvider._vptr_SigningProvider._0_1_ = bVar47;
      script_provider.scripts._M_t._M_impl._0_16_ = (undefined1  [16])0x0;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pubkeys,
                     "Invalid ScriptSize() for ",prv);
      prv1._M_string_length = prv1._M_string_length & 0xffffffffffffff00;
      prv1._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01388e08;
      prv1.field_2._8_8_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pubkeys;
      prv1.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_1018 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
      ;
      local_1010 = "";
      pvVar58 = (iterator)0x1;
      pvVar59 = (iterator)0x1;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&script_provider,(lazy_ostream *)&prv1,1,1,WARN,_cVar69,
                 (size_t)&local_1018,0xab);
      if ((_Base_ptr *)CONCAT71(pubkeys._M_t._M_impl._1_7_,pubkeys._M_t._M_impl._0_1_) != pp_Var6) {
        operator_delete((undefined1 *)
                        CONCAT71(pubkeys._M_t._M_impl._1_7_,pubkeys._M_t._M_impl._0_1_),
                        CONCAT44(pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent.
                                 _4_4_,pubkeys._M_t._M_impl.super__Rb_tree_header._M_header.
                                       _M_parent._0_4_) + 1);
      }
      boost::detail::shared_count::~shared_count
                ((shared_count *)&script_provider.scripts._M_t._M_impl.super__Rb_tree_header);
      local_1028 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
      ;
      local_1020 = "";
      local_1038 = &boost::unit_test::basic_cstring<char_const>::null;
      local_1030 = &boost::unit_test::basic_cstring<char_const>::null;
      file_03.m_end = (iterator)0xae;
      file_03.m_begin = (iterator)&local_1028;
      msg_03.m_end = pvVar59;
      msg_03.m_begin = pvVar58;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_1038,
                 msg_03);
      uVar31 = (**(code **)(*(long *)p_Var1->_M_p + 0x58))();
      bVar47 = (byte)((ulong)uVar31 >> 0x20);
      pubkeys._M_t._M_impl._0_1_ =
           (type->super__Optional_base<OutputType,_true,_true>)._M_payload.
           super__Optional_payload_base<OutputType>._M_engaged == (bool)bVar47;
      if ((bVar47 & pubkeys._M_t._M_impl._0_1_) == 1) {
        pubkeys._M_t._M_impl._0_1_ =
             (type->super__Optional_base<OutputType,_true,_true>)._M_payload.
             super__Optional_payload_base<OutputType>._M_payload._M_value == (OutputType)uVar31;
      }
      pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ = 0;
      pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = 0;
      script_provider.super_SigningProvider._vptr_SigningProvider =
           (_func_int **)anon_var_dwarf_9165a4;
      script_provider.scripts._M_t._M_impl._0_8_ =
           (long)"parse_priv->GetOutputType() == type" + 0x23;
      prv1._M_string_length = prv1._M_string_length & 0xffffffffffffff00;
      prv1._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01389048;
      prv1.field_2._8_8_ = &script_provider;
      prv1.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_1048 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
      ;
      local_1040 = "";
      pvVar58 = (iterator)0x1;
      pvVar59 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&pubkeys,(lazy_ostream *)&prv1,1,0,WARN,_cVar69,
                 (size_t)&local_1048,0xae);
      boost::detail::shared_count::~shared_count
                ((shared_count *)&pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
      local_1058 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
      ;
      local_1050 = "";
      local_1068 = &boost::unit_test::basic_cstring<char_const>::null;
      local_1060 = &boost::unit_test::basic_cstring<char_const>::null;
      file_04.m_end = (iterator)0xaf;
      file_04.m_begin = (iterator)&local_1058;
      msg_04.m_end = pvVar59;
      msg_04.m_begin = pvVar58;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_1068,
                 msg_04);
      p_Var32 = (_Alloc_hider *)uVar33 + uVar60;
      uVar33 = (**(code **)(*(long *)p_Var32->_M_p + 0x58))();
      bVar47 = (byte)((ulong)uVar33 >> 0x20);
      pubkeys._M_t._M_impl._0_1_ =
           (type->super__Optional_base<OutputType,_true,_true>)._M_payload.
           super__Optional_payload_base<OutputType>._M_engaged == (bool)bVar47;
      if ((bVar47 & pubkeys._M_t._M_impl._0_1_) == 1) {
        pubkeys._M_t._M_impl._0_1_ =
             (type->super__Optional_base<OutputType,_true,_true>)._M_payload.
             super__Optional_payload_base<OutputType>._M_payload._M_value == (OutputType)uVar33;
      }
      pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ = 0;
      pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = 0;
      script_provider.super_SigningProvider._vptr_SigningProvider =
           (_func_int **)anon_var_dwarf_9165be;
      script_provider.scripts._M_t._M_impl._0_8_ = (long)"parse_pub->GetOutputType() == type" + 0x22
      ;
      prv1._M_string_length = prv1._M_string_length & 0xffffffffffffff00;
      prv1._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01389048;
      prv1.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_1078 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
      ;
      local_1070 = "";
      pvVar58 = (iterator)0x1;
      pvVar59 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&pubkeys,(lazy_ostream *)&prv1,1,0,WARN,_cVar69,
                 (size_t)&local_1078,0xaf);
      boost::detail::shared_count::~shared_count
                ((shared_count *)&pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
      local_1088 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
      ;
      local_1080 = "";
      local_1098 = &boost::unit_test::basic_cstring<char_const>::null;
      local_1090 = &boost::unit_test::basic_cstring<char_const>::null;
      file_05.m_end = (iterator)0xb2;
      file_05.m_begin = (iterator)&local_1088;
      msg_05.m_end = pvVar59;
      msg_05.m_begin = pvVar58;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_1098,
                 msg_05);
      pubkeys._M_t._M_impl._0_1_ =
           keys_priv.keys._M_t._M_impl.super__Rb_tree_header._M_node_count != 0;
      pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ = 0;
      pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = 0;
      script_provider.super_SigningProvider._vptr_SigningProvider =
           (_func_int **)anon_var_dwarf_9165ca;
      script_provider.scripts._M_t._M_impl._0_8_ = (long)"keys_priv.keys.size()" + 0x15;
      prv1._M_string_length = prv1._M_string_length & 0xffffffffffffff00;
      prv1._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01389048;
      prv1.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_10a8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
      ;
      local_10a0 = "";
      pvVar58 = (iterator)0x1;
      pvVar59 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&pubkeys,(lazy_ostream *)&prv1,1,0,WARN,_cVar69,
                 (size_t)&local_10a8,0xb2);
      boost::detail::shared_count::~shared_count
                ((shared_count *)&pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
      local_10b8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
      ;
      local_10b0 = "";
      local_10c8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_10c0 = &boost::unit_test::basic_cstring<char_const>::null;
      file_06.m_end = (iterator)0xb3;
      file_06.m_begin = (iterator)&local_10b8;
      msg_06.m_end = pvVar59;
      msg_06.m_begin = pvVar58;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_10c8,
                 msg_06);
      pubkeys._M_t._M_impl._0_1_ =
           keys_pub.keys._M_t._M_impl.super__Rb_tree_header._M_node_count == 0;
      pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ = 0;
      pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = 0;
      script_provider.super_SigningProvider._vptr_SigningProvider =
           (_func_int **)anon_var_dwarf_9165d6;
      script_provider.scripts._M_t._M_impl._0_8_ = "";
      prv1._M_string_length = prv1._M_string_length & 0xffffffffffffff00;
      prv1._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01389048;
      prv1.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_10d8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
      ;
      local_10d0 = "";
      pvVar58 = (iterator)0x1;
      pvVar59 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&pubkeys,(lazy_ostream *)&prv1,1,0,WARN,_cVar69,
                 (size_t)&local_10d8,0xb3);
      pp_Var6 = &pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      boost::detail::shared_count::~shared_count((shared_count *)pp_Var6);
      (**(code **)(*(long *)p_Var1->_M_p + 0x20))(&pub1,p_Var1->_M_p,0);
      (**(code **)(*(long *)p_Var32->_M_p + 0x20))(&pub2,p_Var32->_M_p,0);
      uVar22 = pubkeys._M_t._M_impl._1_7_;
      uVar26 = pubkeys._M_t._M_impl._0_1_;
      pubkeys._M_t._M_impl._0_1_ = SUB81(pp_Var6,0);
      uVar21 = pubkeys._M_t._M_impl._0_1_;
      pubkeys._M_t._M_impl._1_7_ = SUB87((ulong)pp_Var6 >> 8,0);
      uVar23 = pubkeys._M_t._M_impl._1_7_;
      pubkeys._M_t._M_impl._0_1_ = uVar26;
      pubkeys._M_t._M_impl._1_7_ = uVar22;
      if ((expected_pub->
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          )._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged == true) {
        local_10e8 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
        ;
        local_10e0 = "";
        local_10f8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_10f0 = &boost::unit_test::basic_cstring<char_const>::null;
        file_07.m_end = (iterator)0xba;
        file_07.m_begin = (iterator)&local_10e8;
        msg_07.m_end = pvVar59;
        msg_07.m_begin = pvVar58;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,
                   (size_t)&local_10f8,msg_07);
        _Var53._M_p = (expected_pub->
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      )._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload._M_value._M_dataplus._M_p;
        local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_318,_Var53._M_p,
                   _Var53._M_p +
                   (expected_pub->
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   )._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ._M_payload._M_value._M_string_length);
        local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_338,pub1._M_dataplus._M_p,
                   pub1._M_dataplus._M_p + pub1._M_string_length);
        rVar25.super_readonly_property<bool>.super_class_property<bool>.value =
             (readonly_property<bool>)EqualDescriptor(&local_318,&local_338);
        local_e20[0] = rVar25.super_readonly_property<bool>.super_class_property<bool>.value;
        local_e18._0_8_ = (element_type *)0x0;
        local_e18._8_8_ = (sp_counted_base *)0x0;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &script_provider_cached,"Private ser: ",&pub1);
        pbVar34 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &script_provider_cached," Public desc: ");
        script_provider.super_SigningProvider._vptr_SigningProvider =
             (_func_int **)&script_provider.scripts._M_t._M_impl.super__Rb_tree_header;
        pp_Var11 = (_func_int **)(pbVar34->_M_dataplus)._M_p;
        paVar42 = &pbVar34->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pp_Var11 == paVar42) {
          script_provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               paVar42->_M_allocated_capacity;
          script_provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               *(_Base_ptr *)((long)&pbVar34->field_2 + 8);
        }
        else {
          script_provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               paVar42->_M_allocated_capacity;
          script_provider.super_SigningProvider._vptr_SigningProvider = pp_Var11;
        }
        script_provider.scripts._M_t._M_impl._0_8_ = pbVar34->_M_string_length;
        (pbVar34->_M_dataplus)._M_p = (pointer)paVar42;
        pbVar34->_M_string_length = 0;
        (pbVar34->field_2)._M_local_buf[0] = '\0';
        pbVar34 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &script_provider,
                            (expected_pub->
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            )._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_payload._M_value._M_dataplus._M_p,
                            (expected_pub->
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            )._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_payload._M_value._M_string_length);
        pcVar12 = (pbVar34->_M_dataplus)._M_p;
        paVar42 = &pbVar34->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar12 == paVar42) {
          pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               *(_Base_ptr *)((long)&pbVar34->field_2 + 8);
          pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ =
               (undefined4)paVar42->_M_allocated_capacity;
          pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ =
               (undefined4)(paVar42->_M_allocated_capacity >> 0x20);
          pubkeys._M_t._M_impl._0_1_ = uVar21;
          pubkeys._M_t._M_impl._1_7_ = uVar23;
        }
        else {
          pubkeys._M_t._M_impl._0_1_ = SUB81(pcVar12,0);
          pubkeys._M_t._M_impl._1_7_ = SUB87((ulong)pcVar12 >> 8,0);
          pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ =
               (undefined4)paVar42->_M_allocated_capacity;
          pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ =
               (undefined4)(paVar42->_M_allocated_capacity >> 0x20);
        }
        pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
             (_Rb_tree_color)pbVar34->_M_string_length;
        pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ =
             SUB84(pbVar34->_M_string_length >> 0x20,0);
        (pbVar34->_M_dataplus)._M_p = (pointer)paVar42;
        pbVar34->_M_string_length = 0;
        (pbVar34->field_2)._M_local_buf[0] = '\0';
        prv1._M_string_length = prv1._M_string_length & 0xffffffffffffff00;
        prv1._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01388e08;
        prv1.field_2._8_8_ = (assertion_result *)&pubkeys;
        prv1.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
        local_1108 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
        ;
        local_1100 = "";
        pvVar58 = (iterator)0x1;
        pvVar59 = (iterator)0x1;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_e20,(lazy_ostream *)&prv1,1,1,WARN,_cVar69,
                   (size_t)&local_1108,0xba);
        if ((_Base_ptr *)CONCAT71(pubkeys._M_t._M_impl._1_7_,pubkeys._M_t._M_impl._0_1_) != pp_Var6)
        {
          operator_delete((undefined1 *)
                          CONCAT71(pubkeys._M_t._M_impl._1_7_,pubkeys._M_t._M_impl._0_1_),
                          CONCAT44(pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent.
                                   _4_4_,pubkeys._M_t._M_impl.super__Rb_tree_header._M_header.
                                         _M_parent._0_4_) + 1);
        }
        if ((_Rb_tree_header *)script_provider.super_SigningProvider._vptr_SigningProvider !=
            &script_provider.scripts._M_t._M_impl.super__Rb_tree_header) {
          operator_delete(script_provider.super_SigningProvider._vptr_SigningProvider,
                          script_provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_
                          + 1);
        }
        p_Var57 = &script_provider_cached.scripts._M_t._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)script_provider_cached.super_SigningProvider._vptr_SigningProvider !=
            p_Var57) {
          operator_delete(script_provider_cached.super_SigningProvider._vptr_SigningProvider,
                          script_provider_cached.scripts._M_t._M_impl.super__Rb_tree_header.
                          _M_header._0_8_ + 1);
        }
        boost::detail::shared_count::~shared_count((shared_count *)(local_e18 + 8));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_338._M_dataplus._M_p != &local_338.field_2) {
          operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_318._M_dataplus._M_p != &local_318.field_2) {
          operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
        }
        local_1118 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
        ;
        local_1110 = "";
        local_1128 = &boost::unit_test::basic_cstring<char_const>::null;
        local_1120 = &boost::unit_test::basic_cstring<char_const>::null;
        file_09.m_end = (iterator)0xbb;
        file_09.m_begin = (iterator)&local_1118;
        msg_09.m_end = pvVar59;
        msg_09.m_begin = pvVar58;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,
                   (size_t)&local_1128,msg_09);
        _Var53._M_p = (expected_pub->
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      )._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload._M_value._M_dataplus._M_p;
        local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_358,_Var53._M_p,
                   _Var53._M_p +
                   (expected_pub->
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   )._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ._M_payload._M_value._M_string_length);
        local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_378,pub2._M_dataplus._M_p,
                   pub2._M_dataplus._M_p + pub2._M_string_length);
        bVar64 = EqualDescriptor(&local_358,&local_378);
        local_e20[0] = bVar64;
        local_e18._0_8_ = (element_type *)0x0;
        local_e18._8_8_ = (sp_counted_base *)0x0;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &script_provider_cached,"Public ser: ",&pub2);
        pbVar34 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &script_provider_cached," Public desc: ");
        script_provider.super_SigningProvider._vptr_SigningProvider =
             (_func_int **)&script_provider.scripts._M_t._M_impl.super__Rb_tree_header;
        pp_Var11 = (_func_int **)(pbVar34->_M_dataplus)._M_p;
        paVar42 = &pbVar34->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pp_Var11 == paVar42) {
          script_provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               paVar42->_M_allocated_capacity;
          script_provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               *(_Base_ptr *)((long)&pbVar34->field_2 + 8);
        }
        else {
          script_provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               paVar42->_M_allocated_capacity;
          script_provider.super_SigningProvider._vptr_SigningProvider = pp_Var11;
        }
        script_provider.scripts._M_t._M_impl._0_8_ = pbVar34->_M_string_length;
        (pbVar34->_M_dataplus)._M_p = (pointer)paVar42;
        pbVar34->_M_string_length = 0;
        (pbVar34->field_2)._M_local_buf[0] = '\0';
        pbVar34 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &script_provider,
                            (expected_pub->
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            )._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_payload._M_value._M_dataplus._M_p,
                            (expected_pub->
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            )._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_payload._M_value._M_string_length);
        pcVar12 = (pbVar34->_M_dataplus)._M_p;
        paVar42 = &pbVar34->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar12 == paVar42) {
          pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               *(_Base_ptr *)((long)&pbVar34->field_2 + 8);
          pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ =
               (undefined4)paVar42->_M_allocated_capacity;
          pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ =
               (undefined4)(paVar42->_M_allocated_capacity >> 0x20);
          pubkeys._M_t._M_impl._0_1_ = uVar21;
          pubkeys._M_t._M_impl._1_7_ = uVar23;
        }
        else {
          pubkeys._M_t._M_impl._0_1_ = SUB81(pcVar12,0);
          pubkeys._M_t._M_impl._1_7_ = SUB87((ulong)pcVar12 >> 8,0);
          pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ =
               (undefined4)paVar42->_M_allocated_capacity;
          pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ =
               (undefined4)(paVar42->_M_allocated_capacity >> 0x20);
        }
        pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
             (_Rb_tree_color)pbVar34->_M_string_length;
        pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ =
             SUB84(pbVar34->_M_string_length >> 0x20,0);
        (pbVar34->_M_dataplus)._M_p = (pointer)paVar42;
        pbVar34->_M_string_length = 0;
        (pbVar34->field_2)._M_local_buf[0] = '\0';
        prv1._M_string_length = prv1._M_string_length & 0xffffffffffffff00;
        prv1._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01388e08;
        prv1.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
        local_1138 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
        ;
        local_1130 = "";
        pvVar58 = (iterator)0x1;
        pvVar59 = (iterator)0x1;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_e20,(lazy_ostream *)&prv1,1,1,WARN,_cVar69,
                   (size_t)&local_1138,0xbb);
        if ((_Base_ptr *)CONCAT71(pubkeys._M_t._M_impl._1_7_,pubkeys._M_t._M_impl._0_1_) != pp_Var6)
        {
          operator_delete((undefined1 *)
                          CONCAT71(pubkeys._M_t._M_impl._1_7_,pubkeys._M_t._M_impl._0_1_),
                          CONCAT44(pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent.
                                   _4_4_,pubkeys._M_t._M_impl.super__Rb_tree_header._M_header.
                                         _M_parent._0_4_) + 1);
        }
        if ((_Rb_tree_header *)script_provider.super_SigningProvider._vptr_SigningProvider !=
            &script_provider.scripts._M_t._M_impl.super__Rb_tree_header) {
          operator_delete(script_provider.super_SigningProvider._vptr_SigningProvider,
                          script_provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_
                          + 1);
        }
        if ((_Rb_tree_header *)script_provider_cached.super_SigningProvider._vptr_SigningProvider !=
            p_Var57) {
          operator_delete(script_provider_cached.super_SigningProvider._vptr_SigningProvider,
                          script_provider_cached.scripts._M_t._M_impl.super__Rb_tree_header.
                          _M_header._0_8_ + 1);
        }
        boost::detail::shared_count::~shared_count((shared_count *)(local_e18 + 8));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_378._M_dataplus._M_p != &local_378.field_2) {
          operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
        }
        local_3d8.field_2._M_allocated_capacity = local_358.field_2._M_allocated_capacity;
        _Var53._M_p = local_358._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_358._M_dataplus._M_p != &local_358.field_2) {
LAB_003b32ae:
          operator_delete(_Var53._M_p,local_3d8.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        local_1148 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
        ;
        local_1140 = "";
        local_1158 = &boost::unit_test::basic_cstring<char_const>::null;
        local_1150 = &boost::unit_test::basic_cstring<char_const>::null;
        file_08.m_end = (iterator)0xbd;
        file_08.m_begin = (iterator)&local_1148;
        msg_08.m_end = pvVar59;
        msg_08.m_begin = pvVar58;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,
                   (size_t)&local_1158,msg_08);
        pcVar12 = (pub->_M_dataplus)._M_p;
        local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_398,pcVar12,pcVar12 + pub->_M_string_length);
        local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3b8,pub1._M_dataplus._M_p,
                   pub1._M_dataplus._M_p + pub1._M_string_length);
        rVar25.super_readonly_property<bool>.super_class_property<bool>.value =
             (readonly_property<bool>)EqualDescriptor(&local_398,&local_3b8);
        local_e20[0] = rVar25.super_readonly_property<bool>.super_class_property<bool>.value;
        local_e18._0_8_ = (element_type *)0x0;
        local_e18._8_8_ = (sp_counted_base *)0x0;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &script_provider_cached,"Private ser: ",&pub1);
        pbVar34 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &script_provider_cached," Public desc: ");
        script_provider.super_SigningProvider._vptr_SigningProvider =
             (_func_int **)&script_provider.scripts._M_t._M_impl.super__Rb_tree_header;
        pp_Var11 = (_func_int **)(pbVar34->_M_dataplus)._M_p;
        paVar42 = &pbVar34->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pp_Var11 == paVar42) {
          script_provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               paVar42->_M_allocated_capacity;
          script_provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               *(_Base_ptr *)((long)&pbVar34->field_2 + 8);
        }
        else {
          script_provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               paVar42->_M_allocated_capacity;
          script_provider.super_SigningProvider._vptr_SigningProvider = pp_Var11;
        }
        script_provider.scripts._M_t._M_impl._0_8_ = pbVar34->_M_string_length;
        (pbVar34->_M_dataplus)._M_p = (pointer)paVar42;
        pbVar34->_M_string_length = 0;
        (pbVar34->field_2)._M_local_buf[0] = '\0';
        pbVar34 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &script_provider,(pub->_M_dataplus)._M_p,pub->_M_string_length);
        pcVar12 = (pbVar34->_M_dataplus)._M_p;
        paVar42 = &pbVar34->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar12 == paVar42) {
          pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               *(_Base_ptr *)((long)&pbVar34->field_2 + 8);
          pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ =
               (undefined4)paVar42->_M_allocated_capacity;
          pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ =
               (undefined4)(paVar42->_M_allocated_capacity >> 0x20);
          pubkeys._M_t._M_impl._0_1_ = uVar21;
          pubkeys._M_t._M_impl._1_7_ = uVar23;
        }
        else {
          pubkeys._M_t._M_impl._0_1_ = SUB81(pcVar12,0);
          pubkeys._M_t._M_impl._1_7_ = SUB87((ulong)pcVar12 >> 8,0);
          pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ =
               (undefined4)paVar42->_M_allocated_capacity;
          pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ =
               (undefined4)(paVar42->_M_allocated_capacity >> 0x20);
        }
        pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
             (_Rb_tree_color)pbVar34->_M_string_length;
        pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ =
             SUB84(pbVar34->_M_string_length >> 0x20,0);
        (pbVar34->_M_dataplus)._M_p = (pointer)paVar42;
        pbVar34->_M_string_length = 0;
        (pbVar34->field_2)._M_local_buf[0] = '\0';
        prv1._M_string_length = prv1._M_string_length & 0xffffffffffffff00;
        prv1._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01388e08;
        prv1.field_2._8_8_ = (assertion_result *)&pubkeys;
        prv1.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
        local_1168 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
        ;
        local_1160 = "";
        pvVar58 = (iterator)0x1;
        pvVar59 = (iterator)0x1;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_e20,(lazy_ostream *)&prv1,1,1,WARN,_cVar69,
                   (size_t)&local_1168,0xbd);
        if ((_Base_ptr *)CONCAT71(pubkeys._M_t._M_impl._1_7_,pubkeys._M_t._M_impl._0_1_) != pp_Var6)
        {
          operator_delete((undefined1 *)
                          CONCAT71(pubkeys._M_t._M_impl._1_7_,pubkeys._M_t._M_impl._0_1_),
                          CONCAT44(pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent.
                                   _4_4_,pubkeys._M_t._M_impl.super__Rb_tree_header._M_header.
                                         _M_parent._0_4_) + 1);
        }
        if ((_Rb_tree_header *)script_provider.super_SigningProvider._vptr_SigningProvider !=
            &script_provider.scripts._M_t._M_impl.super__Rb_tree_header) {
          operator_delete(script_provider.super_SigningProvider._vptr_SigningProvider,
                          script_provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_
                          + 1);
        }
        p_Var57 = &script_provider_cached.scripts._M_t._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)script_provider_cached.super_SigningProvider._vptr_SigningProvider !=
            p_Var57) {
          operator_delete(script_provider_cached.super_SigningProvider._vptr_SigningProvider,
                          script_provider_cached.scripts._M_t._M_impl.super__Rb_tree_header.
                          _M_header._0_8_ + 1);
        }
        boost::detail::shared_count::~shared_count((shared_count *)(local_e18 + 8));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
          operator_delete(local_3b8._M_dataplus._M_p,local_3b8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_398._M_dataplus._M_p != &local_398.field_2) {
          operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
        }
        local_1178 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
        ;
        local_1170 = "";
        local_1188 = &boost::unit_test::basic_cstring<char_const>::null;
        local_1180 = &boost::unit_test::basic_cstring<char_const>::null;
        file_10.m_end = (iterator)0xbe;
        file_10.m_begin = (iterator)&local_1178;
        msg_10.m_end = pvVar59;
        msg_10.m_begin = pvVar58;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,
                   (size_t)&local_1188,msg_10);
        pcVar12 = (pub->_M_dataplus)._M_p;
        local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3d8,pcVar12,pcVar12 + pub->_M_string_length);
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3f8,pub2._M_dataplus._M_p,
                   pub2._M_dataplus._M_p + pub2._M_string_length);
        bVar64 = EqualDescriptor(&local_3d8,&local_3f8);
        local_e20[0] = bVar64;
        local_e18._0_8_ = (element_type *)0x0;
        local_e18._8_8_ = (sp_counted_base *)0x0;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &script_provider_cached,"Public ser: ",&pub2);
        pbVar34 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &script_provider_cached," Public desc: ");
        script_provider.super_SigningProvider._vptr_SigningProvider =
             (_func_int **)&script_provider.scripts._M_t._M_impl.super__Rb_tree_header;
        pp_Var11 = (_func_int **)(pbVar34->_M_dataplus)._M_p;
        paVar42 = &pbVar34->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pp_Var11 == paVar42) {
          script_provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               paVar42->_M_allocated_capacity;
          script_provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               *(_Base_ptr *)((long)&pbVar34->field_2 + 8);
        }
        else {
          script_provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               paVar42->_M_allocated_capacity;
          script_provider.super_SigningProvider._vptr_SigningProvider = pp_Var11;
        }
        script_provider.scripts._M_t._M_impl._0_8_ = pbVar34->_M_string_length;
        (pbVar34->_M_dataplus)._M_p = (pointer)paVar42;
        pbVar34->_M_string_length = 0;
        (pbVar34->field_2)._M_local_buf[0] = '\0';
        pbVar34 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &script_provider,(pub->_M_dataplus)._M_p,pub->_M_string_length);
        pcVar12 = (pbVar34->_M_dataplus)._M_p;
        paVar42 = &pbVar34->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar12 == paVar42) {
          pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               *(_Base_ptr *)((long)&pbVar34->field_2 + 8);
          pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ =
               (undefined4)paVar42->_M_allocated_capacity;
          pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ =
               (undefined4)(paVar42->_M_allocated_capacity >> 0x20);
          pubkeys._M_t._M_impl._0_1_ = uVar21;
          pubkeys._M_t._M_impl._1_7_ = uVar23;
        }
        else {
          pubkeys._M_t._M_impl._0_1_ = SUB81(pcVar12,0);
          pubkeys._M_t._M_impl._1_7_ = SUB87((ulong)pcVar12 >> 8,0);
          pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ =
               (undefined4)paVar42->_M_allocated_capacity;
          pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ =
               (undefined4)(paVar42->_M_allocated_capacity >> 0x20);
        }
        pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
             (_Rb_tree_color)pbVar34->_M_string_length;
        pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ =
             SUB84(pbVar34->_M_string_length >> 0x20,0);
        (pbVar34->_M_dataplus)._M_p = (pointer)paVar42;
        pbVar34->_M_string_length = 0;
        (pbVar34->field_2)._M_local_buf[0] = '\0';
        prv1._M_string_length = prv1._M_string_length & 0xffffffffffffff00;
        prv1._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01388e08;
        prv1.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
        local_1198 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
        ;
        local_1190 = "";
        pvVar58 = (iterator)0x1;
        pvVar59 = (iterator)0x1;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_e20,(lazy_ostream *)&prv1,1,1,WARN,_cVar69,
                   (size_t)&local_1198,0xbe);
        if ((_Base_ptr *)CONCAT71(pubkeys._M_t._M_impl._1_7_,pubkeys._M_t._M_impl._0_1_) != pp_Var6)
        {
          operator_delete((undefined1 *)
                          CONCAT71(pubkeys._M_t._M_impl._1_7_,pubkeys._M_t._M_impl._0_1_),
                          CONCAT44(pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent.
                                   _4_4_,pubkeys._M_t._M_impl.super__Rb_tree_header._M_header.
                                         _M_parent._0_4_) + 1);
        }
        if ((_Rb_tree_header *)script_provider.super_SigningProvider._vptr_SigningProvider !=
            &script_provider.scripts._M_t._M_impl.super__Rb_tree_header) {
          operator_delete(script_provider.super_SigningProvider._vptr_SigningProvider,
                          script_provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_
                          + 1);
        }
        if ((_Rb_tree_header *)script_provider_cached.super_SigningProvider._vptr_SigningProvider !=
            p_Var57) {
          operator_delete(script_provider_cached.super_SigningProvider._vptr_SigningProvider,
                          script_provider_cached.scripts._M_t._M_impl.super__Rb_tree_header.
                          _M_header._0_8_ + 1);
        }
        boost::detail::shared_count::~shared_count((shared_count *)(local_e18 + 8));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
          operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
        }
        _Var53._M_p = local_3d8._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) goto LAB_003b32ae;
      }
      if (op_desc_id.super__Optional_base<uint256,_true,_true>._M_payload.
          super__Optional_payload_base<uint256>._M_engaged == true) {
        local_11a8 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
        ;
        local_11a0 = "";
        local_11b8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_11b0 = &boost::unit_test::basic_cstring<char_const>::null;
        file_11.m_end = (iterator)0xc3;
        file_11.m_begin = (iterator)&local_11a8;
        msg_11.m_end = pvVar59;
        msg_11.m_begin = pvVar58;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,
                   (size_t)&local_11b8,msg_11);
        DescriptorID((uint256 *)&prv1,(Descriptor *)p_Var1->_M_p);
        auVar66[0] = -(op_desc_id.super__Optional_base<uint256,_true,_true>._M_payload.
                       super__Optional_payload_base<uint256>._M_payload._M_value.
                       super_base_blob<256U>.m_data._M_elems[0x10] == prv1.field_2._M_local_buf[0]);
        auVar66[1] = -(op_desc_id.super__Optional_base<uint256,_true,_true>._M_payload.
                       super__Optional_payload_base<uint256>._M_payload._M_value.
                       super_base_blob<256U>.m_data._M_elems[0x11] == prv1.field_2._M_local_buf[1]);
        auVar66[2] = -(op_desc_id.super__Optional_base<uint256,_true,_true>._M_payload.
                       super__Optional_payload_base<uint256>._M_payload._M_value.
                       super_base_blob<256U>.m_data._M_elems[0x12] == prv1.field_2._M_local_buf[2]);
        auVar66[3] = -(op_desc_id.super__Optional_base<uint256,_true,_true>._M_payload.
                       super__Optional_payload_base<uint256>._M_payload._M_value.
                       super_base_blob<256U>.m_data._M_elems[0x13] == prv1.field_2._M_local_buf[3]);
        auVar66[4] = -(op_desc_id.super__Optional_base<uint256,_true,_true>._M_payload.
                       super__Optional_payload_base<uint256>._M_payload._M_value.
                       super_base_blob<256U>.m_data._M_elems[0x14] == prv1.field_2._M_local_buf[4]);
        auVar66[5] = -(op_desc_id.super__Optional_base<uint256,_true,_true>._M_payload.
                       super__Optional_payload_base<uint256>._M_payload._M_value.
                       super_base_blob<256U>.m_data._M_elems[0x15] == prv1.field_2._M_local_buf[5]);
        auVar66[6] = -(op_desc_id.super__Optional_base<uint256,_true,_true>._M_payload.
                       super__Optional_payload_base<uint256>._M_payload._M_value.
                       super_base_blob<256U>.m_data._M_elems[0x16] == prv1.field_2._M_local_buf[6]);
        auVar66[7] = -(op_desc_id.super__Optional_base<uint256,_true,_true>._M_payload.
                       super__Optional_payload_base<uint256>._M_payload._M_value.
                       super_base_blob<256U>.m_data._M_elems[0x17] == prv1.field_2._M_local_buf[7]);
        auVar66[8] = -(op_desc_id.super__Optional_base<uint256,_true,_true>._M_payload.
                       super__Optional_payload_base<uint256>._M_payload._M_value.
                       super_base_blob<256U>.m_data._M_elems[0x18] == prv1.field_2._M_local_buf[8]);
        auVar66[9] = -(op_desc_id.super__Optional_base<uint256,_true,_true>._M_payload.
                       super__Optional_payload_base<uint256>._M_payload._M_value.
                       super_base_blob<256U>.m_data._M_elems[0x19] == prv1.field_2._M_local_buf[9]);
        auVar66[10] = -(op_desc_id.super__Optional_base<uint256,_true,_true>._M_payload.
                        super__Optional_payload_base<uint256>._M_payload._M_value.
                        super_base_blob<256U>.m_data._M_elems[0x1a] == prv1.field_2._M_local_buf[10]
                       );
        auVar66[0xb] = -(op_desc_id.super__Optional_base<uint256,_true,_true>._M_payload.
                         super__Optional_payload_base<uint256>._M_payload._M_value.
                         super_base_blob<256U>.m_data._M_elems[0x1b] ==
                        prv1.field_2._M_local_buf[0xb]);
        auVar66[0xc] = -(op_desc_id.super__Optional_base<uint256,_true,_true>._M_payload.
                         super__Optional_payload_base<uint256>._M_payload._M_value.
                         super_base_blob<256U>.m_data._M_elems[0x1c] ==
                        prv1.field_2._M_local_buf[0xc]);
        auVar66[0xd] = -(op_desc_id.super__Optional_base<uint256,_true,_true>._M_payload.
                         super__Optional_payload_base<uint256>._M_payload._M_value.
                         super_base_blob<256U>.m_data._M_elems[0x1d] ==
                        prv1.field_2._M_local_buf[0xd]);
        auVar66[0xe] = -(op_desc_id.super__Optional_base<uint256,_true,_true>._M_payload.
                         super__Optional_payload_base<uint256>._M_payload._M_value.
                         super_base_blob<256U>.m_data._M_elems[0x1e] ==
                        prv1.field_2._M_local_buf[0xe]);
        auVar66[0xf] = -(op_desc_id.super__Optional_base<uint256,_true,_true>._M_payload.
                         super__Optional_payload_base<uint256>._M_payload._M_value.
                         super_base_blob<256U>.m_data._M_elems[0x1f] ==
                        prv1.field_2._M_local_buf[0xf]);
        auVar65[0] = -(op_desc_id.super__Optional_base<uint256,_true,_true>._M_payload.
                       super__Optional_payload_base<uint256>._M_payload._M_value.
                       super_base_blob<256U>.m_data._M_elems[0] == (uchar)prv1._M_dataplus._M_p);
        auVar65[1] = -(op_desc_id.super__Optional_base<uint256,_true,_true>._M_payload.
                       super__Optional_payload_base<uint256>._M_payload._M_value.
                       super_base_blob<256U>.m_data._M_elems[1] == prv1._M_dataplus._M_p._1_1_);
        auVar65[2] = -(op_desc_id.super__Optional_base<uint256,_true,_true>._M_payload.
                       super__Optional_payload_base<uint256>._M_payload._M_value.
                       super_base_blob<256U>.m_data._M_elems[2] == prv1._M_dataplus._M_p._2_1_);
        auVar65[3] = -(op_desc_id.super__Optional_base<uint256,_true,_true>._M_payload.
                       super__Optional_payload_base<uint256>._M_payload._M_value.
                       super_base_blob<256U>.m_data._M_elems[3] == prv1._M_dataplus._M_p._3_1_);
        auVar65[4] = -(op_desc_id.super__Optional_base<uint256,_true,_true>._M_payload.
                       super__Optional_payload_base<uint256>._M_payload._M_value.
                       super_base_blob<256U>.m_data._M_elems[4] == prv1._M_dataplus._M_p._4_1_);
        auVar65[5] = -(op_desc_id.super__Optional_base<uint256,_true,_true>._M_payload.
                       super__Optional_payload_base<uint256>._M_payload._M_value.
                       super_base_blob<256U>.m_data._M_elems[5] == prv1._M_dataplus._M_p._5_1_);
        auVar65[6] = -(op_desc_id.super__Optional_base<uint256,_true,_true>._M_payload.
                       super__Optional_payload_base<uint256>._M_payload._M_value.
                       super_base_blob<256U>.m_data._M_elems[6] == prv1._M_dataplus._M_p._6_1_);
        auVar65[7] = -(op_desc_id.super__Optional_base<uint256,_true,_true>._M_payload.
                       super__Optional_payload_base<uint256>._M_payload._M_value.
                       super_base_blob<256U>.m_data._M_elems[7] == prv1._M_dataplus._M_p._7_1_);
        auVar65[8] = -(op_desc_id.super__Optional_base<uint256,_true,_true>._M_payload.
                       super__Optional_payload_base<uint256>._M_payload._M_value.
                       super_base_blob<256U>.m_data._M_elems[8] == (uchar)prv1._M_string_length);
        auVar65[9] = -(op_desc_id.super__Optional_base<uint256,_true,_true>._M_payload.
                       super__Optional_payload_base<uint256>._M_payload._M_value.
                       super_base_blob<256U>.m_data._M_elems[9] == prv1._M_string_length._1_1_);
        auVar65[10] = -(op_desc_id.super__Optional_base<uint256,_true,_true>._M_payload.
                        super__Optional_payload_base<uint256>._M_payload._M_value.
                        super_base_blob<256U>.m_data._M_elems[10] == prv1._M_string_length._2_1_);
        auVar65[0xb] = -(op_desc_id.super__Optional_base<uint256,_true,_true>._M_payload.
                         super__Optional_payload_base<uint256>._M_payload._M_value.
                         super_base_blob<256U>.m_data._M_elems[0xb] == prv1._M_string_length._3_1_);
        auVar65[0xc] = -(op_desc_id.super__Optional_base<uint256,_true,_true>._M_payload.
                         super__Optional_payload_base<uint256>._M_payload._M_value.
                         super_base_blob<256U>.m_data._M_elems[0xc] == prv1._M_string_length._4_1_);
        auVar65[0xd] = -(op_desc_id.super__Optional_base<uint256,_true,_true>._M_payload.
                         super__Optional_payload_base<uint256>._M_payload._M_value.
                         super_base_blob<256U>.m_data._M_elems[0xd] == prv1._M_string_length._5_1_);
        auVar65[0xe] = -(op_desc_id.super__Optional_base<uint256,_true,_true>._M_payload.
                         super__Optional_payload_base<uint256>._M_payload._M_value.
                         super_base_blob<256U>.m_data._M_elems[0xe] == prv1._M_string_length._6_1_);
        auVar65[0xf] = -(op_desc_id.super__Optional_base<uint256,_true,_true>._M_payload.
                         super__Optional_payload_base<uint256>._M_payload._M_value.
                         super_base_blob<256U>.m_data._M_elems[0xf] == prv1._M_string_length._7_1_);
        auVar65 = auVar65 & auVar66;
        creator.super_BaseSignatureCreator._vptr_BaseSignatureCreator._0_1_ =
             (ushort)((ushort)(SUB161(auVar65 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar65 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar65 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar65 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar65 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar65 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar65 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar65 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar65 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar65 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar65 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar65 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar65 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar65 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar65 >> 0x77,0) & 1) << 0xe |
                     (ushort)(byte)(auVar65[0xf] >> 7) << 0xf) == 0xffff;
        creator.m_txto = (CMutableTransaction *)0x0;
        creator.nIn = 0;
        creator.nHashType = 0;
        DescriptorID((uint256 *)&desc_cache,(Descriptor *)p_Var1->_M_p);
        base_blob<256u>::ToString_abi_cxx11_((string *)local_f18,&desc_cache);
        pbVar34 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_f18,0,0,"DescriptorID() ",0xf);
        p_Var57 = &script_provider.scripts._M_t._M_impl.super__Rb_tree_header;
        local_e20 = (undefined1  [8])(pbVar34->_M_dataplus)._M_p;
        paVar42 = &pbVar34->field_2;
        if (local_e20 == (undefined1  [8])paVar42) {
          local_e18._8_8_ = paVar42->_M_allocated_capacity;
          local_e18._16_8_ = *(long *)((long)&pbVar34->field_2 + 8);
          local_e20 = (undefined1  [8])(local_e18 + 8);
        }
        else {
          local_e18._8_8_ = paVar42->_M_allocated_capacity;
        }
        local_e18._0_8_ = (element_type *)pbVar34->_M_string_length;
        (pbVar34->_M_dataplus)._M_p = (pointer)paVar42;
        pbVar34->_M_string_length = 0;
        (pbVar34->field_2)._M_local_buf[0] = '\0';
        pbVar34 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_e20," does not match for priv ");
        p_Var7 = &script_provider_cached.scripts._M_t._M_impl.super__Rb_tree_header;
        script_provider_cached.super_SigningProvider._vptr_SigningProvider =
             (_func_int **)(pbVar34->_M_dataplus)._M_p;
        paVar42 = &pbVar34->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)script_provider_cached.super_SigningProvider._vptr_SigningProvider == paVar42) {
          script_provider_cached.scripts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               paVar42->_M_allocated_capacity;
          script_provider_cached.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               *(_Base_ptr *)((long)&pbVar34->field_2 + 8);
          script_provider_cached.super_SigningProvider._vptr_SigningProvider = (_func_int **)p_Var7;
        }
        else {
          script_provider_cached.scripts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               paVar42->_M_allocated_capacity;
        }
        script_provider_cached.scripts._M_t._M_impl._0_8_ = pbVar34->_M_string_length;
        (pbVar34->_M_dataplus)._M_p = (pointer)paVar42;
        pbVar34->_M_string_length = 0;
        (pbVar34->field_2)._M_local_buf[0] = '\0';
        pbVar34 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &script_provider_cached,(prv->_M_dataplus)._M_p,prv->_M_string_length);
        script_provider.super_SigningProvider._vptr_SigningProvider =
             (_func_int **)(pbVar34->_M_dataplus)._M_p;
        paVar42 = &pbVar34->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)script_provider.super_SigningProvider._vptr_SigningProvider == paVar42) {
          script_provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               paVar42->_M_allocated_capacity;
          script_provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               *(_Base_ptr *)((long)&pbVar34->field_2 + 8);
          script_provider.super_SigningProvider._vptr_SigningProvider = (_func_int **)p_Var57;
        }
        else {
          script_provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               paVar42->_M_allocated_capacity;
        }
        script_provider.scripts._M_t._M_impl._0_8_ = pbVar34->_M_string_length;
        (pbVar34->_M_dataplus)._M_p = (pointer)paVar42;
        pbVar34->_M_string_length = 0;
        (pbVar34->field_2)._M_local_buf[0] = '\0';
        pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
             pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color & 0xffffff00;
        pubkeys._M_t._M_impl._0_1_ = 8;
        pubkeys._M_t._M_impl._1_7_ = 0x1388e;
        pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ = 0x139d138;
        pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = 0;
        pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&script_provider;
        local_11c8 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
        ;
        local_11c0 = "";
        pvVar58 = (iterator)0x1;
        pvVar59 = (iterator)0x1;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&creator,(lazy_ostream *)&pubkeys,1,1,WARN,_cVar69,
                   (size_t)&local_11c8,0xc3);
        if ((_Rb_tree_header *)script_provider.super_SigningProvider._vptr_SigningProvider !=
            p_Var57) {
          operator_delete(script_provider.super_SigningProvider._vptr_SigningProvider,
                          script_provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_
                          + 1);
        }
        if ((_Rb_tree_header *)script_provider_cached.super_SigningProvider._vptr_SigningProvider !=
            p_Var7) {
          operator_delete(script_provider_cached.super_SigningProvider._vptr_SigningProvider,
                          script_provider_cached.scripts._M_t._M_impl.super__Rb_tree_header.
                          _M_header._0_8_ + 1);
        }
        if (local_e20 != (undefined1  [8])(local_e18 + 8)) {
          operator_delete((void *)local_e20,(ulong)(local_e18._8_8_ + 1));
        }
        if (local_f18 != (undefined1  [8])(local_f10 + 8)) {
          operator_delete((void *)local_f18,auStack_f08._0_8_ + 1);
        }
        boost::detail::shared_count::~shared_count((shared_count *)&creator.nIn);
      }
      if (-1 < (char)flags) {
        prv1._M_dataplus._M_p = (pointer)&prv1.field_2;
        prv1._M_string_length = 0;
        auVar19[0xf] = 0;
        auVar19._0_15_ = prv1.field_2._1_15_;
        prv1.field_2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        )(auVar19 << 8);
        local_11d8 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
        ;
        local_11d0 = "";
        local_11e8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_11e0 = &boost::unit_test::basic_cstring<char_const>::null;
        file_12.m_end = (iterator)0xc9;
        file_12.m_begin = (iterator)&local_11d8;
        msg_12.m_end = pvVar59;
        msg_12.m_begin = pvVar58;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,
                   (size_t)&local_11e8,msg_12);
        uVar26 = (**(code **)(*(long *)p_Var1->_M_p + 0x30))(p_Var1->_M_p,&keys_priv,&prv1);
        script_provider.super_SigningProvider._vptr_SigningProvider._0_1_ = uVar26;
        script_provider.scripts._M_t._M_impl._0_16_ = (undefined1  [16])0x0;
        pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             (_Base_ptr)&script_provider_cached;
        script_provider_cached.super_SigningProvider._vptr_SigningProvider =
             (_func_int **)anon_var_dwarf_91662c;
        script_provider_cached.scripts._M_t._M_impl._0_8_ = "";
        pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
             pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color & 0xffffff00;
        pubkeys._M_t._M_impl._0_1_ = 0x48;
        pubkeys._M_t._M_impl._1_7_ = 0x13890;
        pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ = 0x139d138;
        pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = 0;
        local_11f8 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
        ;
        local_11f0 = "";
        pvVar58 = (iterator)0x1;
        pvVar59 = (iterator)0x0;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&script_provider,(lazy_ostream *)&pubkeys,1,0,WARN,_cVar69,
                   (size_t)&local_11f8,0xc9);
        p_Var57 = &script_provider.scripts._M_t._M_impl.super__Rb_tree_header;
        boost::detail::shared_count::~shared_count((shared_count *)p_Var57);
        if ((expected_prv->
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            )._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_engaged == true) {
          local_1208 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
          ;
          local_1200 = "";
          local_1218 = &boost::unit_test::basic_cstring<char_const>::null;
          local_1210 = &boost::unit_test::basic_cstring<char_const>::null;
          file_13.m_end = (iterator)0xcb;
          file_13.m_begin = (iterator)&local_1208;
          msg_13.m_end = pvVar59;
          msg_13.m_begin = pvVar58;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,
                     (size_t)&local_1218,msg_13);
          _Var53._M_p = (expected_prv->
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        )._M_payload.
                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._M_payload._M_value._M_dataplus._M_p;
          local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_418,_Var53._M_p,
                     _Var53._M_p +
                     (expected_prv->
                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                     )._M_payload.
                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ._M_payload._M_value._M_string_length);
          local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_438,prv1._M_dataplus._M_p,
                     prv1._M_dataplus._M_p + prv1._M_string_length);
          bVar64 = EqualDescriptor(&local_418,&local_438);
          local_f18[0] = (class_property<bool>)(class_property<bool>)bVar64;
          local_f10 = (undefined1  [8])0x0;
          auStack_f08._0_8_ = (sp_counted_base *)0x0;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_e20,"Private ser: ",&prv1);
          pbVar34 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_e20,"Private desc: ");
          p_Var7 = &script_provider_cached.scripts._M_t._M_impl.super__Rb_tree_header;
          script_provider_cached.super_SigningProvider._vptr_SigningProvider =
               (_func_int **)(pbVar34->_M_dataplus)._M_p;
          paVar42 = &pbVar34->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)script_provider_cached.super_SigningProvider._vptr_SigningProvider == paVar42) {
            script_provider_cached.scripts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                 paVar42->_M_allocated_capacity;
            script_provider_cached.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 *(_Base_ptr *)((long)&pbVar34->field_2 + 8);
            script_provider_cached.super_SigningProvider._vptr_SigningProvider =
                 (_func_int **)p_Var7;
          }
          else {
            script_provider_cached.scripts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                 paVar42->_M_allocated_capacity;
          }
          script_provider_cached.scripts._M_t._M_impl._0_8_ = pbVar34->_M_string_length;
          (pbVar34->_M_dataplus)._M_p = (pointer)paVar42;
          pbVar34->_M_string_length = 0;
          (pbVar34->field_2)._M_local_buf[0] = '\0';
          pbVar34 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::_M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&script_provider_cached,
                                (expected_prv->
                                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                )._M_payload.
                                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                .
                                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ._M_payload._M_value._M_dataplus._M_p,
                                (expected_prv->
                                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                )._M_payload.
                                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                .
                                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ._M_payload._M_value._M_string_length);
          script_provider.super_SigningProvider._vptr_SigningProvider =
               (_func_int **)(pbVar34->_M_dataplus)._M_p;
          paVar42 = &pbVar34->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)script_provider.super_SigningProvider._vptr_SigningProvider == paVar42) {
            script_provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                 paVar42->_M_allocated_capacity;
            script_provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 *(_Base_ptr *)((long)&pbVar34->field_2 + 8);
            script_provider.super_SigningProvider._vptr_SigningProvider = (_func_int **)p_Var57;
          }
          else {
            script_provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                 paVar42->_M_allocated_capacity;
          }
          script_provider.scripts._M_t._M_impl._0_8_ = pbVar34->_M_string_length;
          (pbVar34->_M_dataplus)._M_p = (pointer)paVar42;
          pbVar34->_M_string_length = 0;
          (pbVar34->field_2)._M_local_buf[0] = '\0';
          pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
               pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color & 0xffffff00;
          pubkeys._M_t._M_impl._0_1_ = 8;
          pubkeys._M_t._M_impl._1_7_ = 0x1388e;
          pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ = 0x139d138;
          pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = 0;
          local_1228 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
          ;
          local_1220 = "";
          pvVar58 = (iterator)0x1;
          pvVar59 = (iterator)0x1;
          pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&script_provider
          ;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)local_f18,(lazy_ostream *)&pubkeys,1,1,WARN,_cVar69,
                     (size_t)&local_1228,0xcb);
          if ((_Rb_tree_header *)script_provider.super_SigningProvider._vptr_SigningProvider !=
              p_Var57) {
            operator_delete(script_provider.super_SigningProvider._vptr_SigningProvider,
                            script_provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header.
                            _0_8_ + 1);
          }
          if ((_Rb_tree_header *)script_provider_cached.super_SigningProvider._vptr_SigningProvider
              != p_Var7) {
            operator_delete(script_provider_cached.super_SigningProvider._vptr_SigningProvider,
                            script_provider_cached.scripts._M_t._M_impl.super__Rb_tree_header.
                            _M_header._0_8_ + 1);
          }
          if (local_e20 != (undefined1  [8])(local_e18 + 8)) {
            operator_delete((void *)local_e20,(ulong)(local_e18._8_8_ + 1));
          }
          boost::detail::shared_count::~shared_count((shared_count *)(local_f10 + 8));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_438._M_dataplus._M_p != &local_438.field_2) {
            operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
          }
          local_458.field_2._M_allocated_capacity = local_418.field_2._M_allocated_capacity;
          _Var53._M_p = local_418._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_418._M_dataplus._M_p != &local_418.field_2) {
LAB_003b3c71:
            operator_delete(_Var53._M_p,local_458.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          local_1238 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
          ;
          local_1230 = "";
          local_1248 = &boost::unit_test::basic_cstring<char_const>::null;
          local_1240 = &boost::unit_test::basic_cstring<char_const>::null;
          file_14.m_end = (iterator)0xcd;
          file_14.m_begin = (iterator)&local_1238;
          msg_14.m_end = pvVar59;
          msg_14.m_begin = pvVar58;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,
                     (size_t)&local_1248,msg_14);
          pcVar12 = (prv->_M_dataplus)._M_p;
          local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_458,pcVar12,pcVar12 + prv->_M_string_length);
          local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_478,prv1._M_dataplus._M_p,
                     prv1._M_dataplus._M_p + prv1._M_string_length);
          bVar64 = EqualDescriptor(&local_458,&local_478);
          local_f18[0] = (class_property<bool>)(class_property<bool>)bVar64;
          local_f10 = (undefined1  [8])0x0;
          auStack_f08._0_8_ = (sp_counted_base *)0x0;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_e20,"Private ser: ",&prv1);
          pbVar34 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_e20," Private desc: ");
          p_Var7 = &script_provider_cached.scripts._M_t._M_impl.super__Rb_tree_header;
          script_provider_cached.super_SigningProvider._vptr_SigningProvider =
               (_func_int **)(pbVar34->_M_dataplus)._M_p;
          paVar42 = &pbVar34->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)script_provider_cached.super_SigningProvider._vptr_SigningProvider == paVar42) {
            script_provider_cached.scripts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                 paVar42->_M_allocated_capacity;
            script_provider_cached.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 *(_Base_ptr *)((long)&pbVar34->field_2 + 8);
            script_provider_cached.super_SigningProvider._vptr_SigningProvider =
                 (_func_int **)p_Var7;
          }
          else {
            script_provider_cached.scripts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                 paVar42->_M_allocated_capacity;
          }
          script_provider_cached.scripts._M_t._M_impl._0_8_ = pbVar34->_M_string_length;
          (pbVar34->_M_dataplus)._M_p = (pointer)paVar42;
          pbVar34->_M_string_length = 0;
          (pbVar34->field_2)._M_local_buf[0] = '\0';
          pbVar34 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::_M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&script_provider_cached,(prv->_M_dataplus)._M_p,
                                prv->_M_string_length);
          script_provider.super_SigningProvider._vptr_SigningProvider =
               (_func_int **)(pbVar34->_M_dataplus)._M_p;
          paVar42 = &pbVar34->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)script_provider.super_SigningProvider._vptr_SigningProvider == paVar42) {
            script_provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                 paVar42->_M_allocated_capacity;
            script_provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 *(_Base_ptr *)((long)&pbVar34->field_2 + 8);
            script_provider.super_SigningProvider._vptr_SigningProvider = (_func_int **)p_Var57;
          }
          else {
            script_provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                 paVar42->_M_allocated_capacity;
          }
          script_provider.scripts._M_t._M_impl._0_8_ = pbVar34->_M_string_length;
          (pbVar34->_M_dataplus)._M_p = (pointer)paVar42;
          pbVar34->_M_string_length = 0;
          (pbVar34->field_2)._M_local_buf[0] = '\0';
          pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
               pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color & 0xffffff00;
          pubkeys._M_t._M_impl._0_1_ = 8;
          pubkeys._M_t._M_impl._1_7_ = 0x1388e;
          pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ = 0x139d138;
          pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = 0;
          local_1258 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
          ;
          local_1250 = "";
          pvVar58 = (iterator)0x1;
          pvVar59 = (iterator)0x1;
          pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&script_provider
          ;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)local_f18,(lazy_ostream *)&pubkeys,1,1,WARN,_cVar69,
                     (size_t)&local_1258,0xcd);
          if ((_Rb_tree_header *)script_provider.super_SigningProvider._vptr_SigningProvider !=
              p_Var57) {
            operator_delete(script_provider.super_SigningProvider._vptr_SigningProvider,
                            script_provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header.
                            _0_8_ + 1);
          }
          if ((_Rb_tree_header *)script_provider_cached.super_SigningProvider._vptr_SigningProvider
              != p_Var7) {
            operator_delete(script_provider_cached.super_SigningProvider._vptr_SigningProvider,
                            script_provider_cached.scripts._M_t._M_impl.super__Rb_tree_header.
                            _M_header._0_8_ + 1);
          }
          if (local_e20 != (undefined1  [8])(local_e18 + 8)) {
            operator_delete((void *)local_e20,(ulong)(local_e18._8_8_ + 1));
          }
          boost::detail::shared_count::~shared_count((shared_count *)(local_f10 + 8));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_478._M_dataplus._M_p != &local_478.field_2) {
            operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
          }
          _Var53._M_p = local_458._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_458._M_dataplus._M_p != &local_458.field_2) goto LAB_003b3c71;
        }
        local_1268 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
        ;
        local_1260 = "";
        local_1278 = &boost::unit_test::basic_cstring<char_const>::null;
        local_1270 = &boost::unit_test::basic_cstring<char_const>::null;
        file_15.m_end = (iterator)0xcf;
        file_15.m_begin = (iterator)&local_1268;
        msg_15.m_end = pvVar59;
        msg_15.m_begin = pvVar58;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,
                   (size_t)&local_1278,msg_15);
        uVar26 = (**(code **)(*(long *)p_Var1->_M_p + 0x30))(p_Var1->_M_p,&keys_pub,&prv1);
        script_provider.super_SigningProvider._vptr_SigningProvider =
             (_func_int **)
             (CONCAT71(script_provider.super_SigningProvider._vptr_SigningProvider._1_7_,uVar26) ^ 1
             );
        script_provider.scripts._M_t._M_impl._0_16_ = (undefined1  [16])0x0;
        script_provider_cached.super_SigningProvider._vptr_SigningProvider =
             (_func_int **)anon_var_dwarf_916650;
        script_provider_cached.scripts._M_t._M_impl._0_8_ =
             (long)"!parse_priv->ToPrivateString(keys_pub, prv1)" + 0x2c;
        pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
             pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color & 0xffffff00;
        pubkeys._M_t._M_impl._0_1_ = 0x48;
        pubkeys._M_t._M_impl._1_7_ = 0x13890;
        pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ = 0x139d138;
        pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = 0;
        local_1288 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
        ;
        local_1280 = "";
        pvVar58 = (iterator)0x1;
        pvVar59 = (iterator)0x0;
        pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             (_Base_ptr)&script_provider_cached;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&script_provider,(lazy_ostream *)&pubkeys,1,0,WARN,_cVar69,
                   (size_t)&local_1288,0xcf);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)&script_provider.scripts._M_t._M_impl.super__Rb_tree_header);
        local_1298 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
        ;
        local_1290 = "";
        local_12a8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_12a0 = &boost::unit_test::basic_cstring<char_const>::null;
        file_16.m_end = (iterator)0xd0;
        file_16.m_begin = (iterator)&local_1298;
        msg_16.m_end = pvVar59;
        msg_16.m_begin = pvVar58;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,
                   (size_t)&local_12a8,msg_16);
        uVar26 = (**(code **)(*(long *)p_Var32->_M_p + 0x30))(p_Var32->_M_p,&keys_priv,&prv1);
        script_provider.super_SigningProvider._vptr_SigningProvider._0_1_ = uVar26;
        script_provider.scripts._M_t._M_impl._0_16_ = (undefined1  [16])0x0;
        script_provider_cached.super_SigningProvider._vptr_SigningProvider =
             (_func_int **)anon_var_dwarf_91665c;
        script_provider_cached.scripts._M_t._M_impl._0_8_ =
             (long)"parse_pub->ToPrivateString(keys_priv, prv1)" + 0x2b;
        pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
             pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color & 0xffffff00;
        pubkeys._M_t._M_impl._0_1_ = 0x48;
        pubkeys._M_t._M_impl._1_7_ = 0x13890;
        pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ = 0x139d138;
        pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = 0;
        local_12b8 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
        ;
        local_12b0 = "";
        pvVar58 = (iterator)0x1;
        pvVar59 = (iterator)0x0;
        pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             (_Base_ptr)&script_provider_cached;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&script_provider,(lazy_ostream *)&pubkeys,1,0,WARN,_cVar69,
                   (size_t)&local_12b8,0xd0);
        p_Var57 = &script_provider.scripts._M_t._M_impl.super__Rb_tree_header;
        boost::detail::shared_count::~shared_count((shared_count *)p_Var57);
        if ((expected_prv->
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            )._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_engaged == true) {
          local_12c8 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
          ;
          local_12c0 = "";
          local_12d8 = &boost::unit_test::basic_cstring<char_const>::null;
          local_12d0 = &boost::unit_test::basic_cstring<char_const>::null;
          file_17.m_end = (iterator)0xd2;
          file_17.m_begin = (iterator)&local_12c8;
          msg_17.m_end = pvVar59;
          msg_17.m_begin = pvVar58;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,
                     (size_t)&local_12d8,msg_17);
          _Var53._M_p = (expected_prv->
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        )._M_payload.
                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._M_payload._M_value._M_dataplus._M_p;
          local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_498,_Var53._M_p,
                     _Var53._M_p +
                     (expected_prv->
                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                     )._M_payload.
                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ._M_payload._M_value._M_string_length);
          local_4b8._M_allocated_capacity = (size_type)&local_4a8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_4b8,prv1._M_dataplus._M_p,
                     prv1._M_dataplus._M_p + prv1._M_string_length);
          bVar64 = EqualDescriptor(&local_498,(string *)&local_4b8);
          script_provider.super_SigningProvider._vptr_SigningProvider._0_1_ = bVar64;
          script_provider.scripts._M_t._M_impl._0_16_ = (undefined1  [16])0x0;
          script_provider_cached.super_SigningProvider._vptr_SigningProvider =
               (_func_int **)anon_var_dwarf_916668;
          script_provider_cached.scripts._M_t._M_impl._0_8_ = "";
          pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
               pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color & 0xffffff00;
          pubkeys._M_t._M_impl._0_1_ = 0x48;
          pubkeys._M_t._M_impl._1_7_ = 0x13890;
          pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ = 0x139d138;
          pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = 0;
          local_12e8 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
          ;
          local_12e0 = "";
          pvVar58 = (iterator)0x1;
          pvVar59 = (iterator)0x0;
          pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               (_Base_ptr)&script_provider_cached;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)&script_provider,(lazy_ostream *)&pubkeys,1,0,WARN,_cVar69,
                     (size_t)&local_12e8,0xd2);
          p_Var57 = &script_provider.scripts._M_t._M_impl.super__Rb_tree_header;
          boost::detail::shared_count::~shared_count((shared_count *)p_Var57);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4b8._M_allocated_capacity != &local_4a8) {
            operator_delete((void *)local_4b8._M_allocated_capacity,
                            local_4a8._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_498._M_dataplus._M_p != &local_498.field_2) {
            operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
          }
          local_12f8 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
          ;
          local_12f0 = "";
          local_1308 = &boost::unit_test::basic_cstring<char_const>::null;
          local_1300 = &boost::unit_test::basic_cstring<char_const>::null;
          file_18.m_end = (iterator)0xd3;
          file_18.m_begin = (iterator)&local_12f8;
          msg_18.m_end = pvVar59;
          msg_18.m_begin = pvVar58;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,
                     (size_t)&local_1308,msg_18);
          _Var53._M_p = (expected_prv->
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        )._M_payload.
                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._M_payload._M_value._M_dataplus._M_p;
          local_4d8._0_8_ = (string *)(local_4d8 + 0x10);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_4d8,_Var53._M_p,
                     _Var53._M_p +
                     (expected_prv->
                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                     )._M_payload.
                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ._M_payload._M_value._M_string_length);
          local_4f8._M_allocated_capacity = (size_type)&local_4e8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_4f8,prv1._M_dataplus._M_p,
                     prv1._M_dataplus._M_p + prv1._M_string_length);
          bVar64 = EqualDescriptor((string *)local_4d8,(string *)&local_4f8);
          local_f18[0] = (class_property<bool>)(class_property<bool>)bVar64;
          local_f10 = (undefined1  [8])0x0;
          auStack_f08._0_8_ = (sp_counted_base *)0x0;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_e20,"Private ser: ",&prv1);
          pbVar34 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_e20," Private desc: ");
          p_Var7 = &script_provider_cached.scripts._M_t._M_impl.super__Rb_tree_header;
          script_provider_cached.super_SigningProvider._vptr_SigningProvider =
               (_func_int **)(pbVar34->_M_dataplus)._M_p;
          paVar42 = &pbVar34->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)script_provider_cached.super_SigningProvider._vptr_SigningProvider == paVar42) {
            script_provider_cached.scripts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                 paVar42->_M_allocated_capacity;
            script_provider_cached.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 *(_Base_ptr *)((long)&pbVar34->field_2 + 8);
            script_provider_cached.super_SigningProvider._vptr_SigningProvider =
                 (_func_int **)p_Var7;
          }
          else {
            script_provider_cached.scripts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                 paVar42->_M_allocated_capacity;
          }
          script_provider_cached.scripts._M_t._M_impl._0_8_ = pbVar34->_M_string_length;
          (pbVar34->_M_dataplus)._M_p = (pointer)paVar42;
          pbVar34->_M_string_length = 0;
          (pbVar34->field_2)._M_local_buf[0] = '\0';
          pbVar34 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::_M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&script_provider_cached,
                                (expected_prv->
                                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                )._M_payload.
                                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                .
                                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ._M_payload._M_value._M_dataplus._M_p,
                                (expected_prv->
                                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                )._M_payload.
                                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                .
                                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ._M_payload._M_value._M_string_length);
          script_provider.super_SigningProvider._vptr_SigningProvider =
               (_func_int **)(pbVar34->_M_dataplus)._M_p;
          paVar42 = &pbVar34->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)script_provider.super_SigningProvider._vptr_SigningProvider == paVar42) {
            script_provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                 paVar42->_M_allocated_capacity;
            script_provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 *(_Base_ptr *)((long)&pbVar34->field_2 + 8);
            script_provider.super_SigningProvider._vptr_SigningProvider = (_func_int **)p_Var57;
          }
          else {
            script_provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                 paVar42->_M_allocated_capacity;
          }
          script_provider.scripts._M_t._M_impl._0_8_ = pbVar34->_M_string_length;
          (pbVar34->_M_dataplus)._M_p = (pointer)paVar42;
          pbVar34->_M_string_length = 0;
          (pbVar34->field_2)._M_local_buf[0] = '\0';
          pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
               pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color & 0xffffff00;
          pubkeys._M_t._M_impl._0_1_ = 8;
          pubkeys._M_t._M_impl._1_7_ = 0x1388e;
          pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ = 0x139d138;
          pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = 0;
          local_1318 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
          ;
          local_1310 = "";
          pvVar58 = (iterator)0x1;
          pvVar59 = (iterator)0x1;
          pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&script_provider
          ;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)local_f18,(lazy_ostream *)&pubkeys,1,1,WARN,_cVar69,
                     (size_t)&local_1318,0xd3);
          if ((_Rb_tree_header *)script_provider.super_SigningProvider._vptr_SigningProvider !=
              p_Var57) {
            operator_delete(script_provider.super_SigningProvider._vptr_SigningProvider,
                            script_provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header.
                            _0_8_ + 1);
          }
          if ((_Rb_tree_header *)script_provider_cached.super_SigningProvider._vptr_SigningProvider
              != p_Var7) {
            operator_delete(script_provider_cached.super_SigningProvider._vptr_SigningProvider,
                            script_provider_cached.scripts._M_t._M_impl.super__Rb_tree_header.
                            _M_header._0_8_ + 1);
          }
          if (local_e20 != (undefined1  [8])(local_e18 + 8)) {
            operator_delete((void *)local_e20,(ulong)(local_e18._8_8_ + 1));
          }
          boost::detail::shared_count::~shared_count((shared_count *)(local_f10 + 8));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4f8._M_allocated_capacity != &local_4e8) {
            operator_delete((void *)local_4f8._M_allocated_capacity,
                            local_4e8._M_allocated_capacity + 1);
          }
          local_518._16_8_ = local_4d8._16_8_;
          psVar54 = (string *)local_4d8._0_8_;
          if ((string *)local_4d8._0_8_ != (string *)(local_4d8 + 0x10)) {
LAB_003b456d:
            operator_delete(psVar54,local_518._16_8_ + 1);
          }
        }
        else {
          local_1328 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
          ;
          local_1320 = "";
          local_1338 = &boost::unit_test::basic_cstring<char_const>::null;
          local_1330 = &boost::unit_test::basic_cstring<char_const>::null;
          file_19.m_end = (iterator)0xd5;
          file_19.m_begin = (iterator)&local_1328;
          msg_19.m_end = pvVar59;
          msg_19.m_begin = pvVar58;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,
                     (size_t)&local_1338,msg_19);
          pcVar12 = (prv->_M_dataplus)._M_p;
          local_518._0_8_ = (string *)(local_518 + 0x10);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_518,pcVar12,pcVar12 + prv->_M_string_length);
          local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_538,prv1._M_dataplus._M_p,
                     prv1._M_dataplus._M_p + prv1._M_string_length);
          bVar64 = EqualDescriptor((string *)local_518,&local_538);
          local_f18[0] = (class_property<bool>)(class_property<bool>)bVar64;
          local_f10 = (undefined1  [8])0x0;
          auStack_f08._0_8_ = (sp_counted_base *)0x0;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_e20,"Private ser: ",&prv1);
          pbVar34 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_e20," Private desc: ");
          p_Var7 = &script_provider_cached.scripts._M_t._M_impl.super__Rb_tree_header;
          script_provider_cached.super_SigningProvider._vptr_SigningProvider =
               (_func_int **)(pbVar34->_M_dataplus)._M_p;
          paVar42 = &pbVar34->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)script_provider_cached.super_SigningProvider._vptr_SigningProvider == paVar42) {
            script_provider_cached.scripts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                 paVar42->_M_allocated_capacity;
            script_provider_cached.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 *(_Base_ptr *)((long)&pbVar34->field_2 + 8);
            script_provider_cached.super_SigningProvider._vptr_SigningProvider =
                 (_func_int **)p_Var7;
          }
          else {
            script_provider_cached.scripts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                 paVar42->_M_allocated_capacity;
          }
          script_provider_cached.scripts._M_t._M_impl._0_8_ = pbVar34->_M_string_length;
          (pbVar34->_M_dataplus)._M_p = (pointer)paVar42;
          pbVar34->_M_string_length = 0;
          (pbVar34->field_2)._M_local_buf[0] = '\0';
          pbVar34 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::_M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&script_provider_cached,(prv->_M_dataplus)._M_p,
                                prv->_M_string_length);
          script_provider.super_SigningProvider._vptr_SigningProvider =
               (_func_int **)(pbVar34->_M_dataplus)._M_p;
          paVar42 = &pbVar34->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)script_provider.super_SigningProvider._vptr_SigningProvider == paVar42) {
            script_provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                 paVar42->_M_allocated_capacity;
            script_provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 *(_Base_ptr *)((long)&pbVar34->field_2 + 8);
            script_provider.super_SigningProvider._vptr_SigningProvider = (_func_int **)p_Var57;
          }
          else {
            script_provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                 paVar42->_M_allocated_capacity;
          }
          script_provider.scripts._M_t._M_impl._0_8_ = pbVar34->_M_string_length;
          (pbVar34->_M_dataplus)._M_p = (pointer)paVar42;
          pbVar34->_M_string_length = 0;
          (pbVar34->field_2)._M_local_buf[0] = '\0';
          pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
               pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color & 0xffffff00;
          pubkeys._M_t._M_impl._0_1_ = 8;
          pubkeys._M_t._M_impl._1_7_ = 0x1388e;
          pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ = 0x139d138;
          pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = 0;
          local_1348 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
          ;
          local_1340 = "";
          pvVar58 = (iterator)0x1;
          pvVar59 = (iterator)0x1;
          pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&script_provider
          ;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)local_f18,(lazy_ostream *)&pubkeys,1,1,WARN,_cVar69,
                     (size_t)&local_1348,0xd5);
          if ((_Rb_tree_header *)script_provider.super_SigningProvider._vptr_SigningProvider !=
              p_Var57) {
            operator_delete(script_provider.super_SigningProvider._vptr_SigningProvider,
                            script_provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header.
                            _0_8_ + 1);
          }
          if ((_Rb_tree_header *)script_provider_cached.super_SigningProvider._vptr_SigningProvider
              != p_Var7) {
            operator_delete(script_provider_cached.super_SigningProvider._vptr_SigningProvider,
                            script_provider_cached.scripts._M_t._M_impl.super__Rb_tree_header.
                            _M_header._0_8_ + 1);
          }
          if (local_e20 != (undefined1  [8])(local_e18 + 8)) {
            operator_delete((void *)local_e20,(ulong)(local_e18._8_8_ + 1));
          }
          boost::detail::shared_count::~shared_count((shared_count *)(local_f10 + 8));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_538._M_dataplus._M_p != &local_538.field_2) {
            operator_delete(local_538._M_dataplus._M_p,local_538.field_2._M_allocated_capacity + 1);
          }
          psVar54 = (string *)local_518._0_8_;
          if ((string *)local_518._0_8_ != (string *)(local_518 + 0x10)) goto LAB_003b456d;
        }
        local_1358 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
        ;
        local_1350 = "";
        local_1368 = &boost::unit_test::basic_cstring<char_const>::null;
        local_1360 = &boost::unit_test::basic_cstring<char_const>::null;
        file_20.m_end = (iterator)0xd7;
        file_20.m_begin = (iterator)&local_1358;
        msg_20.m_end = pvVar59;
        msg_20.m_begin = pvVar58;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,
                   (size_t)&local_1368,msg_20);
        uVar26 = (**(code **)(*(long *)p_Var32->_M_p + 0x30))(p_Var32->_M_p,&keys_pub,&prv1);
        script_provider.super_SigningProvider._vptr_SigningProvider =
             (_func_int **)
             (CONCAT71(script_provider.super_SigningProvider._vptr_SigningProvider._1_7_,uVar26) ^ 1
             );
        script_provider.scripts._M_t._M_impl._0_8_ = 0;
        script_provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        script_provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        script_provider_cached.super_SigningProvider._vptr_SigningProvider =
             (_func_int **)anon_var_dwarf_916682;
        script_provider_cached.scripts._M_t._M_impl._0_8_ = "";
        pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
             pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color & 0xffffff00;
        pubkeys._M_t._M_impl._0_1_ = 0x48;
        pubkeys._M_t._M_impl._1_7_ = 0x13890;
        pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ = 0x139d138;
        pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = 0;
        local_1378 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
        ;
        local_1370 = "";
        pvVar58 = (iterator)0x1;
        pvVar59 = (iterator)0x0;
        pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             (_Base_ptr)&script_provider_cached;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&script_provider,(lazy_ostream *)&pubkeys,1,0,WARN,_cVar69,
                   (size_t)&local_1378,0xd7);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)&script_provider.scripts._M_t._M_impl.super__Rb_tree_header);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)prv1._M_dataplus._M_p != &prv1.field_2) {
          operator_delete(prv1._M_dataplus._M_p,prv1.field_2._M_allocated_capacity + 1);
        }
      }
      norm1._M_dataplus._M_p = (pointer)&norm1.field_2;
      norm1._M_string_length = 0;
      norm1.field_2._M_local_buf[0] = '\0';
      local_1388 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
      ;
      local_1380 = "";
      local_1398 = &boost::unit_test::basic_cstring<char_const>::null;
      local_1390 = &boost::unit_test::basic_cstring<char_const>::null;
      file_21.m_end = (iterator)0xdc;
      file_21.m_begin = (iterator)&local_1388;
      msg_21.m_end = pvVar59;
      msg_21.m_begin = pvVar58;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_1398,
                 msg_21);
      pubkeys._M_t._M_impl._0_1_ =
           (**(code **)(*(long *)p_Var1->_M_p + 0x38))(p_Var1->_M_p,&keys_priv,&norm1,0);
      pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ = 0;
      pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = 0;
      script_provider.super_SigningProvider._vptr_SigningProvider =
           (_func_int **)anon_var_dwarf_91668e;
      script_provider.scripts._M_t._M_impl._0_8_ = "";
      prv1._M_string_length = prv1._M_string_length & 0xffffffffffffff00;
      prv1._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01389048;
      prv1.field_2._8_8_ = &script_provider;
      prv1.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_13a8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
      ;
      local_13a0 = "";
      pvVar58 = (iterator)0x1;
      pvVar59 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&pubkeys,(lazy_ostream *)&prv1,1,0,WARN,_cVar69,
                 (size_t)&local_13a8,0xdc);
      pp_Var6 = &pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      boost::detail::shared_count::~shared_count((shared_count *)pp_Var6);
      local_13b8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
      ;
      local_13b0 = "";
      local_13c8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_13c0 = &boost::unit_test::basic_cstring<char_const>::null;
      file_22.m_end = (iterator)0xdd;
      file_22.m_begin = (iterator)&local_13b8;
      msg_22.m_end = pvVar59;
      msg_22.m_begin = pvVar58;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_13c8,
                 msg_22);
      local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_578,norm1._M_dataplus._M_p,
                 norm1._M_dataplus._M_p + norm1._M_string_length);
      pcVar12 = (norm_pub->_M_dataplus)._M_p;
      local_598._M_dataplus._M_p = (pointer)&local_598.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_598,pcVar12,pcVar12 + norm_pub->_M_string_length);
      rVar25.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)EqualDescriptor(&local_578,&local_598);
      local_e20[0] = rVar25.super_readonly_property<bool>.super_class_property<bool>.value;
      local_e18._0_8_ = (element_type *)0x0;
      local_e18._8_8_ = (sp_counted_base *)0x0;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &script_provider_cached,"priv->ToNormalizedString(): ",&norm1);
      pbVar34 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &script_provider_cached," Norm. desc: ");
      script_provider.super_SigningProvider._vptr_SigningProvider =
           (_func_int **)&script_provider.scripts._M_t._M_impl.super__Rb_tree_header;
      pp_Var11 = (_func_int **)(pbVar34->_M_dataplus)._M_p;
      paVar42 = &pbVar34->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pp_Var11 == paVar42) {
        script_provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             paVar42->_M_allocated_capacity;
        script_provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             *(_Base_ptr *)((long)&pbVar34->field_2 + 8);
      }
      else {
        script_provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             paVar42->_M_allocated_capacity;
        script_provider.super_SigningProvider._vptr_SigningProvider = pp_Var11;
      }
      script_provider.scripts._M_t._M_impl._0_8_ = pbVar34->_M_string_length;
      (pbVar34->_M_dataplus)._M_p = (pointer)paVar42;
      pbVar34->_M_string_length = 0;
      (pbVar34->field_2)._M_local_buf[0] = '\0';
      pbVar34 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &script_provider,(norm_pub->_M_dataplus)._M_p,norm_pub->_M_string_length);
      pubkeys._M_t._M_impl._0_1_ = SUB81(pp_Var6,0);
      pubkeys._M_t._M_impl._1_7_ = SUB87((ulong)pp_Var6 >> 8,0);
      pcVar12 = (pbVar34->_M_dataplus)._M_p;
      paVar42 = &pbVar34->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar12 == paVar42) {
        pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             *(_Base_ptr *)((long)&pbVar34->field_2 + 8);
        pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ =
             (undefined4)paVar42->_M_allocated_capacity;
        pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ =
             (undefined4)(paVar42->_M_allocated_capacity >> 0x20);
      }
      else {
        pubkeys._M_t._M_impl._0_1_ = SUB81(pcVar12,0);
        pubkeys._M_t._M_impl._1_7_ = SUB87((ulong)pcVar12 >> 8,0);
        pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ =
             (undefined4)paVar42->_M_allocated_capacity;
        pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ =
             (undefined4)(paVar42->_M_allocated_capacity >> 0x20);
      }
      pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
           (_Rb_tree_color)pbVar34->_M_string_length;
      pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ =
           SUB84(pbVar34->_M_string_length >> 0x20,0);
      (pbVar34->_M_dataplus)._M_p = (pointer)paVar42;
      pbVar34->_M_string_length = 0;
      (pbVar34->field_2)._M_local_buf[0] = '\0';
      prv1._M_string_length = prv1._M_string_length & 0xffffffffffffff00;
      prv1._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01388e08;
      prv1.field_2._8_8_ = (assertion_result *)&pubkeys;
      prv1.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_13d8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
      ;
      local_13d0 = "";
      pvVar58 = (iterator)0x1;
      pvVar59 = (iterator)0x1;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_e20,(lazy_ostream *)&prv1,1,1,WARN,_cVar69,
                 (size_t)&local_13d8,0xdd);
      if ((_Base_ptr *)CONCAT71(pubkeys._M_t._M_impl._1_7_,pubkeys._M_t._M_impl._0_1_) != pp_Var6) {
        operator_delete((undefined1 *)
                        CONCAT71(pubkeys._M_t._M_impl._1_7_,pubkeys._M_t._M_impl._0_1_),
                        CONCAT44(pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent.
                                 _4_4_,pubkeys._M_t._M_impl.super__Rb_tree_header._M_header.
                                       _M_parent._0_4_) + 1);
      }
      if ((_Rb_tree_header *)script_provider.super_SigningProvider._vptr_SigningProvider !=
          &script_provider.scripts._M_t._M_impl.super__Rb_tree_header) {
        operator_delete(script_provider.super_SigningProvider._vptr_SigningProvider,
                        script_provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ +
                        1);
      }
      p_Var57 = &script_provider_cached.scripts._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)script_provider_cached.super_SigningProvider._vptr_SigningProvider !=
          p_Var57) {
        operator_delete(script_provider_cached.super_SigningProvider._vptr_SigningProvider,
                        script_provider_cached.scripts._M_t._M_impl.super__Rb_tree_header._M_header.
                        _0_8_ + 1);
      }
      boost::detail::shared_count::~shared_count((shared_count *)(local_e18 + 8));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_598._M_dataplus._M_p != &local_598.field_2) {
        operator_delete(local_598._M_dataplus._M_p,local_598.field_2._M_allocated_capacity + 1);
      }
      p_Var7 = &script_provider.scripts._M_t._M_impl.super__Rb_tree_header;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_578._M_dataplus._M_p != &local_578.field_2) {
        operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
      }
      local_13e8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
      ;
      local_13e0 = "";
      local_13f8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_13f0 = &boost::unit_test::basic_cstring<char_const>::null;
      file_23.m_end = (iterator)0xde;
      file_23.m_begin = (iterator)&local_13e8;
      msg_23.m_end = pvVar59;
      msg_23.m_begin = pvVar58;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_13f8,
                 msg_23);
      pubkeys._M_t._M_impl._0_1_ =
           (**(code **)(*(long *)p_Var32->_M_p + 0x38))(p_Var32->_M_p,&keys_priv,&norm1,0);
      pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ = 0;
      pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = 0;
      script_provider.super_SigningProvider._vptr_SigningProvider =
           (_func_int **)anon_var_dwarf_9166c0;
      script_provider.scripts._M_t._M_impl._0_8_ = "";
      prv1._M_string_length = prv1._M_string_length & 0xffffffffffffff00;
      prv1._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01389048;
      prv1.field_2._8_8_ = &script_provider;
      prv1.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_1408 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
      ;
      local_1400 = "";
      pvVar58 = (iterator)0x1;
      pvVar59 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&pubkeys,(lazy_ostream *)&prv1,1,0,WARN,_cVar69,
                 (size_t)&local_1408,0xde);
      boost::detail::shared_count::~shared_count
                ((shared_count *)&pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
      local_1418 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
      ;
      local_1410 = "";
      local_1428 = &boost::unit_test::basic_cstring<char_const>::null;
      local_1420 = &boost::unit_test::basic_cstring<char_const>::null;
      file_24.m_end = (iterator)0xdf;
      file_24.m_begin = (iterator)&local_1418;
      msg_24.m_end = pvVar59;
      msg_24.m_begin = pvVar58;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_1428,
                 msg_24);
      local_5b8._M_dataplus._M_p = (pointer)&local_5b8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_5b8,norm1._M_dataplus._M_p,
                 norm1._M_dataplus._M_p + norm1._M_string_length);
      pcVar12 = (norm_pub->_M_dataplus)._M_p;
      local_5d8._M_dataplus._M_p = (pointer)&local_5d8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_5d8,pcVar12,pcVar12 + norm_pub->_M_string_length);
      rVar25.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)EqualDescriptor(&local_5b8,&local_5d8);
      local_e20[0] = rVar25.super_readonly_property<bool>.super_class_property<bool>.value;
      local_e18._0_8_ = (element_type *)0x0;
      local_e18._8_8_ = (sp_counted_base *)0x0;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &script_provider_cached,"pub->ToNormalizedString(): ",&norm1);
      pbVar34 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &script_provider_cached," Norm. desc: ");
      script_provider.super_SigningProvider._vptr_SigningProvider =
           (_func_int **)(pbVar34->_M_dataplus)._M_p;
      paVar42 = &pbVar34->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)script_provider.super_SigningProvider._vptr_SigningProvider == paVar42) {
        script_provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             paVar42->_M_allocated_capacity;
        script_provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             *(_Base_ptr *)((long)&pbVar34->field_2 + 8);
        script_provider.super_SigningProvider._vptr_SigningProvider = (_func_int **)p_Var7;
      }
      else {
        script_provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             paVar42->_M_allocated_capacity;
      }
      script_provider.scripts._M_t._M_impl._0_8_ = pbVar34->_M_string_length;
      (pbVar34->_M_dataplus)._M_p = (pointer)paVar42;
      pbVar34->_M_string_length = 0;
      (pbVar34->field_2)._M_local_buf[0] = '\0';
      pbVar34 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &script_provider,(norm_pub->_M_dataplus)._M_p,norm_pub->_M_string_length);
      pp_Var6 = &pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      pubkeys._M_t._M_impl._0_1_ = SUB81(pp_Var6,0);
      pubkeys._M_t._M_impl._1_7_ = SUB87((ulong)pp_Var6 >> 8,0);
      pcVar12 = (pbVar34->_M_dataplus)._M_p;
      paVar42 = &pbVar34->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar12 == paVar42) {
        pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             *(_Base_ptr *)((long)&pbVar34->field_2 + 8);
        pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ =
             (undefined4)paVar42->_M_allocated_capacity;
        pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ =
             (undefined4)(paVar42->_M_allocated_capacity >> 0x20);
      }
      else {
        pubkeys._M_t._M_impl._0_1_ = SUB81(pcVar12,0);
        pubkeys._M_t._M_impl._1_7_ = SUB87((ulong)pcVar12 >> 8,0);
        pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ =
             (undefined4)paVar42->_M_allocated_capacity;
        pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ =
             (undefined4)(paVar42->_M_allocated_capacity >> 0x20);
      }
      pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
           (_Rb_tree_color)pbVar34->_M_string_length;
      pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ =
           SUB84(pbVar34->_M_string_length >> 0x20,0);
      (pbVar34->_M_dataplus)._M_p = (pointer)paVar42;
      pbVar34->_M_string_length = 0;
      (pbVar34->field_2)._M_local_buf[0] = '\0';
      prv1._M_string_length = prv1._M_string_length & 0xffffffffffffff00;
      prv1._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01388e08;
      prv1.field_2._8_8_ = &pubkeys;
      prv1.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_1438 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
      ;
      local_1430 = "";
      pvVar58 = (iterator)0x1;
      pvVar59 = (iterator)0x1;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_e20,(lazy_ostream *)&prv1,1,1,WARN,_cVar69,
                 (size_t)&local_1438,0xdf);
      if ((_Base_ptr *)CONCAT71(pubkeys._M_t._M_impl._1_7_,pubkeys._M_t._M_impl._0_1_) !=
          &pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
        operator_delete((undefined1 *)
                        CONCAT71(pubkeys._M_t._M_impl._1_7_,pubkeys._M_t._M_impl._0_1_),
                        CONCAT44(pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent.
                                 _4_4_,pubkeys._M_t._M_impl.super__Rb_tree_header._M_header.
                                       _M_parent._0_4_) + 1);
      }
      if ((_Rb_tree_header *)script_provider.super_SigningProvider._vptr_SigningProvider != p_Var7)
      {
        operator_delete(script_provider.super_SigningProvider._vptr_SigningProvider,
                        script_provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ +
                        1);
      }
      if ((_Rb_tree_header *)script_provider_cached.super_SigningProvider._vptr_SigningProvider !=
          p_Var57) {
        operator_delete(script_provider_cached.super_SigningProvider._vptr_SigningProvider,
                        script_provider_cached.scripts._M_t._M_impl.super__Rb_tree_header._M_header.
                        _0_8_ + 1);
      }
      boost::detail::shared_count::~shared_count((shared_count *)(local_e18 + 8));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
        operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
      }
      local_1448 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
      ;
      local_1440 = "";
      local_1458 = &boost::unit_test::basic_cstring<char_const>::null;
      local_1450 = &boost::unit_test::basic_cstring<char_const>::null;
      file_25.m_end = (iterator)0xe2;
      file_25.m_begin = (iterator)&local_1448;
      msg_25.m_end = pvVar59;
      msg_25.m_begin = pvVar58;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_1458,
                 msg_25);
      script_provider.scripts._M_t._M_impl._0_8_ = script_provider.scripts._M_t._M_impl._1_8_ << 8;
      script_provider.super_SigningProvider._vptr_SigningProvider =
           (_func_int **)&PTR__lazy_ostream_01388f08;
      script_provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           boost::unit_test::lazy_ostream::inst;
      script_provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0xf4aea1;
      cVar24 = (**(code **)(*(long *)p_Var32->_M_p + 0x10))();
      local_f18 = (undefined1  [8])&creator;
      creator.super_BaseSignatureCreator._vptr_BaseSignatureCreator._0_1_ = cVar24;
      desc_cache.m_derived_xpubs._M_h._M_buckets = (__buckets_ptr)&local_1630;
      cVar50 = (char)(flags & 1U);
      script_provider_cached.super_SigningProvider._vptr_SigningProvider._0_1_ = cVar24 == cVar50;
      script_provider_cached.scripts._M_t._M_impl._0_16_ = (undefined1  [16])0x0;
      local_e20 = (undefined1  [8])0xe5e161;
      local_e18._0_8_ = "";
      prv1._M_string_length = prv1._M_string_length & 0xffffffffffffff00;
      prv1._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01389268;
      prv1.field_2._8_8_ = local_f18;
      prv1.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
           pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color & 0xffffff00;
      pubkeys._M_t._M_impl._0_1_ = 0x68;
      pubkeys._M_t._M_impl._1_7_ = 0x13892;
      pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ = 0x139d138;
      pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = 0;
      pvVar58 = (iterator)0x1;
      pvVar59 = (iterator)0x2;
      pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&desc_cache;
      local_1630._M_buckets._0_1_ = cVar50;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&script_provider_cached,(lazy_ostream *)&script_provider,1,2,
                 REQUIRE,0xe7275b,(size_t)local_e20,0xe2,&prv1,"(flags & RANGE) != 0",&pubkeys);
      boost::detail::shared_count::~shared_count
                ((shared_count *)&script_provider_cached.scripts._M_t._M_impl.super__Rb_tree_header)
      ;
      local_1468 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
      ;
      local_1460 = "";
      local_1478 = &boost::unit_test::basic_cstring<char_const>::null;
      local_1470 = &boost::unit_test::basic_cstring<char_const>::null;
      file_26.m_end = (iterator)0xe3;
      file_26.m_begin = (iterator)&local_1468;
      msg_26.m_end = pvVar59;
      msg_26.m_begin = pvVar58;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,(size_t)&local_1478,
                 msg_26);
      script_provider.scripts._M_t._M_impl._0_8_ = script_provider.scripts._M_t._M_impl._1_8_ << 8;
      script_provider.super_SigningProvider._vptr_SigningProvider =
           (_func_int **)&PTR__lazy_ostream_01388f08;
      script_provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           boost::unit_test::lazy_ostream::inst;
      script_provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0xf4aea1;
      cVar24 = (**(code **)(*(long *)p_Var1->_M_p + 0x10))();
      creator.super_BaseSignatureCreator._vptr_BaseSignatureCreator._0_1_ = cVar24;
      local_1630._M_buckets = (__buckets_ptr)CONCAT71(local_1630._M_buckets._1_7_,cVar50);
      script_provider_cached.super_SigningProvider._vptr_SigningProvider._0_1_ = cVar24 == cVar50;
      script_provider_cached.scripts._M_t._M_impl._0_16_ = (undefined1  [16])0x0;
      local_e20 = (undefined1  [8])0xe5e161;
      local_e18._0_8_ = (element_type *)0xe5e1ca;
      local_f18 = (undefined1  [8])&creator;
      prv1._M_string_length = prv1._M_string_length & 0xffffffffffffff00;
      prv1._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01389268;
      prv1.field_2._8_8_ = local_f18;
      prv1.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      desc_cache.m_derived_xpubs._M_h._M_buckets = (__buckets_ptr)&local_1630;
      pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
           pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color & 0xffffff00;
      pubkeys._M_t._M_impl._0_1_ = 0x68;
      pubkeys._M_t._M_impl._1_7_ = 0x13892;
      pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ = 0x139d138;
      pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = 0;
      pcVar68 = "parse_priv->IsRange()";
      pFVar56 = (FlatSigningProvider *)0x1;
      pvVar58 = (iterator)0x2;
      pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&desc_cache;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&script_provider_cached,(lazy_ostream *)&script_provider,1,2,
                 REQUIRE,0xe72785,(size_t)local_e20,0xe3,&prv1,"(flags & RANGE) != 0",&pubkeys);
      boost::detail::shared_count::~shared_count
                ((shared_count *)&script_provider_cached.scripts._M_t._M_impl.super__Rb_tree_header)
      ;
      pvVar46 = (scripts->
                super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pvVar13 = (scripts->
                super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      lVar35 = (long)pvVar13 - (long)pvVar46;
      if ((flags & 1U) == 0) {
        local_1cd8 = 3;
        if (lVar35 != 0x18) {
          __assert_fail("scripts.size() == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
                        ,0xec,
                        "void (anonymous namespace)::DoCheck(std::string, std::string, const std::string &, int, const std::vector<std::vector<std::string>> &, const std::optional<OutputType> &, std::optional<uint256>, const std::set<std::vector<uint32_t>> &, bool, bool, uint32_t, uint32_t, std::map<std::vector<uint8_t>, std::vector<uint8_t>>, std::optional<std::string>, std::optional<std::string>, int)"
                       );
        }
LAB_003b51ae:
        pFVar45 = &keys_priv;
        if ((flags & 2U) == 0) {
          pFVar45 = &keys_pub;
        }
        p_Var57 = &script_provider.keys._M_t._M_impl.super__Rb_tree_header;
        p_Var7 = &script_provider.tr_trees._M_t._M_impl.super__Rb_tree_header;
        pFVar56 = &script_provider_cached;
        p_Var2 = &script_provider_cached.keys._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = &script_provider_cached.tr_trees._M_t._M_impl.super__Rb_tree_header;
        p_Var4 = &local_c90._M_impl.super__Rb_tree_header;
        p_Var5 = (_Base_ptr)(local_c60 + 8);
        p_Var43 = &local_900._M_impl.super__Rb_tree_header;
        p_Var55 = &local_8d0._M_impl.super__Rb_tree_header;
        bVar64 = (flags & 4U) == 0;
        pvVar58 = local_e20;
        lVar35 = 0;
        do {
          lVar48 = 0;
          if ((flags & 1U) != 0) {
            lVar48 = lVar35;
          }
          pvVar46 = (scripts->
                    super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + lVar48;
          _nChild = (uint)lVar35;
          bVar27 = true;
          do {
            bVar20 = bVar27;
            script_provider.super_SigningProvider._vptr_SigningProvider =
                 (_func_int **)&PTR__FlatSigningProvider_01399da8;
            script_provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            script_provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (_Base_ptr)0x0;
            script_provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &script_provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header;
            script_provider.scripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            script_provider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            script_provider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (_Base_ptr)0x0;
            script_provider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &script_provider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
            script_provider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            script_provider.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            script_provider.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (_Base_ptr)0x0;
            script_provider.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &script_provider.origins._M_t._M_impl.super__Rb_tree_header._M_header;
            script_provider.origins._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            script_provider.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            script_provider.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (_Base_ptr)0x0;
            script_provider.keys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            script_provider.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            script_provider.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (_Base_ptr)0x0;
            script_provider.tr_trees._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            script_provider_cached.super_SigningProvider._vptr_SigningProvider =
                 (_func_int **)&PTR__FlatSigningProvider_01399da8;
            script_provider_cached.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                 _S_red;
            script_provider_cached.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (_Base_ptr)0x0;
            script_provider_cached.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &script_provider_cached.scripts._M_t._M_impl.super__Rb_tree_header._M_header;
            script_provider_cached.scripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            script_provider_cached.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                 _S_red;
            script_provider_cached.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (_Base_ptr)0x0;
            script_provider_cached.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &script_provider_cached.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
            script_provider_cached.pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            script_provider_cached.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                 _S_red;
            script_provider_cached.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (_Base_ptr)0x0;
            script_provider_cached.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &script_provider_cached.origins._M_t._M_impl.super__Rb_tree_header._M_header;
            script_provider_cached.origins._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            script_provider_cached.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                 _S_red;
            script_provider_cached.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (_Base_ptr)0x0;
            script_provider_cached.keys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            script_provider_cached.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                 _S_red;
            script_provider_cached.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (_Base_ptr)0x0;
            script_provider_cached.tr_trees._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            spks.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            spks.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            spks.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            spks_cached.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            spks_cached.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            spks_cached.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            desc_cache.m_derived_xpubs._M_h._M_buckets =
                 &desc_cache.m_derived_xpubs._M_h._M_single_bucket;
            desc_cache.m_derived_xpubs._M_h._M_bucket_count = 1;
            desc_cache.m_derived_xpubs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
            desc_cache.m_derived_xpubs._M_h._M_element_count = 0;
            desc_cache.m_derived_xpubs._M_h._M_rehash_policy._M_max_load_factor = 1.0;
            desc_cache.m_derived_xpubs._M_h._M_rehash_policy._M_next_resize = 0;
            desc_cache.m_derived_xpubs._M_h._M_single_bucket = (__node_base_ptr)0x0;
            desc_cache.m_parent_xpubs._M_h._M_buckets =
                 &desc_cache.m_parent_xpubs._M_h._M_single_bucket;
            desc_cache.m_parent_xpubs._M_h._M_bucket_count = 1;
            desc_cache.m_parent_xpubs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
            desc_cache.m_parent_xpubs._M_h._M_element_count = 0;
            desc_cache.m_parent_xpubs._M_h._M_rehash_policy._M_max_load_factor = 1.0;
            desc_cache.m_parent_xpubs._M_h._M_rehash_policy._M_next_resize = 0;
            desc_cache.m_parent_xpubs._M_h._M_single_bucket = (__node_base_ptr)0x0;
            desc_cache.m_last_hardened_xpubs._M_h._M_bucket_count = 1;
            desc_cache.m_last_hardened_xpubs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
            desc_cache.m_last_hardened_xpubs._M_h._M_element_count = 0;
            desc_cache.m_last_hardened_xpubs._M_h._M_rehash_policy._M_max_load_factor = 1.0;
            desc_cache.m_last_hardened_xpubs._M_h._M_rehash_policy._M_next_resize = 0;
            desc_cache.m_last_hardened_xpubs._M_h._M_single_bucket = (__node_base_ptr)0x0;
            local_14c8 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
            ;
            local_14c0 = "";
            local_14d8 = &boost::unit_test::basic_cstring<char_const>::null;
            local_14d0 = &boost::unit_test::basic_cstring<char_const>::null;
            file_27.m_end = (iterator)0xfc;
            file_27.m_begin = (iterator)&local_14c8;
            msg_27.m_end = pvVar58;
            msg_27.m_begin = (iterator)pFVar56;
            desc_cache.m_last_hardened_xpubs._M_h._M_buckets =
                 &desc_cache.m_last_hardened_xpubs._M_h._M_single_bucket;
            script_provider_cached.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 script_provider_cached.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left
            ;
            script_provider_cached.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 script_provider_cached.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left
            ;
            script_provider_cached.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 script_provider_cached.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_left
            ;
            script_provider_cached.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &p_Var2->_M_header;
            script_provider_cached.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 &p_Var2->_M_header;
            script_provider_cached.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &p_Var3->_M_header;
            script_provider_cached.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 &p_Var3->_M_header;
            script_provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 script_provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            script_provider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 script_provider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            script_provider.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 script_provider.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            script_provider.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &p_Var57->_M_header;
            script_provider.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 &p_Var57->_M_header;
            script_provider.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &p_Var7->_M_header;
            script_provider.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 &p_Var7->_M_header;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,
                       (size_t)&local_14d8,msg_27);
            p_Var36 = p_Var1;
            if (bVar20) {
              p_Var36 = p_Var32;
            }
            pubkeys._M_t._M_impl._0_1_ =
                 (**(code **)(*(long *)p_Var36->_M_p + 0x40))
                           (p_Var36->_M_p,lVar35,pFVar45,&spks,&script_provider);
            pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
            pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ = 0;
            pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = 0;
            local_e20 = (undefined1  [8])0xe72919;
            local_e18._0_8_ = (element_type *)0xe72972;
            prv1._M_string_length = prv1._M_string_length & 0xffffffffffffff00;
            prv1._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01389048;
            prv1.field_2._8_8_ = local_e20;
            prv1.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
            local_14e8 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
            ;
            local_14e0 = "";
            pvVar58 = (iterator)0x1;
            pvVar59 = (iterator)0x0;
            boost::test_tools::tt_detail::report_assertion
                      ((assertion_result *)&pubkeys,(lazy_ostream *)&prv1,1,0,WARN,
                       (check_type)pcVar68,(size_t)&local_14e8,0xfc);
            boost::detail::shared_count::~shared_count
                      ((shared_count *)
                       &pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
            local_14f8 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
            ;
            local_14f0 = "";
            local_1508 = &boost::unit_test::basic_cstring<char_const>::null;
            local_1500 = &boost::unit_test::basic_cstring<char_const>::null;
            file_28.m_end = (iterator)0xff;
            file_28.m_begin = (iterator)&local_14f8;
            msg_28.m_end = pvVar59;
            msg_28.m_begin = pvVar58;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_28,
                       (size_t)&local_1508,msg_28);
            local_e18._0_8_ = local_e18._1_8_ << 8;
            local_e20 = (undefined1  [8])&PTR__lazy_ostream_01388f08;
            local_e18._8_8_ = boost::unit_test::lazy_ostream::inst;
            local_e18._16_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
            pCVar37 = (pointer)((long)spks.super__Vector_base<CScript,_std::allocator<CScript>_>.
                                      _M_impl.super__Vector_impl_data._M_finish -
                                (long)spks.super__Vector_base<CScript,_std::allocator<CScript>_>.
                                      _M_impl.super__Vector_impl_data._M_start >> 5);
            spks1.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
            super__Vector_impl_data._M_start = pCVar37;
            pCVar44 = (pointer)((long)*(pointer *)
                                       ((long)&(pvVar46->
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               )._M_impl.super__Vector_impl_data + 8) -
                                *(long *)&(pvVar46->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data >> 5);
            spk1_from_cache.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
            super__Vector_impl_data._M_start = pCVar44;
            local_f18[0] = (class_property<bool>)(class_property<bool>)(pCVar37 == pCVar44);
            local_f10 = (undefined1  [8])0x0;
            auStack_f08._0_8_ = (sp_counted_base *)0x0;
            creator.super_BaseSignatureCreator._vptr_BaseSignatureCreator =
                 (_func_int **)anon_var_dwarf_91291e;
            creator.m_txto = (CMutableTransaction *)0xe5e1ca;
            local_1630._M_buckets = (__buckets_ptr)&spks1;
            prv1._M_string_length = prv1._M_string_length & 0xffffffffffffff00;
            prv1._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01388f48;
            prv1.field_2._8_8_ = &local_1630;
            prv1.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
            local_1668._M_buckets = (__buckets_ptr)&spk1_from_cache;
            pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                 pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color & 0xffffff00;
            pubkeys._M_t._M_impl._0_1_ = 0x48;
            pubkeys._M_t._M_impl._1_7_ = 0x1388f;
            pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ = 0x139d138;
            pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = 0;
            pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&local_1668;
            pcVar68 = "spks.size()";
            pvVar58 = (iterator)0x1;
            pvVar59 = (iterator)0x2;
            boost::test_tools::tt_detail::report_assertion
                      ((assertion_result *)local_f18,(lazy_ostream *)local_e20,1,2,REQUIRE,0xe72973,
                       (size_t)&creator,0xff,&prv1,"ref.size()",&pubkeys);
            boost::detail::shared_count::~shared_count((shared_count *)(local_f10 + 8));
            local_1518 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
            ;
            local_1510 = "";
            local_1528 = &boost::unit_test::basic_cstring<char_const>::null;
            local_1520 = &boost::unit_test::basic_cstring<char_const>::null;
            file_29.m_end = (iterator)0x102;
            file_29.m_begin = (iterator)&local_1518;
            msg_29.m_end = pvVar59;
            msg_29.m_begin = pvVar58;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_29,
                       (size_t)&local_1528,msg_29);
            pubkeys._M_t._M_impl._0_1_ =
                 (**(code **)(*(long *)p_Var32->_M_p + 0x48))
                           (p_Var32->_M_p,lVar35,&desc_cache,&spks_cached,&script_provider_cached);
            pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
            pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ = 0;
            pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = 0;
            local_e20 = (undefined1  [8])0xe7298a;
            local_e18._0_8_ = "";
            prv1._M_string_length = prv1._M_string_length & 0xffffffffffffff00;
            prv1._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01389048;
            prv1.field_2._8_8_ = local_e20;
            prv1.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
            local_1538 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
            ;
            local_1530 = "";
            pvVar58 = (iterator)0x1;
            pvVar59 = (iterator)0x0;
            boost::test_tools::tt_detail::report_assertion
                      ((assertion_result *)&pubkeys,(lazy_ostream *)&prv1,1,0,WARN,
                       (check_type)pcVar68,(size_t)&local_1538,0x102);
            boost::detail::shared_count::~shared_count
                      ((shared_count *)
                       &pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
            local_1548 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
            ;
            local_1540 = "";
            local_1558 = &boost::unit_test::basic_cstring<char_const>::null;
            local_1550 = &boost::unit_test::basic_cstring<char_const>::null;
            file_30.m_end = (iterator)0x103;
            file_30.m_begin = (iterator)&local_1548;
            msg_30.m_end = pvVar59;
            msg_30.m_begin = pvVar58;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_30,
                       (size_t)&local_1558,msg_30);
            pCVar37 = spks.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            if ((long)spks.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)spks.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                      super__Vector_impl_data._M_start ==
                (long)spks_cached.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)spks_cached.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                      super__Vector_impl_data._M_start) {
              uVar26 = 1;
              ppVar51 = &(spks_cached.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                          super__Vector_impl_data._M_start)->super_CScriptBase;
              for (ppVar61 = &(spks.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                               super__Vector_impl_data._M_start)->super_CScriptBase;
                  ppVar61 != &pCVar37->super_CScriptBase; ppVar61 = ppVar61 + 1) {
                bVar27 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator==
                                   (ppVar61,ppVar51);
                if (!bVar27) goto LAB_003b5b1a;
                ppVar51 = ppVar51 + 1;
              }
            }
            else {
LAB_003b5b1a:
              uVar26 = 0;
            }
            pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
            pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ = 0;
            pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = 0;
            local_e20 = (undefined1  [8])0xe729d9;
            local_e18._0_8_ = (element_type *)0xe729ec;
            prv1._M_string_length = prv1._M_string_length & 0xffffffffffffff00;
            prv1._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01389048;
            prv1.field_2._8_8_ = local_e20;
            prv1.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
            local_1568 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
            ;
            local_1560 = "";
            pvVar58 = (iterator)0x1;
            pvVar59 = (iterator)0x0;
            pubkeys._M_t._M_impl._0_1_ = uVar26;
            boost::test_tools::tt_detail::report_assertion
                      ((assertion_result *)&pubkeys,(lazy_ostream *)&prv1,1,0,WARN,
                       (check_type)pcVar68,(size_t)&local_1568,0x103);
            boost::detail::shared_count::~shared_count
                      ((shared_count *)
                       &pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
            local_1578 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
            ;
            local_1570 = "";
            local_1588 = &boost::unit_test::basic_cstring<char_const>::null;
            local_1580 = &boost::unit_test::basic_cstring<char_const>::null;
            file_31.m_end = (iterator)0x104;
            file_31.m_begin = (iterator)&local_1578;
            msg_31.m_end = pvVar59;
            msg_31.m_begin = pvVar58;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_31,
                       (size_t)&local_1588,msg_31);
            GetKeyData((set<CPubKey,_std::less<CPubKey>,_std::allocator<CPubKey>_> *)&prv1,
                       &script_provider,flags);
            GetKeyData(&pubkeys,&script_provider_cached,flags);
            if (auStack_d00._0_8_ == pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count) {
              bVar27 = std::__equal<false>::
                       equal<std::_Rb_tree_const_iterator<CPubKey>,std::_Rb_tree_const_iterator<CPubKey>>
                                 ((_Rb_tree_const_iterator<CPubKey>)prv1.field_2._8_8_,
                                  (_Rb_tree_const_iterator<CPubKey>)&prv1._M_string_length,
                                  (_Rb_tree_const_iterator<CPubKey>)
                                  pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
            }
            else {
              bVar27 = false;
            }
            local_f18[0] = (class_property<bool>)(class_property<bool>)bVar27;
            local_f10 = (undefined1  [8])0x0;
            auStack_f08._0_8_ = (sp_counted_base *)0x0;
            creator.super_BaseSignatureCreator._vptr_BaseSignatureCreator =
                 (_func_int **)anon_var_dwarf_916799;
            creator.m_txto = (CMutableTransaction *)0xe72a3c;
            local_e18._0_8_ = local_e18._1_8_ << 8;
            local_e20 = (undefined1  [8])&PTR__lazy_ostream_01389048;
            local_e18._8_8_ = boost::unit_test::lazy_ostream::inst;
            local_e18._16_8_ = &creator;
            local_1598 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
            ;
            local_1590 = "";
            pvVar58 = (iterator)0x1;
            pvVar59 = (iterator)0x0;
            boost::test_tools::tt_detail::report_assertion
                      ((assertion_result *)local_f18,(lazy_ostream *)local_e20,1,0,WARN,
                       (check_type)pcVar68,(size_t)&local_1598,0x104);
            boost::detail::shared_count::~shared_count((shared_count *)(local_f10 + 8));
            std::
            _Rb_tree<CPubKey,_CPubKey,_std::_Identity<CPubKey>,_std::less<CPubKey>,_std::allocator<CPubKey>_>
            ::~_Rb_tree(&pubkeys._M_t);
            std::
            _Rb_tree<CPubKey,_CPubKey,_std::_Identity<CPubKey>,_std::less<CPubKey>,_std::allocator<CPubKey>_>
            ::~_Rb_tree((_Rb_tree<CPubKey,_CPubKey,_std::_Identity<CPubKey>,_std::less<CPubKey>,_std::allocator<CPubKey>_>
                         *)&prv1);
            local_15a8 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
            ;
            local_15a0 = "";
            local_15b8 = &boost::unit_test::basic_cstring<char_const>::null;
            local_15b0 = &boost::unit_test::basic_cstring<char_const>::null;
            file_32.m_end = (iterator)0x105;
            file_32.m_begin = (iterator)&local_15a8;
            msg_32.m_end = pvVar59;
            msg_32.m_begin = pvVar58;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_32,
                       (size_t)&local_15b8,msg_32);
            if (script_provider.scripts._M_t._M_impl.super__Rb_tree_header._M_node_count ==
                script_provider_cached.scripts._M_t._M_impl.super__Rb_tree_header._M_node_count) {
              pubkeys._M_t._M_impl._0_1_ =
                   std::__equal<false>::
                   equal<std::_Rb_tree_const_iterator<std::pair<CScriptID_const,CScript>>,std::_Rb_tree_const_iterator<std::pair<CScriptID_const,CScript>>>
                             ((_Rb_tree_const_iterator<std::pair<const_CScriptID,_CScript>_>)
                              script_provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header.
                              _M_left,(_Rb_tree_const_iterator<std::pair<const_CScriptID,_CScript>_>
                                      )&script_provider.scripts._M_t._M_impl.super__Rb_tree_header,
                              (_Rb_tree_const_iterator<std::pair<const_CScriptID,_CScript>_>)
                              script_provider_cached.scripts._M_t._M_impl.super__Rb_tree_header.
                              _M_header._M_left);
            }
            else {
              pubkeys._M_t._M_impl._0_1_ = false;
            }
            pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
            pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ = 0;
            pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = 0;
            local_e20 = (undefined1  [8])0xe72a3d;
            local_e18._0_8_ = (element_type *)0xe72a76;
            prv1._M_string_length = prv1._M_string_length & 0xffffffffffffff00;
            prv1._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01389048;
            prv1.field_2._8_8_ = local_e20;
            prv1.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
            local_15c8 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
            ;
            local_15c0 = "";
            pvVar58 = (iterator)0x1;
            pvVar59 = (iterator)0x0;
            boost::test_tools::tt_detail::report_assertion
                      ((assertion_result *)&pubkeys,(lazy_ostream *)&prv1,1,0,WARN,
                       (check_type)pcVar68,(size_t)&local_15c8,0x105);
            boost::detail::shared_count::~shared_count
                      ((shared_count *)
                       &pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
            local_15d8 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
            ;
            local_15d0 = "";
            local_15e8 = &boost::unit_test::basic_cstring<char_const>::null;
            local_15e0 = &boost::unit_test::basic_cstring<char_const>::null;
            file_33.m_end = (iterator)0x106;
            file_33.m_begin = (iterator)&local_15d8;
            msg_33.m_end = pvVar59;
            msg_33.m_begin = pvVar58;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_33,
                       (size_t)&local_15e8,msg_33);
            GetKeyOriginData((set<std::pair<CPubKey,_KeyOriginInfo>,_std::less<std::pair<CPubKey,_KeyOriginInfo>_>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>
                              *)&prv1,&script_provider,flags);
            GetKeyOriginData((set<std::pair<CPubKey,_KeyOriginInfo>,_std::less<std::pair<CPubKey,_KeyOriginInfo>_>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>
                              *)&pubkeys,&script_provider_cached,flags);
            if (auStack_d00._0_8_ == pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count) {
              bVar27 = std::__equal<false>::
                       equal<std::_Rb_tree_const_iterator<std::pair<CPubKey,KeyOriginInfo>>,std::_Rb_tree_const_iterator<std::pair<CPubKey,KeyOriginInfo>>>
                                 ((_Rb_tree_const_iterator<std::pair<CPubKey,_KeyOriginInfo>_>)
                                  prv1.field_2._8_8_,
                                  (_Rb_tree_const_iterator<std::pair<CPubKey,_KeyOriginInfo>_>)
                                  &prv1._M_string_length,
                                  (_Rb_tree_const_iterator<std::pair<CPubKey,_KeyOriginInfo>_>)
                                  pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
            }
            else {
              bVar27 = false;
            }
            local_f18[0] = (class_property<bool>)(class_property<bool>)bVar27;
            local_f10 = (undefined1  [8])0x0;
            auStack_f08._0_8_ = (sp_counted_base *)0x0;
            creator.super_BaseSignatureCreator._vptr_BaseSignatureCreator =
                 (_func_int **)anon_var_dwarf_9167b3;
            creator.m_txto = (CMutableTransaction *)0xe72ad2;
            local_e18._0_8_ = local_e18._1_8_ << 8;
            local_e20 = (undefined1  [8])&PTR__lazy_ostream_01389048;
            local_e18._8_8_ = boost::unit_test::lazy_ostream::inst;
            local_e18._16_8_ = &creator;
            local_15f8 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
            ;
            local_15f0 = "";
            pFVar56 = (FlatSigningProvider *)0x1;
            pvVar58 = (iterator)0x0;
            boost::test_tools::tt_detail::report_assertion
                      ((assertion_result *)local_f18,(lazy_ostream *)local_e20,1,0,WARN,
                       (check_type)pcVar68,(size_t)&local_15f8,0x106);
            boost::detail::shared_count::~shared_count((shared_count *)(local_f10 + 8));
            std::
            _Rb_tree<std::pair<CPubKey,_KeyOriginInfo>,_std::pair<CPubKey,_KeyOriginInfo>,_std::_Identity<std::pair<CPubKey,_KeyOriginInfo>_>,_std::less<std::pair<CPubKey,_KeyOriginInfo>_>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>
            ::~_Rb_tree((_Rb_tree<std::pair<CPubKey,_KeyOriginInfo>,_std::pair<CPubKey,_KeyOriginInfo>,_std::_Identity<std::pair<CPubKey,_KeyOriginInfo>_>,_std::less<std::pair<CPubKey,_KeyOriginInfo>_>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>
                         *)&pubkeys);
            std::
            _Rb_tree<std::pair<CPubKey,_KeyOriginInfo>,_std::pair<CPubKey,_KeyOriginInfo>,_std::_Identity<std::pair<CPubKey,_KeyOriginInfo>_>,_std::less<std::pair<CPubKey,_KeyOriginInfo>_>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>
            ::~_Rb_tree((_Rb_tree<std::pair<CPubKey,_KeyOriginInfo>,_std::pair<CPubKey,_KeyOriginInfo>,_std::_Identity<std::pair<CPubKey,_KeyOriginInfo>_>,_std::less<std::pair<CPubKey,_KeyOriginInfo>_>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>
                         *)&prv1);
            DescriptorCache::GetCachedDerivedExtPubKeys
                      ((unordered_map<unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>_>
                        *)&local_1630,&desc_cache);
            DescriptorCache::GetCachedParentExtPubKeys((ExtPubKeyMap *)&local_1668,&desc_cache);
            sVar38 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::find(&pub1,"xpub",0,4);
            if (sVar38 == 0xffffffffffffffff) {
              num_xpubs = 0;
              if ((flags & 0x11U) == 1) goto LAB_003b6383;
LAB_003b6975:
              if ((flags & 0x20U) == 0) {
                local_1820 = 
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
                ;
                local_1818 = "";
                local_1830 = &boost::unit_test::basic_cstring<char_const>::null;
                local_1828 = &boost::unit_test::basic_cstring<char_const>::null;
                file_40.m_end = (iterator)0x144;
                file_40.m_begin = (iterator)&local_1820;
                msg_40.m_end = pvVar58;
                msg_40.m_begin = (iterator)pFVar56;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_40,
                           (size_t)&local_1830,msg_40);
                pubkeys._M_t._M_impl._0_1_ = local_1630._M_element_count == 0;
                pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
                pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ = 0;
                pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = 0;
                local_e20 = (undefined1  [8])0xe72ad3;
                local_e18._0_8_ = "";
                prv1._M_string_length = prv1._M_string_length & 0xffffffffffffff00;
                prv1._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01389048;
                prv1.field_2._8_8_ = local_e20;
                prv1.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst
                ;
                local_1840 = 
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
                ;
                local_1838 = "";
                pvVar58 = (iterator)0x1;
                pvVar59 = (iterator)0x0;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)&pubkeys,(lazy_ostream *)&prv1,1,0,WARN,
                           (check_type)pcVar68,(size_t)&local_1840,0x144);
                boost::detail::shared_count::~shared_count
                          ((shared_count *)
                           &pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
                local_1850 = 
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
                ;
                local_1848 = "";
                local_1860 = &boost::unit_test::basic_cstring<char_const>::null;
                local_1858 = &boost::unit_test::basic_cstring<char_const>::null;
                file_41.m_end = (iterator)0x145;
                file_41.m_begin = (iterator)&local_1850;
                msg_41.m_end = pvVar59;
                msg_41.m_begin = pvVar58;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_41,
                           (size_t)&local_1860,msg_41);
                pubkeys._M_t._M_impl._0_1_ = local_1668._M_element_count == 0;
                pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
                pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ = 0;
                pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = 0;
                local_e20 = (undefined1  [8])0xe72b96;
                local_e18._0_8_ = (element_type *)0xe72baf;
                prv1._M_string_length = prv1._M_string_length & 0xffffffffffffff00;
                prv1._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01389048;
                prv1.field_2._8_8_ = local_e20;
                prv1.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst
                ;
                local_1870 = (_Base_ptr)0xe5e161;
                local_1868 = "";
                pFVar56 = (FlatSigningProvider *)0x1;
                pvVar58 = (iterator)0x0;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)&pubkeys,(lazy_ostream *)&prv1,1,0,WARN,
                           (check_type)pcVar68,(size_t)&local_1870,0x145);
                boost::detail::shared_count::~shared_count
                          ((shared_count *)
                           &pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
              }
            }
            else {
              lVar48 = 0;
              do {
                sVar38 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                                   (&pub1,"xpub",sVar38 + 1,4);
                lVar48 = lVar48 + -1;
              } while (sVar38 != 0xffffffffffffffff);
              num_xpubs = -lVar48;
              if ((flags & 0x11U) == 1) {
LAB_003b6383:
                local_1680 = 
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
                ;
                local_1678 = "";
                local_1690 = &boost::unit_test::basic_cstring<char_const>::null;
                local_1688 = &boost::unit_test::basic_cstring<char_const>::null;
                file_36.m_end = (iterator)0x10f;
                file_36.m_begin = (iterator)&local_1680;
                msg_36.m_end = pvVar58;
                msg_36.m_begin = (iterator)pFVar56;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_36,
                           (size_t)&local_1690,msg_36);
                pubkeys._M_t._M_impl._0_1_ = local_1630._M_element_count == 0;
                pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
                pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ = 0;
                pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = 0;
                local_e20 = (undefined1  [8])0xe72ad3;
                local_e18._0_8_ = "";
                prv1._M_string_length = prv1._M_string_length & 0xffffffffffffff00;
                prv1._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01389048;
                prv1.field_2._8_8_ = local_e20;
                prv1.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst
                ;
                local_16a0 = 
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
                ;
                local_1698 = "";
                pvVar58 = (iterator)0x1;
                pvVar59 = (iterator)0x0;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)&pubkeys,(lazy_ostream *)&prv1,1,0,WARN,
                           (check_type)pcVar68,(size_t)&local_16a0,0x10f);
                boost::detail::shared_count::~shared_count
                          ((shared_count *)
                           &pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
                local_16b0 = 
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
                ;
                local_16a8 = "";
                local_16c0 = &boost::unit_test::basic_cstring<char_const>::null;
                local_16b8 = &boost::unit_test::basic_cstring<char_const>::null;
                file_37.m_end = (iterator)0x110;
                file_37.m_begin = (iterator)&local_16b0;
                msg_37.m_end = pvVar59;
                msg_37.m_begin = pvVar58;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_37,
                           (size_t)&local_16c0,msg_37);
                pubkeys._M_t._M_impl._0_1_ = local_1668._M_element_count != 0;
                p_Var8 = &pubkeys._M_t._M_impl.super__Rb_tree_header;
                pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
                pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ = 0;
                pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = 0;
                local_e20 = (undefined1  [8])0xe72aea;
                local_e18._0_8_ = (element_type *)0xe72b06;
                prv1._M_string_length = prv1._M_string_length & 0xffffffffffffff00;
                prv1._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01389048;
                prv1.field_2._8_8_ = local_e20;
                prv1.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst
                ;
                local_16d0 = 
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
                ;
                local_16c8 = "";
                pvVar58 = (iterator)0x1;
                pvVar59 = (iterator)0x0;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)&pubkeys,(lazy_ostream *)&prv1,1,0,WARN,
                           (check_type)pcVar68,(size_t)&local_16d0,0x110);
                boost::detail::shared_count::~shared_count
                          ((shared_count *)
                           &pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
                pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ = 0;
                pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = 0;
                pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
                _Var63._M_nxt = local_1668._M_before_begin._M_nxt;
                pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var8->_M_header;
                pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var8->_M_header;
                for (; _Var63._M_nxt != (_Hash_node_base *)0x0;
                    _Var63._M_nxt = (_Var63._M_nxt)->_M_nxt) {
                  _local_d08 = (undefined1  [16])0x0;
                  prv1.field_2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                  )0x0;
                  auStack_d00[8] = 0xff;
                  local_16e0 = 
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
                  ;
                  local_16d8 = "";
                  local_16f0 = &boost::unit_test::basic_cstring<char_const>::null;
                  local_16e8 = &boost::unit_test::basic_cstring<char_const>::null;
                  file_38.m_end = (iterator)0x115;
                  file_38.m_begin = (iterator)&local_16e0;
                  msg_38.m_end = pvVar59;
                  msg_38.m_begin = pvVar58;
                  boost::unit_test::unit_test_log_t::set_checkpoint
                            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_38,
                             (size_t)&local_16f0,msg_38);
                  bVar27 = CExtPubKey::Derive((CExtPubKey *)((long)&_Var63._M_nxt[1]._M_nxt + 4),
                                              (CExtPubKey *)&prv1,_nChild);
                  local_f18[0] = (class_property<bool>)(class_property<bool>)bVar27;
                  local_f10 = (undefined1  [8])0x0;
                  auStack_f08._0_8_ = (sp_counted_base *)0x0;
                  creator.super_BaseSignatureCreator._vptr_BaseSignatureCreator =
                       (_func_int **)anon_var_dwarf_9167da;
                  creator.m_txto = (CMutableTransaction *)0xe72b1a;
                  local_e18._0_8_ = local_e18._1_8_ << 8;
                  local_e20 = (undefined1  [8])&PTR__lazy_ostream_01389048;
                  local_e18._8_8_ = boost::unit_test::lazy_ostream::inst;
                  local_e18._16_8_ = &creator;
                  local_1700 = 
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
                  ;
                  local_16f8 = "";
                  pvVar58 = (iterator)0x1;
                  pvVar59 = (iterator)0x0;
                  boost::test_tools::tt_detail::report_assertion
                            ((assertion_result *)local_f18,(lazy_ostream *)local_e20,1,0,WARN,
                             (check_type)pcVar68,(size_t)&local_1700,0x115);
                  boost::detail::shared_count::~shared_count((shared_count *)(local_f10 + 8));
                  std::
                  _Rb_tree<CPubKey,CPubKey,std::_Identity<CPubKey>,std::less<CPubKey>,std::allocator<CPubKey>>
                  ::_M_insert_unique<CPubKey_const&>
                            ((_Rb_tree<CPubKey,CPubKey,std::_Identity<CPubKey>,std::less<CPubKey>,std::allocator<CPubKey>>
                              *)&pubkeys,(CPubKey *)(auStack_d00 + 8));
                }
                count_pks = 0;
                p_Var40 = script_provider_cached.origins._M_t._M_impl.super__Rb_tree_header.
                          _M_header._M_left;
                if ((_Rb_tree_header *)
                    script_provider_cached.origins._M_t._M_impl.super__Rb_tree_header._M_header.
                    _M_left != &script_provider_cached.origins._M_t._M_impl.super__Rb_tree_header) {
                  do {
                    cVar39 = std::
                             _Rb_tree<CPubKey,_CPubKey,_std::_Identity<CPubKey>,_std::less<CPubKey>,_std::allocator<CPubKey>_>
                             ::find(&pubkeys._M_t,(key_type *)&p_Var40[1]._M_right);
                    count_pks = count_pks +
                                (uint)((_Rb_tree_header *)cVar39._M_node !=
                                      &pubkeys._M_t._M_impl.super__Rb_tree_header);
                    p_Var40 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var40);
                  } while ((_Rb_tree_header *)p_Var40 !=
                           &script_provider_cached.origins._M_t._M_impl.super__Rb_tree_header);
                }
                if ((flags & 0x20U) == 0) {
                  local_1730 = 
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
                  ;
                  local_1728 = "";
                  local_1740 = &boost::unit_test::basic_cstring<char_const>::null;
                  local_1738 = &boost::unit_test::basic_cstring<char_const>::null;
                  file_39.m_end = (iterator)0x120;
                  file_39.m_begin = (iterator)&local_1730;
                  msg_39.m_end = pvVar59;
                  msg_39.m_begin = pvVar58;
                  boost::unit_test::unit_test_log_t::set_checkpoint
                            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_39,
                             (size_t)&local_1740,msg_39);
                  local_f10 = (undefined1  [8])(local_f10._1_8_ << 8);
                  local_f18 = (undefined1  [8])&PTR__lazy_ostream_01388f08;
                  auStack_f08._0_8_ = boost::unit_test::lazy_ostream::inst;
                  auStack_f08._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
                  local_1960._0_8_ =
                       script_provider_cached.origins._M_t._M_impl.super__Rb_tree_header.
                       _M_node_count;
                  creator.super_BaseSignatureCreator._vptr_BaseSignatureCreator._0_1_ =
                       script_provider_cached.origins._M_t._M_impl.super__Rb_tree_header.
                       _M_node_count == (long)count_pks;
                  creator.m_txto = (CMutableTransaction *)0x0;
                  creator.nIn = 0;
                  creator.nHashType = 0;
                  spks1.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0xe5e1ca;
                  spks1.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                  super__Vector_impl_data._M_start =
                       (pointer)
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
                  ;
                  spk1_from_cache.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)local_1960;
                  prv1._M_string_length = prv1._M_string_length & 0xffffffffffffff00;
                  prv1._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01388f48;
                  prv1.field_2._8_8_ = &spk1_from_cache;
                  prv1.field_2._M_allocated_capacity =
                       (size_type)boost::unit_test::lazy_ostream::inst;
                  local_1950._0_8_ = &count_pks;
                  local_e18._0_8_ = local_e18._1_8_ << 8;
                  local_e20 = (undefined1  [8])&PTR__lazy_ostream_013890c8;
                  local_e18._8_8_ = boost::unit_test::lazy_ostream::inst;
                  local_e18._16_8_ = local_1950;
                  pcVar68 = "script_provider_cached.origins.size()";
                  pFVar56 = (FlatSigningProvider *)0x1;
                  pvVar58 = (iterator)0x2;
                  boost::test_tools::tt_detail::report_assertion
                            ((assertion_result *)&creator,(lazy_ostream *)local_f18,1,2,REQUIRE,
                             0xe72b70,(size_t)&spks1,0x120,&prv1,"count_pks",local_e20);
                }
                else {
                  local_1710 = 
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
                  ;
                  local_1708 = "";
                  local_1720 = &boost::unit_test::basic_cstring<char_const>::null;
                  local_1718 = &boost::unit_test::basic_cstring<char_const>::null;
                  file_42.m_end = (iterator)0x11e;
                  file_42.m_begin = (iterator)&local_1710;
                  msg_42.m_end = pvVar59;
                  msg_42.m_begin = pvVar58;
                  boost::unit_test::unit_test_log_t::set_checkpoint
                            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_42,
                             (size_t)&local_1720,msg_42);
                  local_f10 = (undefined1  [8])(local_f10._1_8_ << 8);
                  local_f18 = (undefined1  [8])&PTR__lazy_ostream_01388f08;
                  auStack_f08._0_8_ = boost::unit_test::lazy_ostream::inst;
                  auStack_f08._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
                  creator.super_BaseSignatureCreator._vptr_BaseSignatureCreator._0_1_ =
                       num_xpubs == (long)count_pks;
                  creator.m_txto = (CMutableTransaction *)0x0;
                  creator.nIn = 0;
                  creator.nHashType = 0;
                  spks1.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0xe5e1ca;
                  spks1.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                  super__Vector_impl_data._M_start =
                       (pointer)
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
                  ;
                  spk1_from_cache.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)&num_xpubs;
                  prv1._M_string_length = prv1._M_string_length & 0xffffffffffffff00;
                  prv1._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01388f48;
                  prv1.field_2._8_8_ = &spk1_from_cache;
                  prv1.field_2._M_allocated_capacity =
                       (size_type)boost::unit_test::lazy_ostream::inst;
                  local_1950._0_8_ = &count_pks;
                  local_e18._0_8_ = local_e18._1_8_ << 8;
                  local_e20 = (undefined1  [8])&PTR__lazy_ostream_013890c8;
                  local_e18._8_8_ = boost::unit_test::lazy_ostream::inst;
                  local_e18._16_8_ = local_1950;
                  pcVar68 = "num_xpubs";
                  pFVar56 = (FlatSigningProvider *)0x1;
                  pvVar58 = (iterator)0x2;
                  boost::test_tools::tt_detail::report_assertion
                            ((assertion_result *)&creator,(lazy_ostream *)local_f18,1,2,REQUIRE,
                             0xe72b59,(size_t)&spks1,0x11e,&prv1,"count_pks",local_e20);
                }
              }
              else {
                if (lVar48 == 0) goto LAB_003b6975;
                local_1750 = 
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
                ;
                local_1748 = "";
                local_1760 = &boost::unit_test::basic_cstring<char_const>::null;
                local_1758 = &boost::unit_test::basic_cstring<char_const>::null;
                file_34.m_end = (iterator)0x124;
                file_34.m_begin = (iterator)&local_1750;
                msg_34.m_end = pvVar58;
                msg_34.m_begin = (iterator)pFVar56;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_34,
                           (size_t)&local_1760,msg_34);
                pubkeys._M_t._M_impl._0_1_ =
                     local_1668._M_element_count + local_1630._M_element_count == num_xpubs;
                pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
                pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ = 0;
                pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = 0;
                local_e20 = (undefined1  [8])0xe72b25;
                local_e18._0_8_ = (element_type *)0xe72b62;
                prv1._M_string_length = prv1._M_string_length & 0xffffffffffffff00;
                prv1._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01389048;
                prv1.field_2._8_8_ = local_e20;
                prv1.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst
                ;
                local_1770 = 
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
                ;
                local_1768 = "";
                pvVar58 = (iterator)0x1;
                pvVar59 = (iterator)0x0;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)&pubkeys,(lazy_ostream *)&prv1,1,0,WARN,
                           (check_type)pcVar68,(size_t)&local_1770,0x124);
                boost::detail::shared_count::~shared_count
                          ((shared_count *)
                           &pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
                if ((flags & 0x20U) == 0) {
                  local_1780 = 
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
                  ;
                  local_1778 = "";
                  local_1790 = &boost::unit_test::basic_cstring<char_const>::null;
                  local_1788 = &boost::unit_test::basic_cstring<char_const>::null;
                  file_35.m_end = (iterator)0x126;
                  file_35.m_begin = (iterator)&local_1780;
                  msg_35.m_end = pvVar59;
                  msg_35.m_begin = pvVar58;
                  boost::unit_test::unit_test_log_t::set_checkpoint
                            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_35,
                             (size_t)&local_1790,msg_35);
                  pubkeys._M_t._M_impl._0_1_ =
                       num_xpubs ==
                       script_provider_cached.origins._M_t._M_impl.super__Rb_tree_header.
                       _M_node_count;
                  pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                  pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
                  pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ = 0;
                  pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = 0;
                  local_e20 = (undefined1  [8])0xe72b63;
                  local_e18._0_8_ = (element_type *)0xe72b95;
                  prv1._M_string_length = prv1._M_string_length & 0xffffffffffffff00;
                  prv1._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01389048;
                  prv1.field_2._8_8_ = local_e20;
                  prv1.field_2._M_allocated_capacity =
                       (size_type)boost::unit_test::lazy_ostream::inst;
                  local_17a0 = 
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
                  ;
                  local_1798 = "";
                  pvVar58 = (iterator)0x1;
                  pvVar59 = (iterator)0x0;
                  boost::test_tools::tt_detail::report_assertion
                            ((assertion_result *)&pubkeys,(lazy_ostream *)&prv1,1,0,WARN,
                             (check_type)pcVar68,(size_t)&local_17a0,0x126);
                  boost::detail::shared_count::~shared_count
                            ((shared_count *)
                             &pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
                }
                pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ = 0;
                pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = 0;
                pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                     &pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
                pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
                pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                     pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                for (_Var49._M_nxt = local_1630._M_before_begin._M_nxt;
                    _Var63._M_nxt = local_1668._M_before_begin._M_nxt,
                    _Var49._M_nxt != (_Hash_node_base *)0x0; _Var49._M_nxt = (_Var49._M_nxt)->_M_nxt
                    ) {
                  p_Var62 = _Var49._M_nxt + 4;
                  while (p_Var62 = p_Var62->_M_nxt, p_Var62 != (_Hash_node_base *)0x0) {
                    std::
                    _Rb_tree<CPubKey,CPubKey,std::_Identity<CPubKey>,std::less<CPubKey>,std::allocator<CPubKey>>
                    ::_M_insert_unique<CPubKey_const&>
                              ((_Rb_tree<CPubKey,CPubKey,std::_Identity<CPubKey>,std::less<CPubKey>,std::allocator<CPubKey>>
                                *)&pubkeys,(CPubKey *)((long)&p_Var62[7]._M_nxt + 4));
                  }
                }
                for (; _Var63._M_nxt != (_Hash_node_base *)0x0;
                    _Var63._M_nxt = (_Var63._M_nxt)->_M_nxt) {
                  std::
                  _Rb_tree<CPubKey,CPubKey,std::_Identity<CPubKey>,std::less<CPubKey>,std::allocator<CPubKey>>
                  ::_M_insert_unique<CPubKey_const&>
                            ((_Rb_tree<CPubKey,CPubKey,std::_Identity<CPubKey>,std::less<CPubKey>,std::allocator<CPubKey>>
                              *)&pubkeys,(CPubKey *)((long)&_Var63._M_nxt[7]._M_nxt + 4));
                  _local_d08 = (undefined1  [16])0x0;
                  prv1.field_2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                  )0x0;
                  auStack_d00[8] = 0xff;
                  local_17b0 = 
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
                  ;
                  local_17a8 = "";
                  local_17c0 = &boost::unit_test::basic_cstring<char_const>::null;
                  local_17b8 = &boost::unit_test::basic_cstring<char_const>::null;
                  file_43.m_end = (iterator)0x135;
                  file_43.m_begin = (iterator)&local_17b0;
                  msg_43.m_end = pvVar59;
                  msg_43.m_begin = pvVar58;
                  boost::unit_test::unit_test_log_t::set_checkpoint
                            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_43,
                             (size_t)&local_17c0,msg_43);
                  bVar27 = CExtPubKey::Derive((CExtPubKey *)((long)&_Var63._M_nxt[1]._M_nxt + 4),
                                              (CExtPubKey *)&prv1,_nChild);
                  local_f18[0] = (class_property<bool>)(class_property<bool>)bVar27;
                  local_f10 = (undefined1  [8])0x0;
                  auStack_f08._0_8_ = (sp_counted_base *)0x0;
                  creator.super_BaseSignatureCreator._vptr_BaseSignatureCreator =
                       (_func_int **)anon_var_dwarf_9167da;
                  creator.m_txto = (CMutableTransaction *)0xe72b1a;
                  local_e18._0_8_ = local_e18._1_8_ << 8;
                  local_e20 = (undefined1  [8])&PTR__lazy_ostream_01389048;
                  local_e18._8_8_ = boost::unit_test::lazy_ostream::inst;
                  local_e18._16_8_ = &creator;
                  local_17d0 = 
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
                  ;
                  local_17c8 = "";
                  pvVar58 = (iterator)0x1;
                  pvVar59 = (iterator)0x0;
                  boost::test_tools::tt_detail::report_assertion
                            ((assertion_result *)local_f18,(lazy_ostream *)local_e20,1,0,WARN,
                             (check_type)pcVar68,(size_t)&local_17d0,0x135);
                  boost::detail::shared_count::~shared_count((shared_count *)(local_f10 + 8));
                  std::
                  _Rb_tree<CPubKey,CPubKey,std::_Identity<CPubKey>,std::less<CPubKey>,std::allocator<CPubKey>>
                  ::_M_insert_unique<CPubKey_const&>
                            ((_Rb_tree<CPubKey,CPubKey,std::_Identity<CPubKey>,std::less<CPubKey>,std::allocator<CPubKey>>
                              *)&pubkeys,(CPubKey *)(auStack_d00 + 8));
                }
                count_pks = 0;
                p_Var40 = script_provider_cached.origins._M_t._M_impl.super__Rb_tree_header.
                          _M_header._M_left;
                if ((_Rb_tree_header *)
                    script_provider_cached.origins._M_t._M_impl.super__Rb_tree_header._M_header.
                    _M_left != &script_provider_cached.origins._M_t._M_impl.super__Rb_tree_header) {
                  do {
                    cVar39 = std::
                             _Rb_tree<CPubKey,_CPubKey,_std::_Identity<CPubKey>,_std::less<CPubKey>,_std::allocator<CPubKey>_>
                             ::find(&pubkeys._M_t,(key_type *)&p_Var40[1]._M_right);
                    count_pks = count_pks +
                                (uint)((_Rb_tree_header *)cVar39._M_node !=
                                      &pubkeys._M_t._M_impl.super__Rb_tree_header);
                    p_Var40 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var40);
                  } while ((_Rb_tree_header *)p_Var40 !=
                           &script_provider_cached.origins._M_t._M_impl.super__Rb_tree_header);
                }
                if ((flags & 0x20U) == 0) {
                  local_1800 = 
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
                  ;
                  local_17f8 = "";
                  local_1810 = &boost::unit_test::basic_cstring<char_const>::null;
                  local_1808 = &boost::unit_test::basic_cstring<char_const>::null;
                  file_44.m_end = (iterator)0x140;
                  file_44.m_begin = (iterator)&local_1800;
                  msg_44.m_end = pvVar59;
                  msg_44.m_begin = pvVar58;
                  boost::unit_test::unit_test_log_t::set_checkpoint
                            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_44,
                             (size_t)&local_1810,msg_44);
                  local_f10 = (undefined1  [8])(local_f10._1_8_ << 8);
                  local_f18 = (undefined1  [8])&PTR__lazy_ostream_01388f08;
                  auStack_f08._0_8_ = boost::unit_test::lazy_ostream::inst;
                  auStack_f08._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
                  local_1960._0_8_ =
                       script_provider_cached.origins._M_t._M_impl.super__Rb_tree_header.
                       _M_node_count;
                  creator.super_BaseSignatureCreator._vptr_BaseSignatureCreator._0_1_ =
                       script_provider_cached.origins._M_t._M_impl.super__Rb_tree_header.
                       _M_node_count == (long)count_pks;
                  creator.m_txto = (CMutableTransaction *)0x0;
                  creator.nIn = 0;
                  creator.nHashType = 0;
                  spks1.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0xe5e1ca;
                  spks1.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                  super__Vector_impl_data._M_start =
                       (pointer)
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
                  ;
                  spk1_from_cache.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)local_1960;
                  prv1._M_string_length = prv1._M_string_length & 0xffffffffffffff00;
                  prv1._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01388f48;
                  prv1.field_2._8_8_ = &spk1_from_cache;
                  prv1.field_2._M_allocated_capacity =
                       (size_type)boost::unit_test::lazy_ostream::inst;
                  local_1950._0_8_ = &count_pks;
                  local_e18._0_8_ = local_e18._1_8_ << 8;
                  local_e20 = (undefined1  [8])&PTR__lazy_ostream_013890c8;
                  local_e18._8_8_ = boost::unit_test::lazy_ostream::inst;
                  local_e18._16_8_ = local_1950;
                  pcVar68 = "script_provider_cached.origins.size()";
                  pFVar56 = (FlatSigningProvider *)0x1;
                  pvVar58 = (iterator)0x2;
                  boost::test_tools::tt_detail::report_assertion
                            ((assertion_result *)&creator,(lazy_ostream *)local_f18,1,2,REQUIRE,
                             0xe72b70,(size_t)&spks1,0x140,&prv1,"count_pks",local_e20);
                }
                else {
                  local_17e0 = 
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
                  ;
                  local_17d8 = "";
                  local_17f0 = &boost::unit_test::basic_cstring<char_const>::null;
                  local_17e8 = &boost::unit_test::basic_cstring<char_const>::null;
                  file_45.m_end = (iterator)0x13e;
                  file_45.m_begin = (iterator)&local_17e0;
                  msg_45.m_end = pvVar59;
                  msg_45.m_begin = pvVar58;
                  boost::unit_test::unit_test_log_t::set_checkpoint
                            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_45,
                             (size_t)&local_17f0,msg_45);
                  local_f10 = (undefined1  [8])(local_f10._1_8_ << 8);
                  local_f18 = (undefined1  [8])&PTR__lazy_ostream_01388f08;
                  auStack_f08._0_8_ = boost::unit_test::lazy_ostream::inst;
                  auStack_f08._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
                  creator.super_BaseSignatureCreator._vptr_BaseSignatureCreator._0_1_ =
                       num_xpubs == (long)count_pks;
                  creator.m_txto = (CMutableTransaction *)0x0;
                  creator.nIn = 0;
                  creator.nHashType = 0;
                  spks1.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0xe5e1ca;
                  spks1.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                  super__Vector_impl_data._M_start =
                       (pointer)
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
                  ;
                  spk1_from_cache.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)&num_xpubs;
                  prv1._M_string_length = prv1._M_string_length & 0xffffffffffffff00;
                  prv1._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01388f48;
                  prv1.field_2._8_8_ = &spk1_from_cache;
                  prv1.field_2._M_allocated_capacity =
                       (size_type)boost::unit_test::lazy_ostream::inst;
                  local_1950._0_8_ = &count_pks;
                  local_e18._0_8_ = local_e18._1_8_ << 8;
                  local_e20 = (undefined1  [8])&PTR__lazy_ostream_013890c8;
                  local_e18._8_8_ = boost::unit_test::lazy_ostream::inst;
                  local_e18._16_8_ = local_1950;
                  pcVar68 = "num_xpubs";
                  pFVar56 = (FlatSigningProvider *)0x1;
                  pvVar58 = (iterator)0x2;
                  boost::test_tools::tt_detail::report_assertion
                            ((assertion_result *)&creator,(lazy_ostream *)local_f18,1,2,REQUIRE,
                             0xe72b59,(size_t)&spks1,0x13e,&prv1,"count_pks",local_e20);
                }
              }
              boost::detail::shared_count::~shared_count((shared_count *)&creator.nIn);
              std::
              _Rb_tree<CPubKey,_CPubKey,_std::_Identity<CPubKey>,_std::less<CPubKey>,_std::allocator<CPubKey>_>
              ::~_Rb_tree(&pubkeys._M_t);
            }
            if ((flags & 0x10U) == 0) {
              prv1._M_dataplus._M_p = (pointer)&PTR__FlatSigningProvider_01399da8;
              prv1.field_2._M_allocated_capacity = prv1.field_2._4_8_ << 0x20;
              prv1.field_2._8_8_ = 0;
              auStack_d00._0_8_ = &prv1.field_2;
              local_d08 = (undefined1  [8])auStack_d00._0_8_;
              auStack_d00._8_8_ = 0;
              local_cf0._8_4_ = _S_red;
              local_cf0._16_8_ = (_Base_ptr)0x0;
              local_cf0._24_8_ = local_cf0 + 8;
              local_cc8 = 0;
              local_cc0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              local_cc0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              local_cc0._M_impl.super__Rb_tree_header._M_header._M_left =
                   &local_cc0._M_impl.super__Rb_tree_header._M_header;
              local_cc0._M_impl.super__Rb_tree_header._M_node_count = 0;
              local_c90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              local_c90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              local_c90._M_impl.super__Rb_tree_header._M_node_count = 0;
              local_c60._8_8_ = local_c60._8_8_ & 0xffffffff00000000;
              local_c50 = (_Base_ptr)0x0;
              local_c38._0_8_ = 0;
              pubkeys._M_t._M_impl._0_1_ = 0xa8;
              pubkeys._M_t._M_impl._1_7_ = 0x1399d;
              pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ = 0;
              pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
              pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   (_Base_ptr)&pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              local_960._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              local_960._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              local_960._M_impl.super__Rb_tree_header._M_header._M_left =
                   &local_960._M_impl.super__Rb_tree_header._M_header;
              local_960._M_impl.super__Rb_tree_header._M_node_count = 0;
              local_930._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              local_930._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              local_930._M_impl.super__Rb_tree_header._M_header._M_left =
                   &local_930._M_impl.super__Rb_tree_header._M_header;
              local_930._M_impl.super__Rb_tree_header._M_node_count = 0;
              local_900._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              local_900._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              local_900._M_impl.super__Rb_tree_header._M_node_count = 0;
              local_8d0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              local_8d0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              local_8d0._M_impl.super__Rb_tree_header._M_node_count = 0;
              spks1.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              spks1.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              spks1.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              spk1_from_cache.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              spk1_from_cache.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              spk1_from_cache.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_1898 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
              ;
              local_1890 = "";
              local_18a8 = &boost::unit_test::basic_cstring<char_const>::null;
              local_18a0 = &boost::unit_test::basic_cstring<char_const>::null;
              file_46.m_end = (iterator)0x14d;
              file_46.m_begin = (iterator)&local_1898;
              msg_46.m_end = pvVar58;
              msg_46.m_begin = (iterator)pFVar56;
              local_cf0._32_8_ = local_cf0._24_8_;
              local_cc0._M_impl.super__Rb_tree_header._M_header._M_right =
                   local_cc0._M_impl.super__Rb_tree_header._M_header._M_left;
              local_c90._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var4->_M_header;
              local_c90._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var4->_M_header;
              local_c48 = p_Var5;
              local_c40 = p_Var5;
              pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count =
                   (size_t)pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
              local_960._M_impl.super__Rb_tree_header._M_header._M_right =
                   local_960._M_impl.super__Rb_tree_header._M_header._M_left;
              local_930._M_impl.super__Rb_tree_header._M_header._M_right =
                   local_930._M_impl.super__Rb_tree_header._M_header._M_left;
              local_900._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var43->_M_header;
              local_900._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var43->_M_header;
              local_8d0._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var55->_M_header;
              local_8d0._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var55->_M_header;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_46,
                         (size_t)&local_18a8,msg_46);
              rVar28.super_class_property<bool>.value =
                   (class_property<bool>)
                   (**(code **)(*(long *)p_Var36->_M_p + 0x40))
                             (p_Var36->_M_p,_nChild + 1,pFVar45,&spks1,&prv1);
              local_f10 = (undefined1  [8])0x0;
              auStack_f08._0_8_ = (sp_counted_base *)0x0;
              creator.super_BaseSignatureCreator._vptr_BaseSignatureCreator =
                   (_func_int **)anon_var_dwarf_916843;
              creator.m_txto = (CMutableTransaction *)0xe72c0b;
              local_e18._0_8_ = local_e18._1_8_ << 8;
              local_e20 = (undefined1  [8])&PTR__lazy_ostream_01389048;
              local_e18._8_8_ = boost::unit_test::lazy_ostream::inst;
              local_e18._16_8_ = &creator;
              local_18b8 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
              ;
              local_18b0 = "";
              pvVar58 = (iterator)0x1;
              pvVar59 = (iterator)0x0;
              local_f18[0] = rVar28.super_class_property<bool>.value;
              boost::test_tools::tt_detail::report_assertion
                        ((assertion_result *)local_f18,(lazy_ostream *)local_e20,1,0,WARN,
                         (check_type)pcVar68,(size_t)&local_18b8,0x14d);
              boost::detail::shared_count::~shared_count((shared_count *)(local_f10 + 8));
              local_18c8 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
              ;
              local_18c0 = "";
              local_18d8 = &boost::unit_test::basic_cstring<char_const>::null;
              local_18d0 = &boost::unit_test::basic_cstring<char_const>::null;
              file_47.m_end = (iterator)0x150;
              file_47.m_begin = (iterator)&local_18c8;
              msg_47.m_end = pvVar59;
              msg_47.m_begin = pvVar58;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_47,
                         (size_t)&local_18d8,msg_47);
              local_f18[0] = (class_property<bool>)
                             (**(code **)(*(long *)p_Var32->_M_p + 0x48))
                                       (p_Var32->_M_p,_nChild + 1,&desc_cache,&spk1_from_cache,
                                        &pubkeys);
              local_f10 = (undefined1  [8])0x0;
              auStack_f08._0_8_ = (sp_counted_base *)0x0;
              creator.super_BaseSignatureCreator._vptr_BaseSignatureCreator =
                   (_func_int **)anon_var_dwarf_916850;
              creator.m_txto = (CMutableTransaction *)0xe72c63;
              local_e18._0_8_ = local_e18._1_8_ << 8;
              local_e20 = (undefined1  [8])&PTR__lazy_ostream_01389048;
              local_e18._8_8_ = boost::unit_test::lazy_ostream::inst;
              local_e18._16_8_ = &creator;
              local_18e8 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
              ;
              local_18e0 = "";
              pvVar58 = (iterator)0x1;
              pvVar59 = (iterator)0x0;
              boost::test_tools::tt_detail::report_assertion
                        ((assertion_result *)local_f18,(lazy_ostream *)local_e20,1,0,WARN,
                         (check_type)pcVar68,(size_t)&local_18e8,0x150);
              boost::detail::shared_count::~shared_count((shared_count *)(local_f10 + 8));
              local_18f8 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
              ;
              local_18f0 = "";
              local_1908 = (PrecomputedTransactionData *)
                           &boost::unit_test::basic_cstring<char_const>::null;
              local_1900 = &boost::unit_test::basic_cstring<char_const>::null;
              file_48.m_end = (iterator)0x151;
              file_48.m_begin = (iterator)&local_18f8;
              msg_48.m_end = pvVar59;
              msg_48.m_begin = pvVar58;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_48,
                         (size_t)&local_1908,msg_48);
              pCVar37 = spks1.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                        super__Vector_impl_data._M_finish;
              if ((long)spks1.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)spks1.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                        super__Vector_impl_data._M_start ==
                  (long)spk1_from_cache.super__Vector_base<CScript,_std::allocator<CScript>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)spk1_from_cache.super__Vector_base<CScript,_std::allocator<CScript>_>.
                        _M_impl.super__Vector_impl_data._M_start) {
                uVar26 = 1;
                ppVar51 = &(spk1_from_cache.super__Vector_base<CScript,_std::allocator<CScript>_>.
                            _M_impl.super__Vector_impl_data._M_start)->super_CScriptBase;
                for (ppVar61 = &(spks1.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl
                                 .super__Vector_impl_data._M_start)->super_CScriptBase;
                    ppVar61 != &pCVar37->super_CScriptBase; ppVar61 = ppVar61 + 1) {
                  bVar27 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator==
                                     (ppVar61,ppVar51);
                  if (!bVar27) goto LAB_003b77dd;
                  ppVar51 = ppVar51 + 1;
                }
              }
              else {
LAB_003b77dd:
                uVar26 = 0;
              }
              local_f18[0] = (class_property<bool>)(class_property<bool>)uVar26;
              local_f10 = (undefined1  [8])0x0;
              auStack_f08._0_8_ = (sp_counted_base *)0x0;
              creator.super_BaseSignatureCreator._vptr_BaseSignatureCreator =
                   (_func_int **)anon_var_dwarf_91686b;
              creator.m_txto = (CMutableTransaction *)0xe72c7c;
              local_e18._0_8_ = local_e18._1_8_ << 8;
              local_e20 = (undefined1  [8])&PTR__lazy_ostream_01389048;
              local_e18._8_8_ = boost::unit_test::lazy_ostream::inst;
              local_e18._16_8_ = &creator;
              local_1918 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
              ;
              local_1910 = (PrecomputedTransactionData *)0xe5e1ca;
              pvVar58 = (iterator)0x1;
              pvVar59 = (iterator)0x0;
              boost::test_tools::tt_detail::report_assertion
                        ((assertion_result *)local_f18,(lazy_ostream *)local_e20,1,0,WARN,
                         (check_type)pcVar68,(size_t)&local_1918,0x151);
              boost::detail::shared_count::~shared_count((shared_count *)(local_f10 + 8));
              local_1928 = (CMutableTransaction *)0xe5e161;
              local_1920 = "";
              local_1938 = (_Base_ptr)&boost::unit_test::basic_cstring<char_const>::null;
              local_1930._vptr_BaseSignatureChecker =
                   (_func_int **)&boost::unit_test::basic_cstring<char_const>::null;
              file_49.m_end = (iterator)0x152;
              file_49.m_begin = (iterator)&local_1928;
              msg_49.m_end = pvVar59;
              msg_49.m_begin = pvVar58;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_49,
                         (size_t)&local_1938,msg_49);
              GetKeyData((set<CPubKey,_std::less<CPubKey>,_std::allocator<CPubKey>_> *)local_e20,
                         (FlatSigningProvider *)&prv1,flags);
              GetKeyData((set<CPubKey,_std::less<CPubKey>,_std::allocator<CPubKey>_> *)local_f18,
                         (FlatSigningProvider *)&pubkeys,flags);
              if (local_df8 == (_Base_ptr)auStack_f08._24_8_) {
                bVar27 = std::__equal<false>::
                         equal<std::_Rb_tree_const_iterator<CPubKey>,std::_Rb_tree_const_iterator<CPubKey>>
                                   ((_Rb_tree_const_iterator<CPubKey>)local_e18._16_8_,
                                    (_Base_ptr)local_e18,
                                    (_Rb_tree_const_iterator<CPubKey>)auStack_f08._8_8_);
              }
              else {
                bVar27 = false;
              }
              local_1950[0] = bVar27;
              local_1950._8_8_ = (element_type *)0x0;
              local_1950._16_8_ = (sp_counted_base *)0x0;
              local_1960._0_8_ =
                   "GetKeyData(script_provider1, flags) == GetKeyData(script_provider_cached1, flags)"
              ;
              local_1960._8_8_ =
                   (long)
                   "GetKeyData(script_provider1, flags) == GetKeyData(script_provider_cached1, flags)"
                   + 0x51;
              creator.m_txto = (CMutableTransaction *)(creator._9_8_ << 8);
              creator.super_BaseSignatureCreator._vptr_BaseSignatureCreator =
                   (_func_int **)&PTR__lazy_ostream_01389048;
              creator._16_8_ = boost::unit_test::lazy_ostream::inst;
              creator.amount = (CAmount)local_1960;
              local_1970 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
              ;
              local_1968 = "";
              pvVar58 = (iterator)0x1;
              pvVar59 = (iterator)0x0;
              boost::test_tools::tt_detail::report_assertion
                        ((assertion_result *)local_1950,(lazy_ostream *)&creator,1,0,WARN,
                         (check_type)pcVar68,(size_t)&local_1970,0x152);
              boost::detail::shared_count::~shared_count((shared_count *)(local_1950 + 0x10));
              std::
              _Rb_tree<CPubKey,_CPubKey,_std::_Identity<CPubKey>,_std::less<CPubKey>,_std::allocator<CPubKey>_>
              ::~_Rb_tree((_Rb_tree<CPubKey,_CPubKey,_std::_Identity<CPubKey>,_std::less<CPubKey>,_std::allocator<CPubKey>_>
                           *)local_f18);
              std::
              _Rb_tree<CPubKey,_CPubKey,_std::_Identity<CPubKey>,_std::less<CPubKey>,_std::allocator<CPubKey>_>
              ::~_Rb_tree((_Rb_tree<CPubKey,_CPubKey,_std::_Identity<CPubKey>,_std::less<CPubKey>,_std::allocator<CPubKey>_>
                           *)local_e20);
              local_1980 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
              ;
              local_1978 = "";
              local_1990 = &boost::unit_test::basic_cstring<char_const>::null;
              local_1988 = &boost::unit_test::basic_cstring<char_const>::null;
              file_50.m_end = (iterator)0x153;
              file_50.m_begin = (iterator)&local_1980;
              msg_50.m_end = pvVar59;
              msg_50.m_begin = pvVar58;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_50,
                         (size_t)&local_1990,msg_50);
              if (auStack_d00._8_8_ == 0) {
                bVar27 = std::__equal<false>::
                         equal<std::_Rb_tree_const_iterator<std::pair<CScriptID_const,CScript>>,std::_Rb_tree_const_iterator<std::pair<CScriptID_const,CScript>>>
                                   ((_Rb_tree_const_iterator<std::pair<const_CScriptID,_CScript>_>)
                                    auStack_d00._0_8_,
                                    (_Rb_tree_const_iterator<std::pair<const_CScriptID,_CScript>_>)
                                    &prv1.field_2,
                                    (_Rb_tree_const_iterator<std::pair<const_CScriptID,_CScript>_>)
                                    pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right);
              }
              else {
                bVar27 = false;
              }
              local_f18[0] = (class_property<bool>)(class_property<bool>)bVar27;
              local_f10 = (undefined1  [8])0x0;
              auStack_f08._0_8_ = (sp_counted_base *)0x0;
              creator.super_BaseSignatureCreator._vptr_BaseSignatureCreator =
                   (_func_int **)anon_var_dwarf_916893;
              creator.m_txto = (CMutableTransaction *)0xe72d0a;
              local_e18._0_8_ = local_e18._1_8_ << 8;
              local_e20 = (undefined1  [8])&PTR__lazy_ostream_01389048;
              local_e18._8_8_ = boost::unit_test::lazy_ostream::inst;
              local_e18._16_8_ = &creator;
              local_19a0 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
              ;
              local_1998 = "";
              pvVar58 = (iterator)0x1;
              pvVar59 = (iterator)0x0;
              boost::test_tools::tt_detail::report_assertion
                        ((assertion_result *)local_f18,(lazy_ostream *)local_e20,1,0,WARN,
                         (check_type)pcVar68,(size_t)&local_19a0,0x153);
              boost::detail::shared_count::~shared_count((shared_count *)(local_f10 + 8));
              local_19b0 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
              ;
              local_19a8 = "";
              local_19c0 = &boost::unit_test::basic_cstring<char_const>::null;
              local_19b8 = &boost::unit_test::basic_cstring<char_const>::null;
              file_51.m_end = (iterator)0x154;
              file_51.m_begin = (iterator)&local_19b0;
              msg_51.m_end = pvVar59;
              msg_51.m_begin = pvVar58;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_51,
                         (size_t)&local_19c0,msg_51);
              GetKeyOriginData((set<std::pair<CPubKey,_KeyOriginInfo>,_std::less<std::pair<CPubKey,_KeyOriginInfo>_>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>
                                *)local_e20,(FlatSigningProvider *)&prv1,flags);
              GetKeyOriginData((set<std::pair<CPubKey,_KeyOriginInfo>,_std::less<std::pair<CPubKey,_KeyOriginInfo>_>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>
                                *)local_f18,(FlatSigningProvider *)&pubkeys,flags);
              if (local_df8 == (_Base_ptr)auStack_f08._24_8_) {
                bVar27 = std::__equal<false>::
                         equal<std::_Rb_tree_const_iterator<std::pair<CPubKey,KeyOriginInfo>>,std::_Rb_tree_const_iterator<std::pair<CPubKey,KeyOriginInfo>>>
                                   ((_Rb_tree_const_iterator<std::pair<CPubKey,_KeyOriginInfo>_>)
                                    local_e18._16_8_,(_Base_ptr)local_e18,
                                    (_Rb_tree_const_iterator<std::pair<CPubKey,_KeyOriginInfo>_>)
                                    auStack_f08._8_8_);
              }
              else {
                bVar27 = false;
              }
              local_1950[0] = bVar27;
              local_1950._8_8_ = (element_type *)0x0;
              local_1950._16_8_ = (sp_counted_base *)0x0;
              local_1960._0_8_ =
                   "GetKeyOriginData(script_provider1, flags) == GetKeyOriginData(script_provider_cached1, flags)"
              ;
              local_1960._8_8_ =
                   (long)
                   "GetKeyOriginData(script_provider1, flags) == GetKeyOriginData(script_provider_cached1, flags)"
                   + 0x5d;
              creator.m_txto = (CMutableTransaction *)(creator._9_8_ << 8);
              creator.super_BaseSignatureCreator._vptr_BaseSignatureCreator =
                   (_func_int **)&PTR__lazy_ostream_01389048;
              creator._16_8_ = boost::unit_test::lazy_ostream::inst;
              creator.amount = (CAmount)local_1960;
              local_19d0 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
              ;
              local_19c8 = "";
              pFVar56 = (FlatSigningProvider *)0x1;
              pvVar58 = (iterator)0x0;
              boost::test_tools::tt_detail::report_assertion
                        ((assertion_result *)local_1950,(lazy_ostream *)&creator,1,0,WARN,
                         (check_type)pcVar68,(size_t)&local_19d0,0x154);
              boost::detail::shared_count::~shared_count((shared_count *)(local_1950 + 0x10));
              std::
              _Rb_tree<std::pair<CPubKey,_KeyOriginInfo>,_std::pair<CPubKey,_KeyOriginInfo>,_std::_Identity<std::pair<CPubKey,_KeyOriginInfo>_>,_std::less<std::pair<CPubKey,_KeyOriginInfo>_>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>
              ::~_Rb_tree((_Rb_tree<std::pair<CPubKey,_KeyOriginInfo>,_std::pair<CPubKey,_KeyOriginInfo>,_std::_Identity<std::pair<CPubKey,_KeyOriginInfo>_>,_std::less<std::pair<CPubKey,_KeyOriginInfo>_>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>
                           *)local_f18);
              std::
              _Rb_tree<std::pair<CPubKey,_KeyOriginInfo>,_std::pair<CPubKey,_KeyOriginInfo>,_std::_Identity<std::pair<CPubKey,_KeyOriginInfo>_>,_std::less<std::pair<CPubKey,_KeyOriginInfo>_>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>
              ::~_Rb_tree((_Rb_tree<std::pair<CPubKey,_KeyOriginInfo>,_std::pair<CPubKey,_KeyOriginInfo>,_std::_Identity<std::pair<CPubKey,_KeyOriginInfo>_>,_std::less<std::pair<CPubKey,_KeyOriginInfo>_>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>
                           *)local_e20);
              std::vector<CScript,_std::allocator<CScript>_>::~vector(&spk1_from_cache);
              std::vector<CScript,_std::allocator<CScript>_>::~vector(&spks1);
              std::
              _Rb_tree<XOnlyPubKey,_std::pair<const_XOnlyPubKey,_TaprootBuilder>,_std::_Select1st<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>_>
              ::~_Rb_tree(&local_8d0);
              std::
              _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
              ::~_Rb_tree(&local_900);
              std::
              _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
              ::~_Rb_tree(&local_930);
              std::
              _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
              ::~_Rb_tree(&local_960);
              std::
              _Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
              ::~_Rb_tree((_Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
                           *)&pubkeys._M_t._M_impl.super__Rb_tree_header);
              std::
              _Rb_tree<XOnlyPubKey,_std::pair<const_XOnlyPubKey,_TaprootBuilder>,_std::_Select1st<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>_>
              ::~_Rb_tree((_Rb_tree<XOnlyPubKey,_std::pair<const_XOnlyPubKey,_TaprootBuilder>,_std::_Select1st<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>_>
                           *)local_c60);
              std::
              _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
              ::~_Rb_tree(&local_c90);
              std::
              _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
              ::~_Rb_tree(&local_cc0);
              std::
              _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
              ::~_Rb_tree((_Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
                           *)local_cf0);
              std::
              _Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
              ::~_Rb_tree((_Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
                           *)&prv1._M_string_length);
            }
            if (spks.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                spks.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                super__Vector_impl_data._M_start) {
              lVar48 = 0;
              uVar60 = 0;
              do {
                local_19e0 = 
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
                ;
                local_19d8 = "";
                local_19f0 = &boost::unit_test::basic_cstring<char_const>::null;
                local_19e8 = &boost::unit_test::basic_cstring<char_const>::null;
                file_52.m_end = (iterator)0x159;
                file_52.m_begin = (iterator)&local_19e0;
                msg_52.m_end = pvVar58;
                msg_52.m_begin = (iterator)pFVar56;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_52,
                           (size_t)&local_19f0,msg_52);
                local_e18._0_8_ = local_e18._1_8_ << 8;
                local_e20 = (undefined1  [8])&PTR__lazy_ostream_01388f08;
                local_e18._8_8_ = boost::unit_test::lazy_ostream::inst;
                local_e18._16_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
                uVar9 = *(uint *)((long)&((spks.
                                           super__Vector_base<CScript,_std::allocator<CScript>_>.
                                           _M_impl.super__Vector_impl_data._M_start)->
                                         super_CScriptBase)._size + lVar48);
                lVar52 = (long)&((spks.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl
                                  .super__Vector_impl_data._M_start)->super_CScriptBase)._union +
                         lVar48;
                if (0x1c < uVar9) {
                  lVar52 = *(long *)((long)&((spks.
                                              super__Vector_base<CScript,_std::allocator<CScript>_>.
                                              _M_impl.super__Vector_impl_data._M_start)->
                                            super_CScriptBase)._union + lVar48);
                }
                lVar14 = *(long *)&(pvVar46->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data;
                uVar15 = uVar9 - 0x1d;
                if (0x1c >= uVar9) {
                  uVar15 = uVar9;
                }
                s.m_size._0_4_ = uVar15;
                s.m_data = (uchar *)lVar52;
                s.m_size._4_4_ = 0;
                HexStr_abi_cxx11_((string *)local_f18,s);
                __n = *(element_type **)(lVar14 + 8 + lVar48);
                pCVar37 = (pointer)(lVar14 + lVar48);
                if ((undefined1  [8])__n == local_f10) {
                  if (__n == (element_type *)0x0) {
                    bVar27 = true;
                  }
                  else {
                    iVar29 = bcmp((pCVar37->super_CScriptBase)._union.indirect_contents.indirect,
                                  (void *)local_f18,(size_t)__n);
                    bVar27 = iVar29 == 0;
                  }
                }
                else {
                  bVar27 = false;
                }
                creator.super_BaseSignatureCreator._vptr_BaseSignatureCreator._0_1_ = bVar27;
                creator.m_txto = (CMutableTransaction *)0x0;
                creator.nIn = 0;
                creator.nHashType = 0;
                spks1.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0xe5e1ca;
                spks1.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                super__Vector_impl_data._M_start =
                     (pointer)
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
                ;
                spk1_from_cache.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                super__Vector_impl_data._M_start = pCVar37;
                prv1._M_string_length = prv1._M_string_length & 0xffffffffffffff00;
                prv1._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01388fc8;
                prv1.field_2._8_8_ = &spk1_from_cache;
                prv1.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst
                ;
                local_1950._0_8_ = local_f18;
                pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                     pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color & 0xffffff00;
                pubkeys._M_t._M_impl._0_1_ = 200;
                pubkeys._M_t._M_impl._1_7_ = 0x1388f;
                pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ = 0x139d138;
                pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = 0;
                pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_1950
                ;
                pcVar68 = "ref[n]";
                pvVar58 = (iterator)0x1;
                pvVar59 = (iterator)0x2;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)&creator,(lazy_ostream *)local_e20,1,2,REQUIRE,
                           0xe72d69,(size_t)&spks1,0x159,&prv1,"HexStr(spks[n])",&pubkeys);
                boost::detail::shared_count::~shared_count((shared_count *)&creator.nIn);
                if (local_f18 != (undefined1  [8])(local_f10 + 8)) {
                  operator_delete((void *)local_f18,auStack_f08._0_8_ + 1);
                }
                if ((flags & 0x108U) != 0) {
                  CMutableTransaction::CMutableTransaction((CMutableTransaction *)&spks1);
                  local_19f4 = spender_nlocktime;
                  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
                            ((vector<CTxIn,_std::allocator<CTxIn>_> *)&spks1,1);
                  spks1.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                  super__Vector_impl_data._M_start[2].super_CScriptBase._union.indirect_contents.
                  capacity = spender_nsequence;
                  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&local_1a10,1);
                  std::vector<CTxOut,_std::allocator<CTxOut>_>::vector
                            ((vector<CTxOut,_std::allocator<CTxOut>_> *)&spk1_from_cache,1,
                             (allocator_type *)&prv1);
                  this = (PrecomputedTransactionData *)&pubkeys;
                  memset(this,0,0x102);
                  local_890._0_9_ = SUB169((undefined1  [16])0x0,0);
                  local_890._M_finish._1_7_ = 0;
                  stack0xfffffffffffff780 = SUB169((undefined1  [16])0x0,7);
                  PrecomputedTransactionData::Init<CMutableTransaction>
                            (this,(CMutableTransaction *)&spks1,
                             (vector<CTxOut,_std::allocator<CTxOut>_> *)&spk1_from_cache,true);
                  prv1._M_dataplus._M_p = (pointer)0x0;
                  pvVar58 = (iterator)0x0;
                  MutableTransactionSignatureCreator::MutableTransactionSignatureCreator
                            (&creator,(CMutableTransaction *)&spks1,0,(CAmount *)&prv1,this,0);
                  prv1._M_dataplus._M_p = prv1._M_dataplus._M_p & 0xffffffffffff0000;
                  local_c60._0_4_ = _S_red;
                  local_c60._8_8_ = (_Base_ptr)0x0;
                  memset(&prv1._M_string_length,0,0xb8);
                  local_c40 = (_Base_ptr)0x0;
                  local_bd0 = false;
                  local_bc0._M_color = _S_red;
                  local_bc0._M_parent = (_Base_ptr)0x0;
                  local_bc0._M_left = &local_bc0;
                  local_ba0 = 0;
                  local_b90._M_color = _S_red;
                  local_b90._M_parent = (_Base_ptr)0x0;
                  local_b90._M_left = &local_b90;
                  local_b48._M_color = _S_red;
                  local_b48._M_parent = (_Base_ptr)0x0;
                  local_b70 = (undefined1  [16])0x0;
                  local_b60 = (undefined1  [16])0x0;
                  local_b48._M_left = &local_b48;
                  local_b28 = 0;
                  local_b18._M_color = _S_red;
                  local_b18._M_parent = (_Base_ptr)0x0;
                  local_b18._M_left = &local_b18;
                  local_af8 = 0;
                  local_ae8._M_color = _S_red;
                  local_ae8._M_parent = (_Base_ptr)0x0;
                  local_ae8._M_left = &local_ae8;
                  local_a58._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                  local_a58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                  local_ac8 = (undefined1  [16])0x0;
                  local_ab8 = (undefined1  [16])0x0;
                  local_aa8 = (undefined1  [16])0x0;
                  local_a98 = (undefined1  [16])0x0;
                  local_a88 = (undefined1  [16])0x0;
                  local_a78 = SUB1612((undefined1  [16])0x0,0);
                  auStack_a6c[0] = '\0';
                  auStack_a6c[1] = '\0';
                  auStack_a6c[2] = '\0';
                  auStack_a6c[3] = '\0';
                  auStack_a68 = SUB1612((undefined1  [16])0x0,4);
                  local_a58._M_impl.super__Rb_tree_header._M_header._M_left =
                       &local_a58._M_impl.super__Rb_tree_header._M_header;
                  local_a58._M_impl.super__Rb_tree_header._M_node_count = 0;
                  local_a28._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                  local_a28._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                  local_a28._M_impl.super__Rb_tree_header._M_header._M_left =
                       &local_a28._M_impl.super__Rb_tree_header._M_header;
                  local_a28._M_impl.super__Rb_tree_header._M_node_count = 0;
                  local_9f8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                  local_9f8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                  local_9f8._M_impl.super__Rb_tree_header._M_header._M_left =
                       &local_9f8._M_impl.super__Rb_tree_header._M_header;
                  local_9f8._M_impl.super__Rb_tree_header._M_node_count = 0;
                  local_9c8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                  local_9c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                  local_9c8._M_impl.super__Rb_tree_header._M_header._M_left =
                       &local_9c8._M_impl.super__Rb_tree_header._M_header;
                  local_9c8._M_impl.super__Rb_tree_header._M_node_count = 0;
                  local_c50 = (_Base_ptr)local_c60;
                  local_c48 = (_Base_ptr)local_c60;
                  local_bc0._M_right = local_bc0._M_left;
                  local_b90._M_right = local_b90._M_left;
                  local_b48._M_right = local_b48._M_left;
                  local_b18._M_right = local_b18._M_left;
                  local_ae8._M_right = local_ae8._M_left;
                  local_a58._M_impl.super__Rb_tree_header._M_header._M_right =
                       local_a58._M_impl.super__Rb_tree_header._M_header._M_left;
                  local_a28._M_impl.super__Rb_tree_header._M_header._M_right =
                       local_a28._M_impl.super__Rb_tree_header._M_header._M_left;
                  local_9f8._M_impl.super__Rb_tree_header._M_header._M_right =
                       local_9f8._M_impl.super__Rb_tree_header._M_header._M_left;
                  local_9c8._M_impl.super__Rb_tree_header._M_header._M_right =
                       local_9c8._M_impl.super__Rb_tree_header._M_header._M_left;
                  std::
                  _Rb_tree<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  ::operator=(&local_a58,&preimages->_M_t);
                  std::
                  _Rb_tree<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  ::operator=(&local_a28,&preimages->_M_t);
                  std::
                  _Rb_tree<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  ::operator=(&local_9f8,&preimages->_M_t);
                  std::
                  _Rb_tree<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  ::operator=(&local_9c8,&preimages->_M_t);
                  FlatSigningProvider::FlatSigningProvider
                            ((FlatSigningProvider *)local_e20,&keys_priv);
                  FlatSigningProvider::FlatSigningProvider
                            ((FlatSigningProvider *)local_f18,&script_provider);
                  pFVar56 = FlatSigningProvider::Merge
                                      ((FlatSigningProvider *)local_e20,
                                       (FlatSigningProvider *)local_f18);
                  bVar27 = ProduceSignature(&pFVar56->super_SigningProvider,
                                            &creator.super_BaseSignatureCreator,
                                            (CScript *)
                                            ((long)&((spks.
                                                  super__Vector_base<CScript,_std::allocator<CScript>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super_CScriptBase)._union + lVar48),
                                            (SignatureData *)&prv1);
                  std::
                  _Rb_tree<XOnlyPubKey,_std::pair<const_XOnlyPubKey,_TaprootBuilder>,_std::_Select1st<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>_>
                  ::~_Rb_tree(&local_e50);
                  std::
                  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
                  ::~_Rb_tree(&local_e80);
                  std::
                  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
                  ::~_Rb_tree(&local_eb0);
                  std::
                  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
                  ::~_Rb_tree((_Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
                               *)(auStack_f08 + 0x28));
                  std::
                  _Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
                  ::~_Rb_tree((_Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
                               *)local_f10);
                  std::
                  _Rb_tree<XOnlyPubKey,_std::pair<const_XOnlyPubKey,_TaprootBuilder>,_std::_Select1st<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>_>
                  ::~_Rb_tree(&local_d58);
                  std::
                  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
                  ::~_Rb_tree(&local_d88);
                  std::
                  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
                  ::~_Rb_tree(&local_db8);
                  std::
                  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
                  ::~_Rb_tree(&local_de8);
                  std::
                  _Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
                  ::~_Rb_tree((_Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
                               *)local_e18);
                  local_1a88 = 
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
                  ;
                  local_1a80 = "";
                  local_1a98 = &boost::unit_test::basic_cstring<char_const>::null;
                  local_1a90 = &boost::unit_test::basic_cstring<char_const>::null;
                  file_53.m_end = (iterator)0x16c;
                  file_53.m_begin = (iterator)&local_1a88;
                  msg_53.m_end = pvVar58;
                  msg_53.m_begin = (iterator)this;
                  boost::unit_test::unit_test_log_t::set_checkpoint
                            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_53,
                             (size_t)&local_1a98,msg_53);
                  local_f18[0] = (class_property<bool>)
                                 (class_property<bool>)((byte)((uint)flags >> 8) & 1 ^ bVar27);
                  local_f10 = (undefined1  [8])0x0;
                  auStack_f08._0_8_ = (sp_counted_base *)0x0;
                  local_e18._0_8_ = local_e18._1_8_ << 8;
                  local_e20 = (undefined1  [8])&PTR__lazy_ostream_01388e08;
                  local_e18._8_8_ = boost::unit_test::lazy_ostream::inst;
                  local_1aa8[0] =
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
                  ;
                  local_1aa8[1] =
                       (char *)((long)
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
                               + 0x69);
                  pvVar58 = (iterator)0x1;
                  pvVar59 = (iterator)0x1;
                  local_e18._16_8_ = prv;
                  boost::test_tools::tt_detail::report_assertion
                            ((assertion_result *)local_f18,(lazy_ostream *)local_e20,1,1,WARN,
                             (check_type)pcVar68,(size_t)local_1aa8,0x16c);
                  boost::detail::shared_count::~shared_count((shared_count *)(local_f10 + 8));
                  SignatureData::~SignatureData((SignatureData *)&prv1);
                  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
                            ((vector<CTxOut,_std::allocator<CTxOut>_> *)&local_890);
                  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
                            ((vector<CTxOut,_std::allocator<CTxOut>_> *)&spk1_from_cache);
                  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_1a10);
                  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
                            ((vector<CTxIn,_std::allocator<CTxIn>_> *)&spks1);
                }
                InferDescriptor((CScript *)&count_pks,
                                (SigningProvider *)
                                ((long)&((spks.super__Vector_base<CScript,_std::allocator<CScript>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->
                                        super_CScriptBase)._union + lVar48));
                local_1ac0 = 
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
                ;
                local_1ab8 = "";
                local_1ad0 = &boost::unit_test::basic_cstring<char_const>::null;
                local_1ac8 = &boost::unit_test::basic_cstring<char_const>::null;
                file_54.m_end = (iterator)0x171;
                file_54.m_begin = (iterator)&local_1ac0;
                msg_54.m_end = pvVar59;
                msg_54.m_begin = pvVar58;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_54,
                           (size_t)&local_1ad0,msg_54);
                local_e18._0_8_ = local_e18._1_8_ << 8;
                local_e20 = (undefined1  [8])&PTR__lazy_ostream_01388f08;
                local_e18._8_8_ = boost::unit_test::lazy_ostream::inst;
                local_e18._16_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
                bVar47 = (**(code **)(*(long *)CONCAT44(uStack_1aac,count_pks) + 0x18))();
                local_1950[0] = bVar47;
                local_1960[0] = bVar64;
                local_f18 = (undefined1  [8])
                            (CONCAT71(local_f18._1_7_,(flags & 4U) == 0 ^ bVar47) ^ 1);
                local_f10 = (undefined1  [8])0x0;
                auStack_f08._0_8_ = (sp_counted_base *)0x0;
                creator.super_BaseSignatureCreator._vptr_BaseSignatureCreator =
                     (_func_int **)anon_var_dwarf_91291e;
                creator.m_txto = (CMutableTransaction *)0xe5e1ca;
                spks1.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)local_1950;
                prv1._M_string_length = prv1._M_string_length & 0xffffffffffffff00;
                prv1._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01389268;
                prv1.field_2._8_8_ = &spks1;
                prv1.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst
                ;
                pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                     pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color & 0xffffff00;
                pubkeys._M_t._M_impl._0_1_ = 0x68;
                pubkeys._M_t._M_impl._1_7_ = 0x13892;
                pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ = 0x139d138;
                pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = 0;
                pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                     (_Base_ptr)&spk1_from_cache;
                pcVar68 = "inferred->IsSolvable()";
                pvVar58 = (iterator)0x1;
                pvVar59 = (iterator)0x2;
                spk1_from_cache.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)local_1960;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)local_f18,(lazy_ostream *)local_e20,1,2,REQUIRE,
                           0xe72d80,(size_t)&creator,0x171,&prv1,"!(flags & UNSOLVABLE)",&pubkeys);
                boost::detail::shared_count::~shared_count((shared_count *)(local_f10 + 8));
                spks1.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                spks1.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                spks1.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                prv1._M_dataplus._M_p = (pointer)&PTR__FlatSigningProvider_01399da8;
                prv1.field_2._M_allocated_capacity = prv1.field_2._4_8_ << 0x20;
                prv1.field_2._8_8_ = 0;
                auStack_d00._0_8_ = &prv1.field_2;
                local_d08 = (undefined1  [8])&prv1.field_2;
                auStack_d00._8_8_ = 0;
                local_cf0._8_4_ = _S_red;
                local_cf0._16_8_ = (_Base_ptr)0x0;
                local_cf0._24_8_ = local_cf0 + 8;
                local_cc8 = 0;
                local_cc0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                local_cc0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                local_cc0._M_impl.super__Rb_tree_header._M_header._M_left =
                     &local_cc0._M_impl.super__Rb_tree_header._M_header;
                local_cc0._M_impl.super__Rb_tree_header._M_node_count = 0;
                local_c90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                local_c90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                local_c90._M_impl.super__Rb_tree_header._M_node_count = 0;
                local_c60._8_8_ = local_c60._8_8_ & 0xffffffff00000000;
                local_c50 = (_Base_ptr)0x0;
                local_c38._0_8_ = 0;
                local_1ae0 = 
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
                ;
                local_1ad8 = "";
                local_1af0 = &boost::unit_test::basic_cstring<char_const>::null;
                local_1ae8 = &boost::unit_test::basic_cstring<char_const>::null;
                file_55.m_end = (iterator)0x174;
                file_55.m_begin = (iterator)&local_1ae0;
                msg_55.m_end = pvVar59;
                msg_55.m_begin = pvVar58;
                local_cf0._32_8_ = local_cf0._24_8_;
                local_cc0._M_impl.super__Rb_tree_header._M_header._M_right =
                     local_cc0._M_impl.super__Rb_tree_header._M_header._M_left;
                local_c90._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var4->_M_header;
                local_c90._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var4->_M_header;
                local_c48 = p_Var5;
                local_c40 = p_Var5;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_55,
                           (size_t)&local_1af0,msg_55);
                rVar25.super_readonly_property<bool>.super_class_property<bool>.value =
                     (readonly_property<bool>)
                     (**(code **)(*(long *)CONCAT44(uStack_1aac,count_pks) + 0x40))
                               ((long *)CONCAT44(uStack_1aac,count_pks),0,&prv1,&spks1,&prv1);
                local_e20[0] = rVar25.super_readonly_property<bool>.super_class_property<bool>.value
                ;
                local_e18._0_8_ = (element_type *)0x0;
                local_e18._8_8_ = (sp_counted_base *)0x0;
                local_f18 = (undefined1  [8])0xe72dad;
                local_f10 = (undefined1  [8])(element_type *)0xe72df5;
                pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                     pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color & 0xffffff00;
                pubkeys._M_t._M_impl._0_1_ = 0x48;
                pubkeys._M_t._M_impl._1_7_ = 0x13890;
                pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ = 0x139d138;
                pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = 0;
                pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_f18;
                local_1b00 = 
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
                ;
                local_1af8 = "";
                pvVar58 = (iterator)0x1;
                pvVar59 = (iterator)0x0;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)local_e20,(lazy_ostream *)&pubkeys,1,0,WARN,
                           (check_type)pcVar68,(size_t)&local_1b00,0x174);
                boost::detail::shared_count::~shared_count((shared_count *)(local_e18 + 8));
                local_1b10 = 
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
                ;
                local_1b08 = "";
                local_1b28._8_8_ = &boost::unit_test::basic_cstring<char_const>::null;
                local_1b28._16_8_ = &boost::unit_test::basic_cstring<char_const>::null;
                file_56.m_end = (iterator)0x175;
                file_56.m_begin = (iterator)&local_1b10;
                msg_56.m_end = pvVar59;
                msg_56.m_begin = pvVar58;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_56,
                           (size_t)(local_1b28 + 8),msg_56);
                local_f10 = (undefined1  [8])(local_f10._1_8_ << 8);
                local_f18 = (undefined1  [8])&PTR__lazy_ostream_01388f08;
                auStack_f08._0_8_ = boost::unit_test::lazy_ostream::inst;
                auStack_f08._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
                local_1b28._0_8_ =
                     (long)spks1.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)spks1.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                           super__Vector_impl_data._M_start >> 5;
                local_1b2c = 1;
                creator.super_BaseSignatureCreator._vptr_BaseSignatureCreator._0_1_ =
                     (long)spks1.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)spks1.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                           super__Vector_impl_data._M_start == 0x20;
                creator.m_txto = (CMutableTransaction *)0x0;
                creator.nIn = 0;
                creator.nHashType = 0;
                spk1_from_cache.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_91291e;
                spk1_from_cache.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0xe5e1ca;
                local_1950._0_8_ = local_1b28;
                pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                     pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color & 0xffffff00;
                pubkeys._M_t._M_impl._0_1_ = 0x48;
                pubkeys._M_t._M_impl._1_7_ = 0x1388f;
                pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ = 0x139d138;
                pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = 0;
                pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_1950
                ;
                local_1960._0_8_ = &local_1b2c;
                local_e18._0_8_ = local_e18._1_8_ << 8;
                local_e20 = (undefined1  [8])&PTR__lazy_ostream_01388f88;
                local_e18._8_8_ = boost::unit_test::lazy_ostream::inst;
                local_e18._16_8_ = local_1960;
                pcVar68 = "spks_inferred.size()";
                pvVar58 = (iterator)0x1;
                pvVar59 = (iterator)0x2;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)&creator,(lazy_ostream *)local_f18,1,2,REQUIRE,
                           0xe72df6,(size_t)&spk1_from_cache,0x175,&pubkeys,"1U",local_e20);
                boost::detail::shared_count::~shared_count((shared_count *)&creator.nIn);
                local_1b40 = 
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
                ;
                local_1b38 = "";
                local_1b50 = &boost::unit_test::basic_cstring<char_const>::null;
                local_1b48 = &boost::unit_test::basic_cstring<char_const>::null;
                file_57.m_end = (iterator)0x176;
                file_57.m_begin = (iterator)&local_1b40;
                msg_57.m_end = pvVar59;
                msg_57.m_begin = pvVar58;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_57,
                           (size_t)&local_1b50,msg_57);
                rVar25.super_readonly_property<bool>.super_class_property<bool>.value =
                     (readonly_property<bool>)
                     prevector<28U,_unsigned_char,_unsigned_int,_int>::operator==
                               (&(spks1.super__Vector_base<CScript,_std::allocator<CScript>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->super_CScriptBase,
                                (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                                ((long)&((spks.super__Vector_base<CScript,_std::allocator<CScript>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->
                                        super_CScriptBase)._union + lVar48));
                local_e20[0] = rVar25.super_readonly_property<bool>.super_class_property<bool>.value
                ;
                local_e18._0_8_ = (element_type *)0x0;
                local_e18._8_8_ = (sp_counted_base *)0x0;
                local_f18 = (undefined1  [8])0xe72e0b;
                local_f10 = (undefined1  [8])(element_type *)0xe72e26;
                pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                     pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color & 0xffffff00;
                pubkeys._M_t._M_impl._0_1_ = 0x48;
                pubkeys._M_t._M_impl._1_7_ = 0x13890;
                pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ = 0x139d138;
                pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = 0;
                pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_f18;
                local_1b60 = 
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
                ;
                local_1b58 = "";
                pvVar58 = (iterator)0x1;
                pvVar59 = (iterator)0x0;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)local_e20,(lazy_ostream *)&pubkeys,1,0,WARN,
                           (check_type)pcVar68,(size_t)&local_1b60,0x176);
                boost::detail::shared_count::~shared_count((shared_count *)(local_e18 + 8));
                local_1b70 = 
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
                ;
                local_1b68 = "";
                local_1b80 = &boost::unit_test::basic_cstring<char_const>::null;
                local_1b78 = &boost::unit_test::basic_cstring<char_const>::null;
                file_58.m_end = (iterator)0x177;
                file_58.m_begin = (iterator)&local_1b70;
                msg_58.m_end = pvVar59;
                msg_58.m_begin = pvVar58;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_58,
                           (size_t)&local_1b80,msg_58);
                local_f10 = (undefined1  [8])(local_f10._1_8_ << 8);
                local_f18 = (undefined1  [8])&PTR__lazy_ostream_01388f08;
                auStack_f08._0_8_ = boost::unit_test::lazy_ostream::inst;
                auStack_f08._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
                InferDescriptor((CScript *)local_1b28,
                                (SigningProvider *)
                                spks1.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                                super__Vector_impl_data._M_start);
                bVar47 = (**(code **)(*(long *)local_1b28._0_8_ + 0x18))();
                local_1b2c = CONCAT31(local_1b2c._1_3_,bVar47);
                creator.super_BaseSignatureCreator._vptr_BaseSignatureCreator =
                     (_func_int **)
                     (CONCAT71(creator.super_BaseSignatureCreator._vptr_BaseSignatureCreator._1_7_,
                               (flags & 4U) == 0 ^ bVar47) ^ 1);
                creator.m_txto = (CMutableTransaction *)0x0;
                creator.nIn = 0;
                creator.nHashType = 0;
                spk1_from_cache.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0xe5e1ca;
                spk1_from_cache.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                super__Vector_impl_data._M_start =
                     (pointer)
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
                ;
                local_1950._0_8_ = &local_1b2c;
                pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                     pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color & 0xffffff00;
                pubkeys._M_t._M_impl._0_1_ = 0x68;
                pubkeys._M_t._M_impl._1_7_ = 0x13892;
                pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ = 0x139d138;
                pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = 0;
                pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_1950
                ;
                local_1960._0_8_ = &local_1b81;
                local_e18._0_8_ = local_e18._1_8_ << 8;
                local_e20 = (undefined1  [8])&PTR__lazy_ostream_01389268;
                local_e18._8_8_ = boost::unit_test::lazy_ostream::inst;
                local_e18._16_8_ = local_1960;
                pcVar68 = "InferDescriptor(spks_inferred[0], provider_inferred)->IsSolvable()";
                pvVar58 = (iterator)0x1;
                pvVar59 = (iterator)0x2;
                local_1b81 = bVar64;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)&creator,(lazy_ostream *)local_f18,1,2,REQUIRE,
                           0xe72e27,(size_t)&spk1_from_cache,0x177,&pubkeys,"!(flags & UNSOLVABLE)",
                           local_e20);
                boost::detail::shared_count::~shared_count((shared_count *)&creator.nIn);
                if ((long *)local_1b28._0_8_ != (long *)0x0) {
                  (**(code **)(*(long *)local_1b28._0_8_ + 8))();
                }
                local_1b98 = 
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
                ;
                local_1b90 = "";
                local_1ba8 = &boost::unit_test::basic_cstring<char_const>::null;
                local_1ba0 = &boost::unit_test::basic_cstring<char_const>::null;
                file_59.m_end = (iterator)0x178;
                file_59.m_begin = (iterator)&local_1b98;
                msg_59.m_end = pvVar59;
                msg_59.m_begin = pvVar58;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_59,
                           (size_t)&local_1ba8,msg_59);
                GetKeyOriginData((set<std::pair<CPubKey,_KeyOriginInfo>,_std::less<std::pair<CPubKey,_KeyOriginInfo>_>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>
                                  *)&pubkeys,(FlatSigningProvider *)&prv1,flags);
                GetKeyOriginData((set<std::pair<CPubKey,_KeyOriginInfo>,_std::less<std::pair<CPubKey,_KeyOriginInfo>_>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>
                                  *)local_e20,&script_provider,flags);
                if ((_Base_ptr)pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count == local_df8
                   ) {
                  bVar27 = std::__equal<false>::
                           equal<std::_Rb_tree_const_iterator<std::pair<CPubKey,KeyOriginInfo>>,std::_Rb_tree_const_iterator<std::pair<CPubKey,KeyOriginInfo>>>
                                     ((_Rb_tree_const_iterator<std::pair<CPubKey,_KeyOriginInfo>_>)
                                      pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                                      (_Rb_tree_const_iterator<std::pair<CPubKey,_KeyOriginInfo>_>)
                                      &pubkeys._M_t._M_impl.super__Rb_tree_header,
                                      (_Rb_tree_const_iterator<std::pair<CPubKey,_KeyOriginInfo>_>)
                                      local_e18._16_8_);
                }
                else {
                  bVar27 = false;
                }
                creator.super_BaseSignatureCreator._vptr_BaseSignatureCreator._0_1_ = bVar27;
                creator.m_txto = (CMutableTransaction *)0x0;
                creator.nIn = 0;
                creator.nHashType = 0;
                spk1_from_cache.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0xe72ec0;
                spk1_from_cache.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                super__Vector_impl_data._M_start =
                     (pointer)
                     "GetKeyOriginData(provider_inferred, flags) == GetKeyOriginData(script_provider, flags)"
                ;
                local_f10 = (undefined1  [8])(local_f10._1_8_ << 8);
                local_f18 = (undefined1  [8])&PTR__lazy_ostream_01389048;
                auStack_f08._0_8_ = boost::unit_test::lazy_ostream::inst;
                auStack_f08._8_8_ = &spk1_from_cache;
                local_1bb8 = 
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
                ;
                local_1bb0 = "";
                pFVar56 = (FlatSigningProvider *)0x1;
                pvVar58 = (iterator)0x0;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)&creator,(lazy_ostream *)local_f18,1,0,WARN,
                           (check_type)pcVar68,(size_t)&local_1bb8,0x178);
                boost::detail::shared_count::~shared_count((shared_count *)&creator.nIn);
                std::
                _Rb_tree<std::pair<CPubKey,_KeyOriginInfo>,_std::pair<CPubKey,_KeyOriginInfo>,_std::_Identity<std::pair<CPubKey,_KeyOriginInfo>_>,_std::less<std::pair<CPubKey,_KeyOriginInfo>_>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>
                ::~_Rb_tree((_Rb_tree<std::pair<CPubKey,_KeyOriginInfo>,_std::pair<CPubKey,_KeyOriginInfo>,_std::_Identity<std::pair<CPubKey,_KeyOriginInfo>_>,_std::less<std::pair<CPubKey,_KeyOriginInfo>_>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>
                             *)local_e20);
                std::
                _Rb_tree<std::pair<CPubKey,_KeyOriginInfo>,_std::pair<CPubKey,_KeyOriginInfo>,_std::_Identity<std::pair<CPubKey,_KeyOriginInfo>_>,_std::less<std::pair<CPubKey,_KeyOriginInfo>_>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>
                ::~_Rb_tree((_Rb_tree<std::pair<CPubKey,_KeyOriginInfo>,_std::pair<CPubKey,_KeyOriginInfo>,_std::_Identity<std::pair<CPubKey,_KeyOriginInfo>_>,_std::less<std::pair<CPubKey,_KeyOriginInfo>_>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>
                             *)&pubkeys);
                std::
                _Rb_tree<XOnlyPubKey,_std::pair<const_XOnlyPubKey,_TaprootBuilder>,_std::_Select1st<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>_>
                ::~_Rb_tree((_Rb_tree<XOnlyPubKey,_std::pair<const_XOnlyPubKey,_TaprootBuilder>,_std::_Select1st<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>_>
                             *)local_c60);
                std::
                _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
                ::~_Rb_tree(&local_c90);
                std::
                _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
                ::~_Rb_tree(&local_cc0);
                std::
                _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
                ::~_Rb_tree((_Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
                             *)local_cf0);
                std::
                _Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
                ::~_Rb_tree((_Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
                             *)&prv1._M_string_length);
                std::vector<CScript,_std::allocator<CScript>_>::~vector(&spks1);
                if ((long *)CONCAT44(uStack_1aac,count_pks) != (long *)0x0) {
                  (**(code **)(*(long *)CONCAT44(uStack_1aac,count_pks) + 8))();
                }
                uVar60 = uVar60 + 1;
                lVar48 = lVar48 + 0x20;
              } while (uVar60 < (ulong)((long)spks.
                                              super__Vector_base<CScript,_std::allocator<CScript>_>.
                                              _M_impl.super__Vector_impl_data._M_finish -
                                        (long)spks.
                                              super__Vector_base<CScript,_std::allocator<CScript>_>.
                                              _M_impl.super__Vector_impl_data._M_start >> 5));
            }
            p_Var40 = script_provider.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            if ((_Rb_tree_header *)
                script_provider.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
                &script_provider.origins._M_t._M_impl.super__Rb_tree_header) {
              do {
                local_1bc8 = 
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
                ;
                local_1bc0 = "";
                local_1bd8 = &boost::unit_test::basic_cstring<char_const>::null;
                local_1bd0 = &boost::unit_test::basic_cstring<char_const>::null;
                file_60.m_end = (iterator)0x17e;
                file_60.m_begin = (iterator)&local_1bc8;
                msg_60.m_end = pvVar58;
                msg_60.m_begin = (iterator)pFVar56;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_60,
                           (size_t)&local_1bd8,msg_60);
                cVar41 = std::
                         _Rb_tree<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::_Identity<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         ::find(&paths->_M_t,(key_type *)&p_Var40[4]._M_parent);
                local_e20[0] = (_Rb_tree_header *)cVar41._M_node !=
                               &(paths->_M_t)._M_impl.super__Rb_tree_header;
                local_e18._0_8_ = (element_type *)0x0;
                local_e18._8_8_ = (sp_counted_base *)0x0;
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &pubkeys,"Unexpected key path: ",prv);
                prv1._M_string_length = prv1._M_string_length & 0xffffffffffffff00;
                prv1._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01388e08;
                prv1.field_2._8_8_ =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pubkeys;
                prv1.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst
                ;
                local_1be8 = 
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
                ;
                local_1be0 = "";
                pFVar56 = (FlatSigningProvider *)0x1;
                pvVar58 = (iterator)0x1;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)local_e20,(lazy_ostream *)&prv1,1,1,WARN,
                           (check_type)pcVar68,(size_t)&local_1be8,0x17e);
                if ((_Base_ptr *)CONCAT71(pubkeys._M_t._M_impl._1_7_,pubkeys._M_t._M_impl._0_1_) !=
                    &pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
                  operator_delete((undefined1 *)
                                  CONCAT71(pubkeys._M_t._M_impl._1_7_,pubkeys._M_t._M_impl._0_1_),
                                  CONCAT44(pubkeys._M_t._M_impl.super__Rb_tree_header._M_header.
                                           _M_parent._4_4_,
                                           pubkeys._M_t._M_impl.super__Rb_tree_header._M_header.
                                           _M_parent._0_4_) + 1);
                }
                boost::detail::shared_count::~shared_count((shared_count *)(local_e18 + 8));
                pVar67 = std::
                         _Rb_tree<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::_Identity<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         ::equal_range(&left_paths._M_t,(key_type *)&p_Var40[4]._M_parent);
                std::
                _Rb_tree<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::_Identity<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ::_M_erase_aux(&left_paths._M_t,(_Base_ptr)pVar67.first._M_node,
                               (_Base_ptr)pVar67.second._M_node);
                p_Var40 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var40);
              } while ((_Rb_tree_header *)p_Var40 !=
                       &script_provider.origins._M_t._M_impl.super__Rb_tree_header);
            }
            std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::~_Hashtable(&local_1668);
            std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::~_Hashtable(&local_1630);
            std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::~_Hashtable(&desc_cache.m_last_hardened_xpubs._M_h);
            std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::~_Hashtable(&desc_cache.m_parent_xpubs._M_h);
            std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           *)&desc_cache);
            std::vector<CScript,_std::allocator<CScript>_>::~vector(&spks_cached);
            std::vector<CScript,_std::allocator<CScript>_>::~vector(&spks);
            std::
            _Rb_tree<XOnlyPubKey,_std::pair<const_XOnlyPubKey,_TaprootBuilder>,_std::_Select1st<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>_>
            ::~_Rb_tree(&script_provider_cached.tr_trees._M_t);
            std::
            _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
            ::~_Rb_tree(&script_provider_cached.keys._M_t);
            std::
            _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
            ::~_Rb_tree(&script_provider_cached.origins._M_t);
            std::
            _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
            ::~_Rb_tree(&script_provider_cached.pubkeys._M_t);
            std::
            _Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
            ::~_Rb_tree(&script_provider_cached.scripts._M_t);
            std::
            _Rb_tree<XOnlyPubKey,_std::pair<const_XOnlyPubKey,_TaprootBuilder>,_std::_Select1st<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>_>
            ::~_Rb_tree(&script_provider.tr_trees._M_t);
            std::
            _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
            ::~_Rb_tree(&script_provider.keys._M_t);
            std::
            _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
            ::~_Rb_tree(&script_provider.origins._M_t);
            std::
            _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
            ::~_Rb_tree(&script_provider.pubkeys._M_t);
            std::
            _Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
            ::~_Rb_tree(&script_provider.scripts._M_t);
            bVar27 = false;
          } while (bVar20);
          lVar35 = lVar35 + 1;
        } while (lVar35 != local_1cd8);
      }
      else if (pvVar13 != pvVar46) {
        local_1cd8 = (lVar35 >> 3) * -0x5555555555555555;
        goto LAB_003b51ae;
      }
      local_1bf8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
      ;
      local_1bf0 = "";
      local_1c08 = &boost::unit_test::basic_cstring<char_const>::null;
      local_1c00 = &boost::unit_test::basic_cstring<char_const>::null;
      file_61.m_end = (iterator)0x185;
      file_61.m_begin = (iterator)&local_1bf8;
      msg_61.m_end = pvVar58;
      msg_61.m_begin = (iterator)pFVar56;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_61,(size_t)&local_1c08,
                 msg_61);
      script_provider.super_SigningProvider._vptr_SigningProvider._0_1_ =
           left_paths._M_t._M_impl.super__Rb_tree_header._M_node_count == 0;
      script_provider.scripts._M_t._M_impl._0_16_ = (undefined1  [16])0x0;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pubkeys,
                     "Not all expected key paths found: ",prv);
      prv1._M_string_length = prv1._M_string_length & 0xffffffffffffff00;
      prv1._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01388e08;
      prv1.field_2._8_8_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pubkeys;
      prv1.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_1c18 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
      ;
      local_1c10 = "";
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&script_provider,(lazy_ostream *)&prv1,1,1,WARN,
                 (check_type)pcVar68,(size_t)&local_1c18,0x185);
      if ((_Base_ptr *)CONCAT71(pubkeys._M_t._M_impl._1_7_,pubkeys._M_t._M_impl._0_1_) !=
          &pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
        operator_delete((undefined1 *)
                        CONCAT71(pubkeys._M_t._M_impl._1_7_,pubkeys._M_t._M_impl._0_1_),
                        CONCAT44(pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent.
                                 _4_4_,pubkeys._M_t._M_impl.super__Rb_tree_header._M_header.
                                       _M_parent._0_4_) + 1);
      }
      boost::detail::shared_count::~shared_count
                ((shared_count *)&script_provider.scripts._M_t._M_impl.super__Rb_tree_header);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)norm1._M_dataplus._M_p != &norm1.field_2) {
        operator_delete(norm1._M_dataplus._M_p,
                        CONCAT71(norm1.field_2._M_allocated_capacity._1_7_,
                                 norm1.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pub2._M_dataplus._M_p != &pub2.field_2) {
        operator_delete(pub2._M_dataplus._M_p,pub2.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pub1._M_dataplus._M_p != &pub1.field_2) {
        operator_delete(pub1._M_dataplus._M_p,pub1.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
      ::~vector((vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
                 *)local_f58);
      std::
      vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
      ::~vector((vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
                 *)local_f38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)error._M_dataplus._M_p != &error.field_2) {
        operator_delete(error._M_dataplus._M_p,
                        CONCAT71(error.field_2._M_allocated_capacity._1_7_,
                                 error.field_2._M_local_buf[0]) + 1);
      }
      std::
      _Rb_tree<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::_Identity<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::~_Rb_tree(&left_paths._M_t);
      std::
      _Rb_tree<XOnlyPubKey,_std::pair<const_XOnlyPubKey,_TaprootBuilder>,_std::_Select1st<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>_>
      ::~_Rb_tree(&keys_pub.tr_trees._M_t);
      std::
      _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
      ::~_Rb_tree(&keys_pub.keys._M_t);
      std::
      _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
      ::~_Rb_tree(&keys_pub.origins._M_t);
      std::
      _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
      ::~_Rb_tree(&keys_pub.pubkeys._M_t);
      std::
      _Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
      ::~_Rb_tree(&keys_pub.scripts._M_t);
      std::
      _Rb_tree<XOnlyPubKey,_std::pair<const_XOnlyPubKey,_TaprootBuilder>,_std::_Select1st<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>_>
      ::~_Rb_tree(&keys_priv.tr_trees._M_t);
      std::
      _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
      ::~_Rb_tree(&keys_priv.keys._M_t);
      std::
      _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
      ::~_Rb_tree(&keys_priv.origins._M_t);
      std::
      _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
      ::~_Rb_tree(&keys_priv.pubkeys._M_t);
      std::
      _Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
      ::~_Rb_tree(&keys_priv.scripts._M_t);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar10) {
        return;
      }
      goto LAB_003babfa;
    }
  }
  else {
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar10) goto LAB_003babfa;
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar60);
    psVar54 = pub;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar10) {
    uVar33 = std::__throw_out_of_range_fmt
                       ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                        uVar60);
    if (script_provider.super_SigningProvider._vptr_SigningProvider != (_func_int **)0xe5e1ca) {
      operator_delete(script_provider.super_SigningProvider._vptr_SigningProvider,
                      script_provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1
                     );
    }
    if (script_provider_cached.super_SigningProvider._vptr_SigningProvider !=
        (_func_int **)(ulong)(uint)desc_index) {
      operator_delete(script_provider_cached.super_SigningProvider._vptr_SigningProvider,
                      script_provider_cached.scripts._M_t._M_impl.super__Rb_tree_header._M_header.
                      _0_8_ + 1);
    }
    if (local_e20 != (undefined1  [8])(local_e18 + 8)) {
      operator_delete((void *)local_e20,(ulong)(local_e18._8_8_ + 1));
    }
    boost::detail::shared_count::~shared_count((shared_count *)(local_f10 + 8));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4f8._M_allocated_capacity != &local_4e8) {
      operator_delete((void *)local_4f8._M_allocated_capacity,local_4e8._M_allocated_capacity + 1);
    }
    if ((string *)local_4d8._0_8_ != psVar54) {
      operator_delete((void *)local_4d8._0_8_,local_4d8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)prv1._M_dataplus._M_p != &prv1.field_2) {
      operator_delete(prv1._M_dataplus._M_p,prv1.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pub2._M_dataplus._M_p != &pub2.field_2) {
      operator_delete(pub2._M_dataplus._M_p,pub2.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pub1._M_dataplus._M_p != &pub1.field_2) {
      operator_delete(pub1._M_dataplus._M_p,pub1.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
    ::~vector((vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
               *)local_f58);
    std::
    vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
    ::~vector((vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
               *)local_f38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)error._M_dataplus._M_p != &error.field_2) {
      operator_delete(error._M_dataplus._M_p,
                      CONCAT71(error.field_2._M_allocated_capacity._1_7_,
                               error.field_2._M_local_buf[0]) + 1);
    }
    std::
    _Rb_tree<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::_Identity<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::~_Rb_tree(&left_paths._M_t);
    std::
    _Rb_tree<XOnlyPubKey,_std::pair<const_XOnlyPubKey,_TaprootBuilder>,_std::_Select1st<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>_>
    ::~_Rb_tree(&keys_pub.tr_trees._M_t);
    std::
    _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
    ::~_Rb_tree(&keys_pub.keys._M_t);
    std::
    _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
    ::~_Rb_tree(&keys_pub.origins._M_t);
    std::
    _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
    ::~_Rb_tree(&keys_pub.pubkeys._M_t);
    std::
    _Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
    ::~_Rb_tree(&keys_pub.scripts._M_t);
    std::
    _Rb_tree<XOnlyPubKey,_std::pair<const_XOnlyPubKey,_TaprootBuilder>,_std::_Select1st<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>_>
    ::~_Rb_tree(&keys_priv.tr_trees._M_t);
    std::
    _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
    ::~_Rb_tree(&keys_priv.keys._M_t);
    std::
    _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
    ::~_Rb_tree(&keys_priv.origins._M_t);
    std::
    _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
    ::~_Rb_tree(&keys_priv.pubkeys._M_t);
    std::
    _Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
    ::~_Rb_tree(&keys_priv.scripts._M_t);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar10) {
      _Unwind_Resume(uVar33);
    }
  }
LAB_003babfa:
  __stack_chk_fail();
}

Assistant:

void DoCheck(std::string prv, std::string pub, const std::string& norm_pub, int flags,
             const std::vector<std::vector<std::string>>& scripts, const std::optional<OutputType>& type, std::optional<uint256> op_desc_id = std::nullopt,
             const std::set<std::vector<uint32_t>>& paths = ONLY_EMPTY, bool replace_apostrophe_with_h_in_prv=false,
             bool replace_apostrophe_with_h_in_pub=false, uint32_t spender_nlocktime=0, uint32_t spender_nsequence=CTxIn::SEQUENCE_FINAL,
             std::map<std::vector<uint8_t>, std::vector<uint8_t>> preimages={},
             std::optional<std::string> expected_prv = std::nullopt, std::optional<std::string> expected_pub = std::nullopt, int desc_index = 0)
{
    FlatSigningProvider keys_priv, keys_pub;
    std::set<std::vector<uint32_t>> left_paths = paths;
    std::string error;

    std::vector<std::unique_ptr<Descriptor>> parse_privs;
    std::vector<std::unique_ptr<Descriptor>> parse_pubs;
    // Check that parsing succeeds.
    if (replace_apostrophe_with_h_in_prv) {
        prv = UseHInsteadOfApostrophe(prv);
    }
    parse_privs = Parse(prv, keys_priv, error);
    BOOST_CHECK_MESSAGE(!parse_privs.empty(), error);
    if (replace_apostrophe_with_h_in_pub) {
        pub = UseHInsteadOfApostrophe(pub);
    }
    parse_pubs = Parse(pub, keys_pub, error);
    BOOST_CHECK_MESSAGE(!parse_pubs.empty(), error);

    auto& parse_priv = parse_privs.at(desc_index);
    auto& parse_pub = parse_pubs.at(desc_index);

    // We must be able to estimate the max satisfaction size for any solvable descriptor top descriptor (but combo).
    const bool is_nontop_or_nonsolvable{!parse_priv->IsSolvable() || !parse_priv->GetOutputType()};
    const auto max_sat_maxsig{parse_priv->MaxSatisfactionWeight(true)};
    const auto max_sat_nonmaxsig{parse_priv->MaxSatisfactionWeight(true)};
    const auto max_elems{parse_priv->MaxSatisfactionElems()};
    const bool is_input_size_info_set{max_sat_maxsig && max_sat_nonmaxsig && max_elems};
    BOOST_CHECK_MESSAGE(is_input_size_info_set || is_nontop_or_nonsolvable, prv);

    // The ScriptSize() must match the size of the Script string. (ScriptSize() is set for all descs but 'combo()'.)
    const bool is_combo{!parse_priv->IsSingleType()};
    BOOST_CHECK_MESSAGE(is_combo || parse_priv->ScriptSize() == scripts[0][0].size() / 2, "Invalid ScriptSize() for " + prv);

    // Check that the correct OutputType is inferred
    BOOST_CHECK(parse_priv->GetOutputType() == type);
    BOOST_CHECK(parse_pub->GetOutputType() == type);

    // Check private keys are extracted from the private version but not the public one.
    BOOST_CHECK(keys_priv.keys.size());
    BOOST_CHECK(!keys_pub.keys.size());

    // If expected_pub is provided, check that the serialize matches that.
    // Otherwise check that they serialize back to the public version.
    std::string pub1 = parse_priv->ToString();
    std::string pub2 = parse_pub->ToString();
    if (expected_pub) {
        BOOST_CHECK_MESSAGE(EqualDescriptor(*expected_pub, pub1), "Private ser: " + pub1 + " Public desc: " + *expected_pub);
        BOOST_CHECK_MESSAGE(EqualDescriptor(*expected_pub, pub2), "Public ser: " + pub2 + " Public desc: " + *expected_pub);
    } else {
        BOOST_CHECK_MESSAGE(EqualDescriptor(pub, pub1), "Private ser: " + pub1 + " Public desc: " + pub);
        BOOST_CHECK_MESSAGE(EqualDescriptor(pub, pub2), "Public ser: " + pub2 + " Public desc: " + pub);
    }

    // Check that the COMPAT identifier did not change
    if (op_desc_id) {
        BOOST_CHECK_MESSAGE(DescriptorID(*parse_priv) == *op_desc_id, "DescriptorID() " + DescriptorID(*parse_priv).ToString() + " does not match for priv " + prv);
    }

    // Check that both can be serialized with private key back to the private version, but not without private key.
    if (!(flags & MISSING_PRIVKEYS)) {
        std::string prv1;
        BOOST_CHECK(parse_priv->ToPrivateString(keys_priv, prv1));
        if (expected_prv) {
            BOOST_CHECK_MESSAGE(EqualDescriptor(*expected_prv, prv1), "Private ser: " + prv1 + "Private desc: " + *expected_prv);
        } else {
            BOOST_CHECK_MESSAGE(EqualDescriptor(prv, prv1), "Private ser: " + prv1 + " Private desc: " + prv);
        }
        BOOST_CHECK(!parse_priv->ToPrivateString(keys_pub, prv1));
        BOOST_CHECK(parse_pub->ToPrivateString(keys_priv, prv1));
        if (expected_prv) {
            BOOST_CHECK(EqualDescriptor(*expected_prv, prv1));
            BOOST_CHECK_MESSAGE(EqualDescriptor(*expected_prv, prv1), "Private ser: " + prv1 + " Private desc: " + *expected_prv);
        } else {
            BOOST_CHECK_MESSAGE(EqualDescriptor(prv, prv1), "Private ser: " + prv1 + " Private desc: " + prv);
        }
        BOOST_CHECK(!parse_pub->ToPrivateString(keys_pub, prv1));
    }

    // Check that private can produce the normalized descriptors
    std::string norm1;
    BOOST_CHECK(parse_priv->ToNormalizedString(keys_priv, norm1));
    BOOST_CHECK_MESSAGE(EqualDescriptor(norm1, norm_pub), "priv->ToNormalizedString(): " + norm1 + " Norm. desc: " + norm_pub);
    BOOST_CHECK(parse_pub->ToNormalizedString(keys_priv, norm1));
    BOOST_CHECK_MESSAGE(EqualDescriptor(norm1, norm_pub), "pub->ToNormalizedString(): " + norm1 + " Norm. desc: " + norm_pub);

    // Check whether IsRange on both returns the expected result
    BOOST_CHECK_EQUAL(parse_pub->IsRange(), (flags & RANGE) != 0);
    BOOST_CHECK_EQUAL(parse_priv->IsRange(), (flags & RANGE) != 0);

    // * For ranged descriptors,  the `scripts` parameter is a list of expected result outputs, for subsequent
    //   positions to evaluate the descriptors on (so the first element of `scripts` is for evaluating the
    //   descriptor at 0; the second at 1; and so on). To verify this, we evaluate the descriptors once for
    //   each element in `scripts`.
    // * For non-ranged descriptors, we evaluate the descriptors at positions 0, 1, and 2, but expect the
    //   same result in each case, namely the first element of `scripts`. Because of that, the size of
    //   `scripts` must be one in that case.
    if (!(flags & RANGE)) assert(scripts.size() == 1);
    size_t max = (flags & RANGE) ? scripts.size() : 3;

    // Iterate over the position we'll evaluate the descriptors in.
    for (size_t i = 0; i < max; ++i) {
        // Call the expected result scripts `ref`.
        const auto& ref = scripts[(flags & RANGE) ? i : 0];
        // When t=0, evaluate the `prv` descriptor; when t=1, evaluate the `pub` descriptor.
        for (int t = 0; t < 2; ++t) {
            // When the descriptor is hardened, evaluate with access to the private keys inside.
            const FlatSigningProvider& key_provider = (flags & HARDENED) ? keys_priv : keys_pub;

            // Evaluate the descriptor selected by `t` in position `i`.
            FlatSigningProvider script_provider, script_provider_cached;
            std::vector<CScript> spks, spks_cached;
            DescriptorCache desc_cache;
            BOOST_CHECK((t ? parse_priv : parse_pub)->Expand(i, key_provider, spks, script_provider, &desc_cache));

            // Compare the output with the expected result.
            BOOST_CHECK_EQUAL(spks.size(), ref.size());

            // Try to expand again using cached data, and compare.
            BOOST_CHECK(parse_pub->ExpandFromCache(i, desc_cache, spks_cached, script_provider_cached));
            BOOST_CHECK(spks == spks_cached);
            BOOST_CHECK(GetKeyData(script_provider, flags) == GetKeyData(script_provider_cached, flags));
            BOOST_CHECK(script_provider.scripts == script_provider_cached.scripts);
            BOOST_CHECK(GetKeyOriginData(script_provider, flags) == GetKeyOriginData(script_provider_cached, flags));

            // Check whether keys are in the cache
            const auto& der_xpub_cache = desc_cache.GetCachedDerivedExtPubKeys();
            const auto& parent_xpub_cache = desc_cache.GetCachedParentExtPubKeys();
            const size_t num_xpubs = CountXpubs(pub1);
            if ((flags & RANGE) && !(flags & (DERIVE_HARDENED))) {
                // For ranged, unhardened derivation, None of the keys in origins should appear in the cache but the cache should have parent keys
                // But we can derive one level from each of those parent keys and find them all
                BOOST_CHECK(der_xpub_cache.empty());
                BOOST_CHECK(parent_xpub_cache.size() > 0);
                std::set<CPubKey> pubkeys;
                for (const auto& xpub_pair : parent_xpub_cache) {
                    const CExtPubKey& xpub = xpub_pair.second;
                    CExtPubKey der;
                    BOOST_CHECK(xpub.Derive(der, i));
                    pubkeys.insert(der.pubkey);
                }
                int count_pks = 0;
                for (const auto& origin_pair : script_provider_cached.origins) {
                    const CPubKey& pk = origin_pair.second.first;
                    count_pks += pubkeys.count(pk);
                }
                if (flags & MIXED_PUBKEYS) {
                    BOOST_CHECK_EQUAL(num_xpubs, count_pks);
                } else {
                    BOOST_CHECK_EQUAL(script_provider_cached.origins.size(), count_pks);
                }
            } else if (num_xpubs > 0) {
                // For ranged, hardened derivation, or not ranged, but has an xpub, all of the keys should appear in the cache
                BOOST_CHECK(der_xpub_cache.size() + parent_xpub_cache.size() == num_xpubs);
                if (!(flags & MIXED_PUBKEYS)) {
                    BOOST_CHECK(num_xpubs == script_provider_cached.origins.size());
                }
                // Get all of the derived pubkeys
                std::set<CPubKey> pubkeys;
                for (const auto& xpub_map_pair : der_xpub_cache) {
                    for (const auto& xpub_pair : xpub_map_pair.second) {
                        const CExtPubKey& xpub = xpub_pair.second;
                        pubkeys.insert(xpub.pubkey);
                    }
                }
                // Derive one level from all of the parents
                for (const auto& xpub_pair : parent_xpub_cache) {
                    const CExtPubKey& xpub = xpub_pair.second;
                    pubkeys.insert(xpub.pubkey);
                    CExtPubKey der;
                    BOOST_CHECK(xpub.Derive(der, i));
                    pubkeys.insert(der.pubkey);
                }
                int count_pks = 0;
                for (const auto& origin_pair : script_provider_cached.origins) {
                    const CPubKey& pk = origin_pair.second.first;
                    count_pks += pubkeys.count(pk);
                }
                if (flags & MIXED_PUBKEYS) {
                    BOOST_CHECK_EQUAL(num_xpubs, count_pks);
                } else {
                    BOOST_CHECK_EQUAL(script_provider_cached.origins.size(), count_pks);
                }
            } else if (!(flags & MIXED_PUBKEYS)) {
                // Only const pubkeys, nothing should be cached
                BOOST_CHECK(der_xpub_cache.empty());
                BOOST_CHECK(parent_xpub_cache.empty());
            }

            // Make sure we can expand using cached xpubs for unhardened derivation
            if (!(flags & DERIVE_HARDENED)) {
                // Evaluate the descriptor at i + 1
                FlatSigningProvider script_provider1, script_provider_cached1;
                std::vector<CScript> spks1, spk1_from_cache;
                BOOST_CHECK((t ? parse_priv : parse_pub)->Expand(i + 1, key_provider, spks1, script_provider1, nullptr));

                // Try again but use the cache from expanding i. That cache won't have the pubkeys for i + 1, but will have the parent xpub for derivation.
                BOOST_CHECK(parse_pub->ExpandFromCache(i + 1, desc_cache, spk1_from_cache, script_provider_cached1));
                BOOST_CHECK(spks1 == spk1_from_cache);
                BOOST_CHECK(GetKeyData(script_provider1, flags) == GetKeyData(script_provider_cached1, flags));
                BOOST_CHECK(script_provider1.scripts == script_provider_cached1.scripts);
                BOOST_CHECK(GetKeyOriginData(script_provider1, flags) == GetKeyOriginData(script_provider_cached1, flags));
            }

            // For each of the produced scripts, verify solvability, and when possible, try to sign a transaction spending it.
            for (size_t n = 0; n < spks.size(); ++n) {
                BOOST_CHECK_EQUAL(ref[n], HexStr(spks[n]));

                if (flags & (SIGNABLE | SIGNABLE_FAILS)) {
                    CMutableTransaction spend;
                    spend.nLockTime = spender_nlocktime;
                    spend.vin.resize(1);
                    spend.vin[0].nSequence = spender_nsequence;
                    spend.vout.resize(1);
                    std::vector<CTxOut> utxos(1);
                    PrecomputedTransactionData txdata;
                    txdata.Init(spend, std::move(utxos), /*force=*/true);
                    MutableTransactionSignatureCreator creator{spend, 0, CAmount{0}, &txdata, SIGHASH_DEFAULT};
                    SignatureData sigdata;
                    // We assume there is no collision between the hashes (eg h1=SHA256(SHA256(x)) and h2=SHA256(x))
                    sigdata.sha256_preimages = preimages;
                    sigdata.hash256_preimages = preimages;
                    sigdata.ripemd160_preimages = preimages;
                    sigdata.hash160_preimages = preimages;
                    const auto prod_sig_res = ProduceSignature(FlatSigningProvider{keys_priv}.Merge(FlatSigningProvider{script_provider}), creator, spks[n], sigdata);
                    BOOST_CHECK_MESSAGE(prod_sig_res == !(flags & SIGNABLE_FAILS), prv);
                }

                /* Infer a descriptor from the generated script, and verify its solvability and that it roundtrips. */
                auto inferred = InferDescriptor(spks[n], script_provider);
                BOOST_CHECK_EQUAL(inferred->IsSolvable(), !(flags & UNSOLVABLE));
                std::vector<CScript> spks_inferred;
                FlatSigningProvider provider_inferred;
                BOOST_CHECK(inferred->Expand(0, provider_inferred, spks_inferred, provider_inferred));
                BOOST_CHECK_EQUAL(spks_inferred.size(), 1U);
                BOOST_CHECK(spks_inferred[0] == spks[n]);
                BOOST_CHECK_EQUAL(InferDescriptor(spks_inferred[0], provider_inferred)->IsSolvable(), !(flags & UNSOLVABLE));
                BOOST_CHECK(GetKeyOriginData(provider_inferred, flags) == GetKeyOriginData(script_provider, flags));
            }

            // Test whether the observed key path is present in the 'paths' variable (which contains expected, unobserved paths),
            // and then remove it from that set.
            for (const auto& origin : script_provider.origins) {
                BOOST_CHECK_MESSAGE(paths.count(origin.second.second.path), "Unexpected key path: " + prv);
                left_paths.erase(origin.second.second.path);
            }
        }
    }

    // Verify no expected paths remain that were not observed.
    BOOST_CHECK_MESSAGE(left_paths.empty(), "Not all expected key paths found: " + prv);
}